

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

void embree::avx::CurveNiMBIntersector1<4>::
     intersect_t<embree::avx::SweepCurve1Intersector1<embree::BSplineCurveT>,embree::avx::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  undefined4 uVar8;
  undefined8 uVar9;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar10;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar11;
  Primitive PVar12;
  Geometry *pGVar13;
  __int_type_conflict _Var14;
  long lVar15;
  long lVar16;
  long lVar17;
  RTCFilterFunctionN p_Var18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [32];
  undefined1 auVar84 [16];
  undefined1 auVar85 [32];
  uint uVar86;
  uint uVar87;
  ulong uVar88;
  undefined1 (*pauVar89) [32];
  uint uVar90;
  uint uVar91;
  uint uVar92;
  long lVar93;
  long lVar94;
  int iVar95;
  ulong uVar96;
  float fVar97;
  float fVar123;
  float fVar124;
  vint4 bi_1;
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar111 [16];
  float fVar126;
  float fVar127;
  float fVar128;
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  float fVar125;
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar110 [16];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  float fVar129;
  float fVar153;
  float fVar156;
  vint4 bi;
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  anon_union_4_3_4e909a83_for_anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1_3
  aVar159;
  undefined1 auVar135 [16];
  float fVar130;
  float fVar131;
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  float fVar154;
  float fVar155;
  float fVar157;
  float fVar158;
  float fVar160;
  float fVar161;
  float fVar162;
  float fVar163;
  float fVar164;
  float fVar165;
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  float fVar166;
  float fVar190;
  float fVar191;
  vint4 bi_2;
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  float fVar192;
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar173 [16];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar178 [16];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  float fVar193;
  float fVar212;
  float fVar213;
  vint4 ai_1;
  undefined1 auVar194 [16];
  float fVar214;
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [28];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  float fVar215;
  float fVar230;
  float fVar231;
  vint4 ai_2;
  undefined1 auVar216 [16];
  float fVar232;
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  float fVar233;
  float fVar246;
  float fVar247;
  undefined1 auVar234 [16];
  float fVar248;
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  float fVar254;
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  float fVar251;
  float fVar253;
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  float fVar249;
  float fVar250;
  float fVar252;
  undefined1 auVar245 [64];
  float fVar255;
  float fVar268;
  float fVar269;
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  float fVar270;
  float fVar272;
  float fVar273;
  float fVar276;
  float fVar279;
  float fVar282;
  undefined1 auVar261 [32];
  float fVar271;
  float fVar274;
  float fVar277;
  float fVar280;
  float fVar283;
  undefined1 auVar262 [32];
  undefined1 auVar263 [32];
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  undefined1 auVar266 [32];
  float fVar275;
  float fVar278;
  float fVar281;
  undefined1 auVar267 [64];
  float fVar284;
  float fVar293;
  float fVar294;
  vint4 ai;
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  float fVar296;
  undefined1 auVar290 [32];
  float fVar295;
  float fVar297;
  float fVar299;
  float fVar301;
  float fVar303;
  undefined1 auVar291 [32];
  float fVar298;
  float fVar300;
  float fVar302;
  undefined1 auVar292 [64];
  float fVar304;
  float fVar313;
  float fVar314;
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  float fVar315;
  float fVar316;
  float fVar317;
  float fVar318;
  float fVar319;
  undefined1 auVar310 [32];
  undefined1 auVar311 [32];
  undefined1 auVar312 [32];
  float fVar320;
  float fVar326;
  float fVar328;
  undefined1 auVar322 [16];
  float fVar321;
  undefined1 auVar323 [16];
  float fVar327;
  float fVar329;
  float fVar330;
  float fVar331;
  float fVar333;
  float fVar335;
  float fVar337;
  float fVar338;
  float fVar339;
  undefined1 auVar324 [32];
  float fVar332;
  float fVar334;
  float fVar336;
  undefined1 auVar325 [64];
  undefined1 auVar341 [32];
  undefined1 auVar342 [32];
  undefined1 auVar343 [32];
  undefined1 auVar344 [32];
  undefined1 auVar345 [32];
  undefined1 auVar346 [64];
  float fVar347;
  float fVar358;
  undefined1 auVar349 [32];
  undefined1 auVar350 [32];
  float fVar352;
  float fVar353;
  float fVar354;
  float fVar355;
  float fVar356;
  float fVar357;
  undefined1 auVar351 [64];
  float fVar359;
  float fVar364;
  float fVar365;
  undefined1 auVar360 [16];
  float fVar366;
  undefined1 auVar361 [32];
  undefined1 auVar362 [32];
  float fVar367;
  float fVar368;
  float fVar369;
  undefined1 auVar363 [64];
  float fVar370;
  float fVar377;
  float fVar378;
  undefined1 auVar371 [16];
  undefined1 auVar372 [28];
  float fVar379;
  float fVar380;
  float fVar381;
  float fVar382;
  undefined1 auVar373 [32];
  undefined1 auVar374 [32];
  undefined1 auVar375 [32];
  undefined1 auVar376 [32];
  undefined1 auVar383 [32];
  float fVar386;
  float fVar387;
  float fVar388;
  float fVar389;
  undefined1 auVar384 [32];
  undefined1 auVar385 [32];
  RTCFilterFunctionNArguments args;
  BBox<embree::vfloat_impl<8>_> tp1;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  uint local_aec;
  float local_ae0;
  undefined1 local_aa0 [8];
  float fStack_a98;
  float fStack_a94;
  float fStack_a90;
  float fStack_a8c;
  float fStack_a88;
  float fStack_a84;
  float local_a80;
  float fStack_a7c;
  float fStack_a78;
  float fStack_a74;
  RTCFilterFunctionNArguments local_a58;
  int local_a24;
  undefined1 local_a20 [32];
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [32];
  undefined1 local_990 [8];
  float fStack_988;
  float fStack_984;
  undefined1 local_980 [8];
  float fStack_978;
  float fStack_974;
  undefined1 local_970 [8];
  float fStack_968;
  float fStack_964;
  undefined1 local_960 [8];
  float fStack_958;
  float fStack_954;
  undefined8 local_950;
  float local_948;
  float local_944;
  undefined4 local_940;
  uint local_93c;
  uint local_938;
  uint local_934;
  uint local_930;
  undefined8 local_920;
  float fStack_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  float fStack_908;
  undefined4 uStack_904;
  undefined1 local_900 [32];
  undefined1 local_8e0 [8];
  float fStack_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  float fStack_8c8;
  float fStack_8c4;
  float local_8c0;
  float fStack_8bc;
  float fStack_8b8;
  float fStack_8b4;
  float fStack_8b0;
  float fStack_8ac;
  float fStack_8a8;
  float fStack_8a4;
  float local_8a0;
  float fStack_89c;
  float fStack_898;
  anon_union_4_3_4e909a83_for_anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1_3
  aStack_894;
  float fStack_890;
  float fStack_88c;
  float fStack_888;
  float fStack_884;
  undefined1 local_880 [32];
  undefined1 local_850 [16];
  undefined1 local_840 [8];
  float fStack_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  undefined1 local_820 [8];
  float fStack_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  undefined1 local_800 [8];
  float fStack_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float fStack_7e8;
  float fStack_7e4;
  float local_7e0;
  float fStack_7dc;
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  float fStack_7c4;
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [8];
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  float fStack_704;
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  float local_6c0;
  float fStack_6bc;
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  float fStack_6a4;
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  float fStack_684;
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  float local_660;
  float fStack_65c;
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  undefined4 uStack_644;
  undefined1 local_640 [8];
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  undefined4 uStack_624;
  undefined1 local_620 [32];
  undefined1 local_600 [8];
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  float fStack_5e4;
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  undefined1 local_5a0 [32];
  float local_580;
  float fStack_57c;
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  float local_560;
  float fStack_55c;
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  undefined1 local_540 [32];
  undefined1 local_520 [16];
  undefined1 local_510 [16];
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  undefined1 local_280 [8];
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  undefined1 local_260 [8];
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  undefined4 uStack_224;
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  undefined4 uStack_204;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  undefined4 uStack_1c4;
  float local_1c0 [4];
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  float local_1a0 [4];
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  undefined8 uStack_140;
  int aiStack_138 [66];
  undefined1 auVar340 [16];
  undefined1 auVar348 [16];
  
  PVar12 = prim[1];
  uVar88 = (ulong)(byte)PVar12;
  lVar94 = uVar88 * 0x25;
  fVar97 = *(float *)(prim + lVar94 + 0x12);
  auVar111 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                        *(undefined1 (*) [16])(prim + lVar94 + 6));
  auVar132._0_4_ = fVar97 * auVar111._0_4_;
  auVar132._4_4_ = fVar97 * auVar111._4_4_;
  auVar132._8_4_ = fVar97 * auVar111._8_4_;
  auVar132._12_4_ = fVar97 * auVar111._12_4_;
  auVar285._0_4_ = fVar97 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar285._4_4_ = fVar97 * (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar285._8_4_ = fVar97 * (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar285._12_4_ = fVar97 * (ray->super_RayK<1>).dir.field_0.m128[3];
  auVar111 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar88 * 4 + 6)));
  auVar111 = vcvtdq2ps_avx(auVar111);
  auVar105 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar88 * 5 + 6)));
  auVar105 = vcvtdq2ps_avx(auVar105);
  auVar174 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar88 * 6 + 6)));
  auVar174 = vcvtdq2ps_avx(auVar174);
  auVar175 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar88 * 0xf + 6)));
  auVar107 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar12 * 0x10 + 6)));
  auVar175 = vcvtdq2ps_avx(auVar175);
  auVar323 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar12 * 0x10 + uVar88 + 6)));
  auVar107 = vcvtdq2ps_avx(auVar107);
  auVar323 = vcvtdq2ps_avx(auVar323);
  auVar140 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar88 * 0x1a + 6)));
  auVar140 = vcvtdq2ps_avx(auVar140);
  auVar106 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar88 * 0x1b + 6)));
  auVar106 = vcvtdq2ps_avx(auVar106);
  auVar27 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar88 * 0x1c + 6)));
  auVar27 = vcvtdq2ps_avx(auVar27);
  auVar109 = vshufps_avx(auVar285,auVar285,0);
  auVar28 = vshufps_avx(auVar285,auVar285,0x55);
  auVar29 = vshufps_avx(auVar285,auVar285,0xaa);
  fVar97 = auVar29._0_4_;
  fVar131 = auVar29._4_4_;
  fVar155 = auVar29._8_4_;
  fVar158 = auVar29._12_4_;
  fVar215 = auVar28._0_4_;
  fVar230 = auVar28._4_4_;
  fVar231 = auVar28._8_4_;
  fVar232 = auVar28._12_4_;
  fVar193 = auVar109._0_4_;
  fVar212 = auVar109._4_4_;
  fVar213 = auVar109._8_4_;
  fVar214 = auVar109._12_4_;
  auVar360._0_4_ = fVar193 * auVar111._0_4_ + fVar215 * auVar105._0_4_ + fVar97 * auVar174._0_4_;
  auVar360._4_4_ = fVar212 * auVar111._4_4_ + fVar230 * auVar105._4_4_ + fVar131 * auVar174._4_4_;
  auVar360._8_4_ = fVar213 * auVar111._8_4_ + fVar231 * auVar105._8_4_ + fVar155 * auVar174._8_4_;
  auVar360._12_4_ =
       fVar214 * auVar111._12_4_ + fVar232 * auVar105._12_4_ + fVar158 * auVar174._12_4_;
  auVar371._0_4_ = fVar193 * auVar175._0_4_ + fVar215 * auVar107._0_4_ + auVar323._0_4_ * fVar97;
  auVar371._4_4_ = fVar212 * auVar175._4_4_ + fVar230 * auVar107._4_4_ + auVar323._4_4_ * fVar131;
  auVar371._8_4_ = fVar213 * auVar175._8_4_ + fVar231 * auVar107._8_4_ + auVar323._8_4_ * fVar155;
  auVar371._12_4_ =
       fVar214 * auVar175._12_4_ + fVar232 * auVar107._12_4_ + auVar323._12_4_ * fVar158;
  auVar286._0_4_ = fVar193 * auVar140._0_4_ + fVar215 * auVar106._0_4_ + auVar27._0_4_ * fVar97;
  auVar286._4_4_ = fVar212 * auVar140._4_4_ + fVar230 * auVar106._4_4_ + auVar27._4_4_ * fVar131;
  auVar286._8_4_ = fVar213 * auVar140._8_4_ + fVar231 * auVar106._8_4_ + auVar27._8_4_ * fVar155;
  auVar286._12_4_ = fVar214 * auVar140._12_4_ + fVar232 * auVar106._12_4_ + auVar27._12_4_ * fVar158
  ;
  auVar109 = vshufps_avx(auVar132,auVar132,0);
  auVar28 = vshufps_avx(auVar132,auVar132,0x55);
  auVar29 = vshufps_avx(auVar132,auVar132,0xaa);
  fVar97 = auVar29._0_4_;
  fVar131 = auVar29._4_4_;
  fVar155 = auVar29._8_4_;
  fVar158 = auVar29._12_4_;
  fVar215 = auVar28._0_4_;
  fVar230 = auVar28._4_4_;
  fVar231 = auVar28._8_4_;
  fVar232 = auVar28._12_4_;
  fVar193 = auVar109._0_4_;
  fVar212 = auVar109._4_4_;
  fVar213 = auVar109._8_4_;
  fVar214 = auVar109._12_4_;
  auVar133._0_4_ = fVar193 * auVar111._0_4_ + fVar215 * auVar105._0_4_ + fVar97 * auVar174._0_4_;
  auVar133._4_4_ = fVar212 * auVar111._4_4_ + fVar230 * auVar105._4_4_ + fVar131 * auVar174._4_4_;
  auVar133._8_4_ = fVar213 * auVar111._8_4_ + fVar231 * auVar105._8_4_ + fVar155 * auVar174._8_4_;
  auVar133._12_4_ =
       fVar214 * auVar111._12_4_ + fVar232 * auVar105._12_4_ + fVar158 * auVar174._12_4_;
  auVar98._0_4_ = fVar193 * auVar175._0_4_ + auVar323._0_4_ * fVar97 + fVar215 * auVar107._0_4_;
  auVar98._4_4_ = fVar212 * auVar175._4_4_ + auVar323._4_4_ * fVar131 + fVar230 * auVar107._4_4_;
  auVar98._8_4_ = fVar213 * auVar175._8_4_ + auVar323._8_4_ * fVar155 + fVar231 * auVar107._8_4_;
  auVar98._12_4_ = fVar214 * auVar175._12_4_ + auVar323._12_4_ * fVar158 + fVar232 * auVar107._12_4_
  ;
  auVar305._8_4_ = 0x7fffffff;
  auVar305._0_8_ = 0x7fffffff7fffffff;
  auVar305._12_4_ = 0x7fffffff;
  auVar111 = vandps_avx(auVar360,auVar305);
  auVar216._8_4_ = 0x219392ef;
  auVar216._0_8_ = 0x219392ef219392ef;
  auVar216._12_4_ = 0x219392ef;
  auVar111 = vcmpps_avx(auVar111,auVar216,1);
  auVar105 = vblendvps_avx(auVar360,auVar216,auVar111);
  auVar111 = vandps_avx(auVar371,auVar305);
  auVar111 = vcmpps_avx(auVar111,auVar216,1);
  auVar174 = vblendvps_avx(auVar371,auVar216,auVar111);
  auVar111 = vandps_avx(auVar305,auVar286);
  auVar111 = vcmpps_avx(auVar111,auVar216,1);
  auVar111 = vblendvps_avx(auVar286,auVar216,auVar111);
  auVar167._0_4_ = fVar193 * auVar140._0_4_ + fVar215 * auVar106._0_4_ + auVar27._0_4_ * fVar97;
  auVar167._4_4_ = fVar212 * auVar140._4_4_ + fVar230 * auVar106._4_4_ + auVar27._4_4_ * fVar131;
  auVar167._8_4_ = fVar213 * auVar140._8_4_ + fVar231 * auVar106._8_4_ + auVar27._8_4_ * fVar155;
  auVar167._12_4_ = fVar214 * auVar140._12_4_ + fVar232 * auVar106._12_4_ + auVar27._12_4_ * fVar158
  ;
  auVar175 = vrcpps_avx(auVar105);
  fVar193 = auVar175._0_4_;
  auVar194._0_4_ = fVar193 * auVar105._0_4_;
  fVar212 = auVar175._4_4_;
  auVar194._4_4_ = fVar212 * auVar105._4_4_;
  fVar213 = auVar175._8_4_;
  auVar194._8_4_ = fVar213 * auVar105._8_4_;
  fVar214 = auVar175._12_4_;
  auVar194._12_4_ = fVar214 * auVar105._12_4_;
  auVar256._8_4_ = 0x3f800000;
  auVar256._0_8_ = 0x3f8000003f800000;
  auVar256._12_4_ = 0x3f800000;
  auVar105 = vsubps_avx(auVar256,auVar194);
  fVar193 = fVar193 + fVar193 * auVar105._0_4_;
  fVar212 = fVar212 + fVar212 * auVar105._4_4_;
  fVar213 = fVar213 + fVar213 * auVar105._8_4_;
  fVar214 = fVar214 + fVar214 * auVar105._12_4_;
  auVar105 = vrcpps_avx(auVar174);
  fVar215 = auVar105._0_4_;
  auVar234._0_4_ = fVar215 * auVar174._0_4_;
  fVar230 = auVar105._4_4_;
  auVar234._4_4_ = fVar230 * auVar174._4_4_;
  fVar231 = auVar105._8_4_;
  auVar234._8_4_ = fVar231 * auVar174._8_4_;
  fVar232 = auVar105._12_4_;
  auVar234._12_4_ = fVar232 * auVar174._12_4_;
  auVar105 = vsubps_avx(auVar256,auVar234);
  fVar215 = fVar215 + fVar215 * auVar105._0_4_;
  fVar230 = fVar230 + fVar230 * auVar105._4_4_;
  fVar231 = fVar231 + fVar231 * auVar105._8_4_;
  fVar232 = fVar232 + fVar232 * auVar105._12_4_;
  auVar105 = vrcpps_avx(auVar111);
  fVar233 = auVar105._0_4_;
  auVar287._0_4_ = fVar233 * auVar111._0_4_;
  fVar246 = auVar105._4_4_;
  auVar287._4_4_ = fVar246 * auVar111._4_4_;
  fVar247 = auVar105._8_4_;
  auVar287._8_4_ = fVar247 * auVar111._8_4_;
  fVar248 = auVar105._12_4_;
  auVar287._12_4_ = fVar248 * auVar111._12_4_;
  auVar111 = vsubps_avx(auVar256,auVar287);
  fVar233 = fVar233 + fVar233 * auVar111._0_4_;
  fVar246 = fVar246 + fVar246 * auVar111._4_4_;
  fVar247 = fVar247 + fVar247 * auVar111._8_4_;
  fVar248 = fVar248 + fVar248 * auVar111._12_4_;
  auVar111 = ZEXT416((uint)(((ray->super_RayK<1>).dir.field_0.m128[3] -
                            *(float *)(prim + lVar94 + 0x16)) * *(float *)(prim + lVar94 + 0x1a)));
  auVar174 = vshufps_avx(auVar111,auVar111,0);
  auVar111._8_8_ = 0;
  auVar111._0_8_ = *(ulong *)(prim + uVar88 * 7 + 6);
  auVar111 = vpmovsxwd_avx(auVar111);
  auVar111 = vcvtdq2ps_avx(auVar111);
  auVar105._8_8_ = 0;
  auVar105._0_8_ = *(ulong *)(prim + uVar88 * 0xb + 6);
  auVar105 = vpmovsxwd_avx(auVar105);
  auVar105 = vcvtdq2ps_avx(auVar105);
  auVar175 = vsubps_avx(auVar105,auVar111);
  fVar97 = auVar174._0_4_;
  fVar131 = auVar174._4_4_;
  fVar155 = auVar174._8_4_;
  fVar158 = auVar174._12_4_;
  auVar174._8_8_ = 0;
  auVar174._0_8_ = *(ulong *)(prim + uVar88 * 9 + 6);
  auVar105 = vpmovsxwd_avx(auVar174);
  auVar288._0_4_ = auVar175._0_4_ * fVar97 + auVar111._0_4_;
  auVar288._4_4_ = auVar175._4_4_ * fVar131 + auVar111._4_4_;
  auVar288._8_4_ = auVar175._8_4_ * fVar155 + auVar111._8_4_;
  auVar288._12_4_ = auVar175._12_4_ * fVar158 + auVar111._12_4_;
  auVar175._8_8_ = 0;
  auVar175._0_8_ = *(ulong *)(prim + uVar88 * 0xd + 6);
  auVar174 = vpmovsxwd_avx(auVar175);
  auVar111 = vcvtdq2ps_avx(auVar105);
  auVar105 = vcvtdq2ps_avx(auVar174);
  auVar105 = vsubps_avx(auVar105,auVar111);
  auVar306._0_4_ = auVar105._0_4_ * fVar97 + auVar111._0_4_;
  auVar306._4_4_ = auVar105._4_4_ * fVar131 + auVar111._4_4_;
  auVar306._8_4_ = auVar105._8_4_ * fVar155 + auVar111._8_4_;
  auVar306._12_4_ = auVar105._12_4_ * fVar158 + auVar111._12_4_;
  auVar107._8_8_ = 0;
  auVar107._0_8_ = *(ulong *)(prim + uVar88 * 0x12 + 6);
  auVar111 = vpmovsxwd_avx(auVar107);
  uVar96 = (ulong)(uint)((int)(uVar88 * 5) << 2);
  auVar323._8_8_ = 0;
  auVar323._0_8_ = *(ulong *)(prim + uVar88 * 2 + uVar96 + 6);
  auVar105 = vpmovsxwd_avx(auVar323);
  auVar111 = vcvtdq2ps_avx(auVar111);
  auVar105 = vcvtdq2ps_avx(auVar105);
  auVar105 = vsubps_avx(auVar105,auVar111);
  auVar322._0_4_ = auVar105._0_4_ * fVar97 + auVar111._0_4_;
  auVar322._4_4_ = auVar105._4_4_ * fVar131 + auVar111._4_4_;
  auVar322._8_4_ = auVar105._8_4_ * fVar155 + auVar111._8_4_;
  auVar322._12_4_ = auVar105._12_4_ * fVar158 + auVar111._12_4_;
  auVar140._8_8_ = 0;
  auVar140._0_8_ = *(ulong *)(prim + uVar96 + 6);
  auVar111 = vpmovsxwd_avx(auVar140);
  auVar111 = vcvtdq2ps_avx(auVar111);
  auVar106._8_8_ = 0;
  auVar106._0_8_ = *(ulong *)(prim + uVar88 * 0x18 + 6);
  auVar105 = vpmovsxwd_avx(auVar106);
  auVar105 = vcvtdq2ps_avx(auVar105);
  auVar174 = vsubps_avx(auVar105,auVar111);
  auVar27._8_8_ = 0;
  auVar27._0_8_ = *(ulong *)(prim + uVar88 * 0x1d + 6);
  auVar105 = vpmovsxwd_avx(auVar27);
  auVar340._0_4_ = auVar174._0_4_ * fVar97 + auVar111._0_4_;
  auVar340._4_4_ = auVar174._4_4_ * fVar131 + auVar111._4_4_;
  auVar340._8_4_ = auVar174._8_4_ * fVar155 + auVar111._8_4_;
  auVar340._12_4_ = auVar174._12_4_ * fVar158 + auVar111._12_4_;
  auVar346 = ZEXT1664(auVar340);
  auVar111 = vcvtdq2ps_avx(auVar105);
  auVar109._8_8_ = 0;
  auVar109._0_8_ = *(ulong *)(prim + uVar88 + (ulong)(byte)PVar12 * 0x20 + 6);
  auVar105 = vpmovsxwd_avx(auVar109);
  auVar105 = vcvtdq2ps_avx(auVar105);
  auVar105 = vsubps_avx(auVar105,auVar111);
  auVar348._0_4_ = auVar105._0_4_ * fVar97 + auVar111._0_4_;
  auVar348._4_4_ = auVar105._4_4_ * fVar131 + auVar111._4_4_;
  auVar348._8_4_ = auVar105._8_4_ * fVar155 + auVar111._8_4_;
  auVar348._12_4_ = auVar105._12_4_ * fVar158 + auVar111._12_4_;
  auVar351 = ZEXT1664(auVar348);
  auVar28._8_8_ = 0;
  auVar28._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar12 * 0x20 - uVar88) + 6);
  auVar111 = vpmovsxwd_avx(auVar28);
  auVar111 = vcvtdq2ps_avx(auVar111);
  auVar363 = ZEXT1664(auVar111);
  auVar29._8_8_ = 0;
  auVar29._0_8_ = *(ulong *)(prim + uVar88 * 0x23 + 6);
  auVar105 = vpmovsxwd_avx(auVar29);
  auVar105 = vcvtdq2ps_avx(auVar105);
  auVar105 = vsubps_avx(auVar105,auVar111);
  auVar257._0_4_ = auVar111._0_4_ + auVar105._0_4_ * fVar97;
  auVar257._4_4_ = auVar111._4_4_ + auVar105._4_4_ * fVar131;
  auVar257._8_4_ = auVar111._8_4_ + auVar105._8_4_ * fVar155;
  auVar257._12_4_ = auVar111._12_4_ + auVar105._12_4_ * fVar158;
  auVar111 = vsubps_avx(auVar288,auVar133);
  auVar289._0_4_ = fVar193 * auVar111._0_4_;
  auVar289._4_4_ = fVar212 * auVar111._4_4_;
  auVar289._8_4_ = fVar213 * auVar111._8_4_;
  auVar289._12_4_ = fVar214 * auVar111._12_4_;
  auVar111 = vsubps_avx(auVar306,auVar133);
  auVar134._0_4_ = fVar193 * auVar111._0_4_;
  auVar134._4_4_ = fVar212 * auVar111._4_4_;
  auVar134._8_4_ = fVar213 * auVar111._8_4_;
  auVar134._12_4_ = fVar214 * auVar111._12_4_;
  auVar111 = vsubps_avx(auVar322,auVar98);
  auVar195._0_4_ = fVar215 * auVar111._0_4_;
  auVar195._4_4_ = fVar230 * auVar111._4_4_;
  auVar195._8_4_ = fVar231 * auVar111._8_4_;
  auVar195._12_4_ = fVar232 * auVar111._12_4_;
  auVar111 = vsubps_avx(auVar340,auVar98);
  auVar99._0_4_ = fVar215 * auVar111._0_4_;
  auVar99._4_4_ = fVar230 * auVar111._4_4_;
  auVar99._8_4_ = fVar231 * auVar111._8_4_;
  auVar99._12_4_ = fVar232 * auVar111._12_4_;
  auVar111 = vsubps_avx(auVar348,auVar167);
  auVar217._0_4_ = fVar233 * auVar111._0_4_;
  auVar217._4_4_ = fVar246 * auVar111._4_4_;
  auVar217._8_4_ = fVar247 * auVar111._8_4_;
  auVar217._12_4_ = fVar248 * auVar111._12_4_;
  auVar111 = vsubps_avx(auVar257,auVar167);
  auVar168._0_4_ = fVar233 * auVar111._0_4_;
  auVar168._4_4_ = fVar246 * auVar111._4_4_;
  auVar168._8_4_ = fVar247 * auVar111._8_4_;
  auVar168._12_4_ = fVar248 * auVar111._12_4_;
  auVar111 = vpminsd_avx(auVar289,auVar134);
  auVar105 = vpminsd_avx(auVar195,auVar99);
  auVar111 = vmaxps_avx(auVar111,auVar105);
  auVar105 = vpminsd_avx(auVar217,auVar168);
  uVar8 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar307._4_4_ = uVar8;
  auVar307._0_4_ = uVar8;
  auVar307._8_4_ = uVar8;
  auVar307._12_4_ = uVar8;
  auVar105 = vmaxps_avx(auVar105,auVar307);
  auVar111 = vmaxps_avx(auVar111,auVar105);
  local_520._0_4_ = auVar111._0_4_ * 0.99999964;
  local_520._4_4_ = auVar111._4_4_ * 0.99999964;
  local_520._8_4_ = auVar111._8_4_ * 0.99999964;
  local_520._12_4_ = auVar111._12_4_ * 0.99999964;
  auVar111 = vpmaxsd_avx(auVar289,auVar134);
  auVar105 = vpmaxsd_avx(auVar195,auVar99);
  auVar111 = vminps_avx(auVar111,auVar105);
  auVar105 = vpmaxsd_avx(auVar217,auVar168);
  fVar97 = (ray->super_RayK<1>).tfar;
  auVar169._4_4_ = fVar97;
  auVar169._0_4_ = fVar97;
  auVar169._8_4_ = fVar97;
  auVar169._12_4_ = fVar97;
  auVar105 = vminps_avx(auVar105,auVar169);
  auVar111 = vminps_avx(auVar111,auVar105);
  auVar100._0_4_ = auVar111._0_4_ * 1.0000004;
  auVar100._4_4_ = auVar111._4_4_ * 1.0000004;
  auVar100._8_4_ = auVar111._8_4_ * 1.0000004;
  auVar100._12_4_ = auVar111._12_4_ * 1.0000004;
  auVar111 = vpshufd_avx(ZEXT116((byte)PVar12),0);
  auVar105 = vpcmpgtd_avx(auVar111,_DAT_01f7fcf0);
  auVar111 = vcmpps_avx(local_520,auVar100,2);
  auVar111 = vandps_avx(auVar111,auVar105);
  uVar86 = vmovmskps_avx(auVar111);
  if (uVar86 == 0) {
    return;
  }
  auVar112._16_16_ = mm_lookupmask_ps._240_16_;
  auVar112._0_16_ = mm_lookupmask_ps._240_16_;
  uVar86 = uVar86 & 0xff;
  local_2e0 = vblendps_avx(auVar112,ZEXT832(0) << 0x20,0x80);
LAB_00f2f45e:
  lVar94 = 0;
  if (uVar86 != 0) {
    for (; (uVar86 >> lVar94 & 1) == 0; lVar94 = lVar94 + 1) {
    }
  }
  uVar92 = *(uint *)(prim + 2);
  pGVar13 = (context->scene->geometries).items[uVar92].ptr;
  uVar88 = (ulong)*(uint *)(*(long *)&pGVar13->field_0x58 +
                           (ulong)*(uint *)(prim + lVar94 * 4 + 6) *
                           pGVar13[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  fVar97 = (pGVar13->time_range).lower;
  fVar97 = pGVar13->fnumTimeSegments *
           (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar97) /
           ((pGVar13->time_range).upper - fVar97));
  auVar111 = vroundss_avx(ZEXT416((uint)fVar97),ZEXT416((uint)fVar97),9);
  auVar111 = vminss_avx(auVar111,ZEXT416((uint)(pGVar13->fnumTimeSegments + -1.0)));
  auVar111 = vmaxss_avx(ZEXT816(0) << 0x20,auVar111);
  fVar97 = fVar97 - auVar111._0_4_;
  _Var14 = pGVar13[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar93 = (long)(int)auVar111._0_4_ * 0x38;
  lVar15 = *(long *)(_Var14 + 0x10 + lVar93);
  lVar16 = *(long *)(_Var14 + 0x38 + lVar93);
  lVar17 = *(long *)(_Var14 + 0x48 + lVar93);
  auVar111 = vshufps_avx(ZEXT416((uint)fVar97),ZEXT416((uint)fVar97),0);
  pfVar1 = (float *)(lVar16 + uVar88 * lVar17);
  fVar193 = auVar111._0_4_;
  fVar212 = auVar111._4_4_;
  fVar213 = auVar111._8_4_;
  fVar214 = auVar111._12_4_;
  pfVar2 = (float *)(lVar16 + (uVar88 + 1) * lVar17);
  pfVar3 = (float *)(lVar16 + (uVar88 + 2) * lVar17);
  pfVar4 = (float *)(lVar16 + lVar17 * (uVar88 + 3));
  lVar16 = *(long *)(_Var14 + lVar93);
  auVar111 = vshufps_avx(ZEXT416((uint)(1.0 - fVar97)),ZEXT416((uint)(1.0 - fVar97)),0);
  pfVar5 = (float *)(lVar16 + lVar15 * uVar88);
  fVar97 = auVar111._0_4_;
  fVar131 = auVar111._4_4_;
  fVar155 = auVar111._8_4_;
  fVar158 = auVar111._12_4_;
  pfVar6 = (float *)(lVar16 + lVar15 * (uVar88 + 1));
  pfVar7 = (float *)(lVar16 + lVar15 * (uVar88 + 2));
  auVar170._0_4_ = fVar193 * *pfVar1 + fVar97 * *pfVar5;
  auVar170._4_4_ = fVar212 * pfVar1[1] + fVar131 * pfVar5[1];
  auVar170._8_4_ = fVar213 * pfVar1[2] + fVar155 * pfVar5[2];
  auVar170._12_4_ = fVar214 * pfVar1[3] + fVar158 * pfVar5[3];
  auVar196._0_4_ = fVar97 * *pfVar6 + fVar193 * *pfVar2;
  auVar196._4_4_ = fVar131 * pfVar6[1] + fVar212 * pfVar2[1];
  auVar196._8_4_ = fVar155 * pfVar6[2] + fVar213 * pfVar2[2];
  auVar196._12_4_ = fVar158 * pfVar6[3] + fVar214 * pfVar2[3];
  auVar218._0_4_ = fVar97 * *pfVar7 + fVar193 * *pfVar3;
  auVar218._4_4_ = fVar131 * pfVar7[1] + fVar212 * pfVar3[1];
  auVar218._8_4_ = fVar155 * pfVar7[2] + fVar213 * pfVar3[2];
  auVar218._12_4_ = fVar158 * pfVar7[3] + fVar214 * pfVar3[3];
  pfVar1 = (float *)(lVar16 + lVar15 * (uVar88 + 3));
  auVar235._0_4_ = fVar97 * *pfVar1 + fVar193 * *pfVar4;
  auVar235._4_4_ = fVar131 * pfVar1[1] + fVar212 * pfVar4[1];
  auVar235._8_4_ = fVar155 * pfVar1[2] + fVar213 * pfVar4[2];
  auVar235._12_4_ = fVar158 * pfVar1[3] + fVar214 * pfVar4[3];
  auVar101._0_4_ = (auVar170._0_4_ + auVar196._0_4_ + auVar218._0_4_ + auVar235._0_4_) * 0.25;
  auVar101._4_4_ = (auVar170._4_4_ + auVar196._4_4_ + auVar218._4_4_ + auVar235._4_4_) * 0.25;
  auVar101._8_4_ = (auVar170._8_4_ + auVar196._8_4_ + auVar218._8_4_ + auVar235._8_4_) * 0.25;
  auVar101._12_4_ = (auVar170._12_4_ + auVar196._12_4_ + auVar218._12_4_ + auVar235._12_4_) * 0.25;
  aVar10 = (ray->super_RayK<1>).org.field_0.field_1;
  aVar11 = (ray->super_RayK<1>).dir.field_0.field_1;
  auVar111 = vsubps_avx(auVar101,(undefined1  [16])aVar10);
  auVar111 = vdpps_avx(auVar111,(undefined1  [16])aVar11,0x7f);
  auVar105 = vdpps_avx((undefined1  [16])aVar11,(undefined1  [16])aVar11,0x7f);
  auVar174 = vrcpss_avx(auVar105,auVar105);
  auVar325 = ZEXT464(0x40000000);
  fVar97 = auVar111._0_4_ * auVar174._0_4_ * (2.0 - auVar174._0_4_ * auVar105._0_4_);
  local_850 = ZEXT416((uint)fVar97);
  auVar105 = vshufps_avx(ZEXT416((uint)fVar97),ZEXT416((uint)fVar97),0);
  fVar97 = aVar11.x;
  fVar131 = aVar11.y;
  fVar155 = aVar11.z;
  aVar159 = aVar11.field_3;
  auVar258._0_4_ = aVar10.x + fVar97 * auVar105._0_4_;
  auVar258._4_4_ = aVar10.y + fVar131 * auVar105._4_4_;
  auVar258._8_4_ = aVar10.z + fVar155 * auVar105._8_4_;
  auVar258._12_4_ = aVar10.field_3.w + aVar159.w * auVar105._12_4_;
  auVar111 = vblendps_avx(auVar258,_DAT_01f7aa10,8);
  _local_960 = vsubps_avx(auVar170,auVar111);
  auVar292 = ZEXT1664(_local_960);
  _local_970 = vsubps_avx(auVar218,auVar111);
  _local_980 = vsubps_avx(auVar196,auVar111);
  _local_990 = vsubps_avx(auVar235,auVar111);
  auVar245 = ZEXT1664(_local_990);
  auVar111 = vshufps_avx(_local_960,_local_960,0);
  register0x00001290 = auVar111;
  _local_1e0 = auVar111;
  auVar111 = vshufps_avx(_local_960,_local_960,0x55);
  register0x00001290 = auVar111;
  _local_200 = auVar111;
  auVar111 = vshufps_avx(_local_960,_local_960,0xaa);
  register0x00001290 = auVar111;
  _local_220 = auVar111;
  auVar111 = vshufps_avx(_local_960,_local_960,0xff);
  register0x00001290 = auVar111;
  _local_240 = auVar111;
  auVar111 = vshufps_avx(_local_980,_local_980,0);
  register0x00001290 = auVar111;
  _local_260 = auVar111;
  auVar111 = vshufps_avx(_local_980,_local_980,0x55);
  register0x00001290 = auVar111;
  _local_280 = auVar111;
  auVar111 = vshufps_avx(_local_980,_local_980,0xaa);
  register0x00001290 = auVar111;
  _local_2a0 = auVar111;
  auVar135._0_4_ = fVar97 * fVar97;
  auVar135._4_4_ = fVar131 * fVar131;
  auVar135._8_4_ = fVar155 * fVar155;
  auVar135._12_4_ = aVar159.w * aVar159.w;
  auVar111 = vshufps_avx(auVar135,auVar135,0xaa);
  auVar174 = vshufps_avx(auVar135,auVar135,0x55);
  auVar175 = vshufps_avx(_local_980,_local_980,0xff);
  register0x000012d0 = auVar175;
  _local_320 = auVar175;
  auVar175 = vshufps_avx(auVar135,auVar135,0);
  local_2c0._0_4_ = auVar175._0_4_ + auVar174._0_4_ + auVar111._0_4_;
  local_2c0._4_4_ = auVar175._4_4_ + auVar174._4_4_ + auVar111._4_4_;
  local_2c0._8_4_ = auVar175._8_4_ + auVar174._8_4_ + auVar111._8_4_;
  local_2c0._12_4_ = auVar175._12_4_ + auVar174._12_4_ + auVar111._12_4_;
  local_2c0._16_4_ = auVar175._0_4_ + auVar174._0_4_ + auVar111._0_4_;
  local_2c0._20_4_ = auVar175._4_4_ + auVar174._4_4_ + auVar111._4_4_;
  local_2c0._24_4_ = auVar175._8_4_ + auVar174._8_4_ + auVar111._8_4_;
  local_2c0._28_4_ = auVar175._12_4_ + auVar174._12_4_ + auVar111._12_4_;
  auVar267 = ZEXT3264(local_2c0);
  auVar111 = vshufps_avx(_local_970,_local_970,0);
  register0x00001250 = auVar111;
  _local_340 = auVar111;
  auVar111 = vshufps_avx(_local_970,_local_970,0x55);
  register0x00001250 = auVar111;
  _local_360 = auVar111;
  auVar111 = vshufps_avx(_local_970,_local_970,0xaa);
  register0x00001250 = auVar111;
  _local_380 = auVar111;
  auVar111 = vshufps_avx(_local_970,_local_970,0xff);
  register0x00001250 = auVar111;
  _local_3a0 = auVar111;
  auVar111 = vshufps_avx(_local_990,_local_990,0);
  register0x00001250 = auVar111;
  _local_3c0 = auVar111;
  auVar111 = vshufps_avx(_local_990,_local_990,0x55);
  register0x00001250 = auVar111;
  _local_3e0 = auVar111;
  auVar111 = vshufps_avx(_local_990,_local_990,0xaa);
  register0x00001250 = auVar111;
  _local_400 = auVar111;
  auVar111 = vshufps_avx(_local_990,_local_990,0xff);
  register0x00001250 = auVar111;
  _local_420 = auVar111;
  register0x00001210 = auVar105;
  _local_720 = auVar105;
  local_aec = 1;
  uVar96 = 0;
  local_580 = (ray->super_RayK<1>).dir.field_0.m128[0];
  fStack_57c = local_580;
  fStack_578 = local_580;
  fStack_574 = local_580;
  fStack_570 = local_580;
  fStack_56c = local_580;
  fStack_568 = local_580;
  fStack_564 = local_580;
  local_560 = (ray->super_RayK<1>).dir.field_0.m128[1];
  fStack_55c = local_560;
  fStack_558 = local_560;
  fStack_554 = local_560;
  fStack_550 = local_560;
  fStack_54c = local_560;
  fStack_548 = local_560;
  fStack_544 = local_560;
  local_7e0 = (ray->super_RayK<1>).dir.field_0.m128[2];
  fStack_7dc = local_7e0;
  fStack_7d8 = local_7e0;
  fStack_7d4 = local_7e0;
  fStack_7d0 = local_7e0;
  fStack_7cc = local_7e0;
  fStack_7c8 = local_7e0;
  fStack_7c4 = local_7e0;
  auVar113._8_4_ = 0x7fffffff;
  auVar113._0_8_ = 0x7fffffff7fffffff;
  auVar113._12_4_ = 0x7fffffff;
  auVar113._16_4_ = 0x7fffffff;
  auVar113._20_4_ = 0x7fffffff;
  auVar113._24_4_ = 0x7fffffff;
  auVar113._28_4_ = 0x7fffffff;
  local_440 = vandps_avx(local_2c0,auVar113);
  local_510 = ZEXT816(0x3f80000000000000);
  uVar88 = (ulong)*(uint *)(prim + lVar94 * 4 + 6);
  do {
    auVar383._8_4_ = 0x3f800000;
    auVar383._0_8_ = 0x3f8000003f800000;
    auVar383._12_4_ = 0x3f800000;
    auVar383._16_4_ = 0x3f800000;
    auVar383._20_4_ = 0x3f800000;
    auVar383._24_4_ = 0x3f800000;
    auVar383._28_4_ = 0x3f800000;
    iVar95 = (int)uVar96;
    auVar111 = vmovshdup_avx(local_510);
    auVar174 = vsubps_avx(auVar111,local_510);
    auVar111 = vshufps_avx(local_510,local_510,0);
    register0x00001290 = auVar111;
    _local_8e0 = auVar111;
    auVar105 = vshufps_avx(auVar174,auVar174,0);
    register0x00001250 = auVar105;
    _local_800 = auVar105;
    fVar129 = auVar105._0_4_;
    fVar153 = auVar105._4_4_;
    fVar156 = auVar105._8_4_;
    fVar160 = auVar105._12_4_;
    fVar166 = auVar111._0_4_;
    auVar208._0_4_ = fVar166 + fVar129 * 0.0;
    fVar190 = auVar111._4_4_;
    auVar208._4_4_ = fVar190 + fVar153 * 0.14285715;
    fVar191 = auVar111._8_4_;
    auVar208._8_4_ = fVar191 + fVar156 * 0.2857143;
    fVar192 = auVar111._12_4_;
    auVar208._12_4_ = fVar192 + fVar160 * 0.42857146;
    auVar208._16_4_ = fVar166 + fVar129 * 0.5714286;
    auVar208._20_4_ = fVar190 + fVar153 * 0.71428573;
    auVar208._24_4_ = fVar191 + fVar156 * 0.8571429;
    auVar208._28_4_ = fVar192 + fVar160;
    auVar112 = vsubps_avx(auVar383,auVar208);
    fVar131 = auVar112._0_4_;
    fVar155 = auVar112._4_4_;
    fVar158 = auVar112._8_4_;
    fVar193 = auVar112._12_4_;
    fVar212 = auVar112._16_4_;
    fVar213 = auVar112._20_4_;
    fVar214 = auVar112._24_4_;
    fVar232 = fVar131 * fVar131 * fVar131;
    fVar247 = fVar155 * fVar155 * fVar155;
    fVar269 = fVar158 * fVar158 * fVar158;
    fVar272 = fVar193 * fVar193 * fVar193;
    fVar275 = fVar212 * fVar212 * fVar212;
    fVar278 = fVar213 * fVar213 * fVar213;
    fVar281 = fVar214 * fVar214 * fVar214;
    fVar284 = auVar208._0_4_ * auVar208._0_4_ * auVar208._0_4_;
    fVar293 = auVar208._4_4_ * auVar208._4_4_ * auVar208._4_4_;
    fVar294 = auVar208._8_4_ * auVar208._8_4_ * auVar208._8_4_;
    fVar296 = auVar208._12_4_ * auVar208._12_4_ * auVar208._12_4_;
    fVar298 = auVar208._16_4_ * auVar208._16_4_ * auVar208._16_4_;
    fVar300 = auVar208._20_4_ * auVar208._20_4_ * auVar208._20_4_;
    fVar302 = auVar208._24_4_ * auVar208._24_4_ * auVar208._24_4_;
    fVar97 = auVar245._28_4_;
    fVar215 = auVar208._0_4_ * fVar131;
    fVar230 = auVar208._4_4_ * fVar155;
    fVar231 = auVar208._8_4_ * fVar158;
    fVar246 = auVar208._12_4_ * fVar193;
    fVar249 = auVar208._16_4_ * fVar212;
    fVar250 = auVar208._20_4_ * fVar213;
    fVar252 = auVar208._24_4_ * fVar214;
    fVar233 = auVar346._28_4_ + auVar363._28_4_;
    fVar319 = auVar292._28_4_ + fVar97 + fVar233;
    fVar338 = fVar233 + auVar267._28_4_ + auVar351._28_4_ + auVar325._28_4_;
    fVar233 = fVar232 * 0.16666667;
    fVar248 = fVar247 * 0.16666667;
    fVar270 = fVar269 * 0.16666667;
    fVar273 = fVar272 * 0.16666667;
    fVar276 = fVar275 * 0.16666667;
    fVar279 = fVar278 * 0.16666667;
    fVar282 = fVar281 * 0.16666667;
    fVar304 = (fVar284 + fVar232 * 4.0 + fVar131 * fVar215 * 12.0 + auVar208._0_4_ * fVar215 * 6.0)
              * 0.16666667;
    fVar313 = (fVar293 + fVar247 * 4.0 + fVar155 * fVar230 * 12.0 + auVar208._4_4_ * fVar230 * 6.0)
              * 0.16666667;
    fVar314 = (fVar294 + fVar269 * 4.0 + fVar158 * fVar231 * 12.0 + auVar208._8_4_ * fVar231 * 6.0)
              * 0.16666667;
    fVar315 = (fVar296 + fVar272 * 4.0 + fVar193 * fVar246 * 12.0 + auVar208._12_4_ * fVar246 * 6.0)
              * 0.16666667;
    fVar316 = (fVar298 + fVar275 * 4.0 + fVar212 * fVar249 * 12.0 + auVar208._16_4_ * fVar249 * 6.0)
              * 0.16666667;
    fVar317 = (fVar300 + fVar278 * 4.0 + fVar213 * fVar250 * 12.0 + auVar208._20_4_ * fVar250 * 6.0)
              * 0.16666667;
    fVar318 = (fVar302 + fVar281 * 4.0 + fVar214 * fVar252 * 12.0 + auVar208._24_4_ * fVar252 * 6.0)
              * 0.16666667;
    fVar232 = (fVar284 * 4.0 + fVar232 + auVar208._0_4_ * fVar215 * 12.0 + fVar131 * fVar215 * 6.0)
              * 0.16666667;
    fVar247 = (fVar293 * 4.0 + fVar247 + auVar208._4_4_ * fVar230 * 12.0 + fVar155 * fVar230 * 6.0)
              * 0.16666667;
    fVar269 = (fVar294 * 4.0 + fVar269 + auVar208._8_4_ * fVar231 * 12.0 + fVar158 * fVar231 * 6.0)
              * 0.16666667;
    fVar272 = (fVar296 * 4.0 + fVar272 + auVar208._12_4_ * fVar246 * 12.0 + fVar193 * fVar246 * 6.0)
              * 0.16666667;
    fVar275 = (fVar298 * 4.0 + fVar275 + auVar208._16_4_ * fVar249 * 12.0 + fVar212 * fVar249 * 6.0)
              * 0.16666667;
    fVar278 = (fVar300 * 4.0 + fVar278 + auVar208._20_4_ * fVar250 * 12.0 + fVar213 * fVar250 * 6.0)
              * 0.16666667;
    fVar281 = (fVar302 * 4.0 + fVar281 + auVar208._24_4_ * fVar252 * 12.0 + fVar214 * fVar252 * 6.0)
              * 0.16666667;
    fVar284 = fVar284 * 0.16666667;
    fVar293 = fVar293 * 0.16666667;
    fVar294 = fVar294 * 0.16666667;
    fVar296 = fVar296 * 0.16666667;
    fVar298 = fVar298 * 0.16666667;
    fVar300 = fVar300 * 0.16666667;
    fVar302 = fVar302 * 0.16666667;
    fVar358 = auVar351._28_4_ + 12.0;
    fVar339 = fVar338 + 12.166667;
    local_8c0 = (float)local_1e0._0_4_ * fVar233 +
                fVar304 * (float)local_260._0_4_ +
                fVar284 * (float)local_3c0._0_4_ + fVar232 * (float)local_340._0_4_;
    fStack_8bc = (float)local_1e0._4_4_ * fVar248 +
                 fVar313 * (float)local_260._4_4_ +
                 fVar293 * (float)local_3c0._4_4_ + fVar247 * (float)local_340._4_4_;
    fStack_8b8 = fStack_1d8 * fVar270 +
                 fVar314 * fStack_258 + fVar294 * fStack_3b8 + fVar269 * fStack_338;
    fStack_8b4 = fStack_1d4 * fVar273 +
                 fVar315 * fStack_254 + fVar296 * fStack_3b4 + fVar272 * fStack_334;
    fStack_8b0 = fStack_1d0 * fVar276 +
                 fVar316 * fStack_250 + fVar298 * fStack_3b0 + fVar275 * fStack_330;
    fStack_8ac = fStack_1cc * fVar279 +
                 fVar317 * fStack_24c + fVar300 * fStack_3ac + fVar278 * fStack_32c;
    fStack_8a8 = fStack_1c8 * fVar282 +
                 fVar318 * fStack_248 + fVar302 * fStack_3a8 + fVar281 * fStack_328;
    fStack_8a4 = fVar319 + fVar339;
    fVar130 = (float)local_200._0_4_ * fVar233 +
              (float)local_280._0_4_ * fVar304 +
              fVar284 * (float)local_3e0._0_4_ + fVar232 * (float)local_360._0_4_;
    fVar154 = (float)local_200._4_4_ * fVar248 +
              (float)local_280._4_4_ * fVar313 +
              fVar293 * (float)local_3e0._4_4_ + fVar247 * (float)local_360._4_4_;
    fVar157 = fStack_1f8 * fVar270 +
              fStack_278 * fVar314 + fVar294 * fStack_3d8 + fVar269 * fStack_358;
    fVar161 = fStack_1f4 * fVar273 +
              fStack_274 * fVar315 + fVar296 * fStack_3d4 + fVar272 * fStack_354;
    fVar162 = fStack_1f0 * fVar276 +
              fStack_270 * fVar316 + fVar298 * fStack_3d0 + fVar275 * fStack_350;
    fVar163 = fStack_1ec * fVar279 +
              fStack_26c * fVar317 + fVar300 * fStack_3cc + fVar278 * fStack_34c;
    fVar164 = fStack_1e8 * fVar282 +
              fStack_268 * fVar318 + fVar302 * fStack_3c8 + fVar281 * fStack_348;
    fVar165 = fVar319 + fVar358 + 12.166667;
    local_8a0 = (float)local_220._0_4_ * fVar233 +
                (float)local_2a0._0_4_ * fVar304 +
                fVar284 * (float)local_400._0_4_ + fVar232 * (float)local_380._0_4_;
    fStack_89c = (float)local_220._4_4_ * fVar248 +
                 (float)local_2a0._4_4_ * fVar313 +
                 fVar293 * (float)local_400._4_4_ + fVar247 * (float)local_380._4_4_;
    fStack_898 = fStack_218 * fVar270 +
                 fStack_298 * fVar314 + fVar294 * fStack_3f8 + fVar269 * fStack_378;
    aStack_894.w = fStack_214 * fVar273 +
                   fStack_294 * fVar315 + fVar296 * fStack_3f4 + fVar272 * fStack_374;
    fStack_890 = fStack_210 * fVar276 +
                 fStack_290 * fVar316 + fVar298 * fStack_3f0 + fVar275 * fStack_370;
    fStack_88c = fStack_20c * fVar279 +
                 fStack_28c * fVar317 + fVar300 * fStack_3ec + fVar278 * fStack_36c;
    fStack_888 = fStack_208 * fVar282 +
                 fStack_288 * fVar318 + fVar302 * fStack_3e8 + fVar281 * fStack_368;
    fStack_884 = fVar319 + fVar358 + auVar363._28_4_ + 12.0;
    local_aa0._0_4_ =
         (float)local_240._0_4_ * fVar233 +
         fVar304 * (float)local_320._0_4_ +
         fVar232 * (float)local_3a0._0_4_ + fVar284 * (float)local_420._0_4_;
    local_aa0._4_4_ =
         (float)local_240._4_4_ * fVar248 +
         fVar313 * (float)local_320._4_4_ +
         fVar247 * (float)local_3a0._4_4_ + fVar293 * (float)local_420._4_4_;
    fStack_a98 = fStack_238 * fVar270 +
                 fVar314 * fStack_318 + fVar269 * fStack_398 + fVar294 * fStack_418;
    fStack_a94 = fStack_234 * fVar273 +
                 fVar315 * fStack_314 + fVar272 * fStack_394 + fVar296 * fStack_414;
    fStack_a90 = fStack_230 * fVar276 +
                 fVar316 * fStack_310 + fVar275 * fStack_390 + fVar298 * fStack_410;
    fStack_a8c = fStack_22c * fVar279 +
                 fVar317 * fStack_30c + fVar278 * fStack_38c + fVar300 * fStack_40c;
    fStack_a88 = fStack_228 * fVar282 +
                 fVar318 * fStack_308 + fVar281 * fStack_388 + fVar302 * fStack_408;
    fStack_a84 = auVar267._28_4_ + fVar319 + fVar338 + auVar292._28_4_;
    auVar30._4_4_ = auVar208._4_4_ * -auVar208._4_4_;
    auVar30._0_4_ = auVar208._0_4_ * -auVar208._0_4_;
    auVar30._8_4_ = auVar208._8_4_ * -auVar208._8_4_;
    auVar30._12_4_ = auVar208._12_4_ * -auVar208._12_4_;
    auVar30._16_4_ = auVar208._16_4_ * -auVar208._16_4_;
    auVar30._20_4_ = auVar208._20_4_ * -auVar208._20_4_;
    auVar30._24_4_ = auVar208._24_4_ * -auVar208._24_4_;
    auVar30._28_4_ = auVar208._28_4_;
    auVar31._4_4_ = fVar230 * 4.0;
    auVar31._0_4_ = fVar215 * 4.0;
    auVar31._8_4_ = fVar231 * 4.0;
    auVar31._12_4_ = fVar246 * 4.0;
    auVar31._16_4_ = fVar249 * 4.0;
    auVar31._20_4_ = fVar250 * 4.0;
    auVar31._24_4_ = fVar252 * 4.0;
    auVar31._28_4_ = fVar97;
    auVar112 = vsubps_avx(auVar30,auVar31);
    fVar281 = fVar131 * -fVar131 * 0.5;
    fVar282 = fVar155 * -fVar155 * 0.5;
    fVar284 = fVar158 * -fVar158 * 0.5;
    fVar293 = fVar193 * -fVar193 * 0.5;
    fVar294 = fVar212 * -fVar212 * 0.5;
    fVar296 = fVar213 * -fVar213 * 0.5;
    fVar298 = fVar214 * -fVar214 * 0.5;
    fVar247 = auVar112._0_4_ * 0.5;
    fVar248 = auVar112._4_4_ * 0.5;
    fVar272 = auVar112._8_4_ * 0.5;
    fVar275 = auVar112._12_4_ * 0.5;
    fVar276 = auVar112._16_4_ * 0.5;
    fVar278 = auVar112._20_4_ * 0.5;
    fVar279 = auVar112._24_4_ * 0.5;
    fVar232 = (fVar131 * fVar131 + fVar215 * 4.0) * 0.5;
    fVar233 = (fVar155 * fVar155 + fVar230 * 4.0) * 0.5;
    fVar269 = (fVar158 * fVar158 + fVar231 * 4.0) * 0.5;
    fVar270 = (fVar193 * fVar193 + fVar246 * 4.0) * 0.5;
    fVar249 = (fVar212 * fVar212 + fVar249 * 4.0) * 0.5;
    fVar250 = (fVar213 * fVar213 + fVar250 * 4.0) * 0.5;
    fVar252 = (fVar214 * fVar214 + fVar252 * 4.0) * 0.5;
    fVar131 = auVar208._0_4_ * auVar208._0_4_ * 0.5;
    fVar155 = auVar208._4_4_ * auVar208._4_4_ * 0.5;
    fVar158 = auVar208._8_4_ * auVar208._8_4_ * 0.5;
    fVar193 = auVar208._12_4_ * auVar208._12_4_ * 0.5;
    fVar215 = auVar208._16_4_ * auVar208._16_4_ * 0.5;
    fVar230 = auVar208._20_4_ * auVar208._20_4_ * 0.5;
    fVar231 = auVar208._24_4_ * auVar208._24_4_ * 0.5;
    fVar273 = auVar112._28_4_ + fVar192 + fVar97 + fVar339 + fVar97;
    auVar111 = vpermilps_avx(ZEXT416((uint)(auVar174._0_4_ * 0.04761905)),0);
    fVar212 = auVar111._0_4_;
    fVar359 = fVar212 * ((float)local_1e0._0_4_ * fVar281 +
                        (float)local_260._0_4_ * fVar247 +
                        fVar232 * (float)local_340._0_4_ + fVar131 * (float)local_3c0._0_4_);
    fVar213 = auVar111._4_4_;
    fVar364 = fVar213 * ((float)local_1e0._4_4_ * fVar282 +
                        (float)local_260._4_4_ * fVar248 +
                        fVar233 * (float)local_340._4_4_ + fVar155 * (float)local_3c0._4_4_);
    local_9e0._4_4_ = fVar364;
    local_9e0._0_4_ = fVar359;
    fVar214 = auVar111._8_4_;
    fVar365 = fVar214 * (fStack_1d8 * fVar284 +
                        fStack_258 * fVar272 + fVar269 * fStack_338 + fVar158 * fStack_3b8);
    local_9e0._8_4_ = fVar365;
    fVar246 = auVar111._12_4_;
    fVar366 = fVar246 * (fStack_1d4 * fVar293 +
                        fStack_254 * fVar275 + fVar270 * fStack_334 + fVar193 * fStack_3b4);
    local_9e0._12_4_ = fVar366;
    fVar367 = fVar212 * (fStack_1d0 * fVar294 +
                        fStack_250 * fVar276 + fVar249 * fStack_330 + fVar215 * fStack_3b0);
    local_9e0._16_4_ = fVar367;
    fVar368 = fVar213 * (fStack_1cc * fVar296 +
                        fStack_24c * fVar278 + fVar250 * fStack_32c + fVar230 * fStack_3ac);
    local_9e0._20_4_ = fVar368;
    fVar369 = fVar214 * (fStack_1c8 * fVar298 +
                        fStack_248 * fVar279 + fVar252 * fStack_328 + fVar231 * fStack_3a8);
    local_9e0._24_4_ = fVar369;
    local_9e0._28_4_ = uStack_1c4;
    fVar347 = fVar212 * ((float)local_200._0_4_ * fVar281 +
                        (float)local_280._0_4_ * fVar247 +
                        fVar232 * (float)local_360._0_4_ + fVar131 * (float)local_3e0._0_4_);
    fVar352 = fVar213 * ((float)local_200._4_4_ * fVar282 +
                        (float)local_280._4_4_ * fVar248 +
                        fVar233 * (float)local_360._4_4_ + fVar155 * (float)local_3e0._4_4_);
    local_a00._4_4_ = fVar352;
    local_a00._0_4_ = fVar347;
    fVar353 = fVar214 * (fStack_1f8 * fVar284 +
                        fStack_278 * fVar272 + fVar269 * fStack_358 + fVar158 * fStack_3d8);
    local_a00._8_4_ = fVar353;
    fVar354 = fVar246 * (fStack_1f4 * fVar293 +
                        fStack_274 * fVar275 + fVar270 * fStack_354 + fVar193 * fStack_3d4);
    local_a00._12_4_ = fVar354;
    fVar355 = fVar212 * (fStack_1f0 * fVar294 +
                        fStack_270 * fVar276 + fVar249 * fStack_350 + fVar215 * fStack_3d0);
    local_a00._16_4_ = fVar355;
    fVar356 = fVar213 * (fStack_1ec * fVar296 +
                        fStack_26c * fVar278 + fVar250 * fStack_34c + fVar230 * fStack_3cc);
    local_a00._20_4_ = fVar356;
    fVar357 = fVar214 * (fStack_1e8 * fVar298 +
                        fStack_268 * fVar279 + fVar252 * fStack_348 + fVar231 * fStack_3c8);
    local_a00._24_4_ = fVar357;
    local_a00._28_4_ = uStack_224;
    fVar320 = fVar212 * ((float)local_220._0_4_ * fVar281 +
                        fVar131 * (float)local_400._0_4_ + fVar232 * (float)local_380._0_4_ +
                        (float)local_2a0._0_4_ * fVar247);
    fVar326 = fVar213 * ((float)local_220._4_4_ * fVar282 +
                        fVar155 * (float)local_400._4_4_ + fVar233 * (float)local_380._4_4_ +
                        (float)local_2a0._4_4_ * fVar248);
    local_a20._4_4_ = fVar326;
    local_a20._0_4_ = fVar320;
    fVar328 = fVar214 * (fStack_218 * fVar284 +
                        fVar158 * fStack_3f8 + fVar269 * fStack_378 + fStack_298 * fVar272);
    local_a20._8_4_ = fVar328;
    fVar330 = fVar246 * (fStack_214 * fVar293 +
                        fVar193 * fStack_3f4 + fVar270 * fStack_374 + fStack_294 * fVar275);
    local_a20._12_4_ = fVar330;
    fVar332 = fVar212 * (fStack_210 * fVar294 +
                        fVar215 * fStack_3f0 + fVar249 * fStack_370 + fStack_290 * fVar276);
    local_a20._16_4_ = fVar332;
    fVar334 = fVar213 * (fStack_20c * fVar296 +
                        fVar230 * fStack_3ec + fVar250 * fStack_36c + fStack_28c * fVar278);
    local_a20._20_4_ = fVar334;
    fVar336 = fVar214 * (fStack_208 * fVar298 +
                        fVar231 * fStack_3e8 + fVar252 * fStack_368 + fStack_288 * fVar279);
    local_a20._24_4_ = fVar336;
    local_a20._28_4_ = fVar339;
    fVar247 = fVar212 * ((float)local_240._0_4_ * fVar281 +
                        fVar247 * (float)local_320._0_4_ +
                        fVar131 * (float)local_420._0_4_ + fVar232 * (float)local_3a0._0_4_);
    fVar248 = fVar213 * ((float)local_240._4_4_ * fVar282 +
                        fVar248 * (float)local_320._4_4_ +
                        fVar155 * (float)local_420._4_4_ + fVar233 * (float)local_3a0._4_4_);
    auVar32._4_4_ = fVar248;
    auVar32._0_4_ = fVar247;
    fVar272 = fVar214 * (fStack_238 * fVar284 +
                        fVar272 * fStack_318 + fVar158 * fStack_418 + fVar269 * fStack_398);
    auVar32._8_4_ = fVar272;
    fVar246 = fVar246 * (fStack_234 * fVar293 +
                        fVar275 * fStack_314 + fVar193 * fStack_414 + fVar270 * fStack_394);
    auVar32._12_4_ = fVar246;
    fVar212 = fVar212 * (fStack_230 * fVar294 +
                        fVar276 * fStack_310 + fVar215 * fStack_410 + fVar249 * fStack_390);
    auVar32._16_4_ = fVar212;
    fVar213 = fVar213 * (fStack_22c * fVar296 +
                        fVar278 * fStack_30c + fVar230 * fStack_40c + fVar250 * fStack_38c);
    auVar32._20_4_ = fVar213;
    fVar214 = fVar214 * (fStack_228 * fVar298 +
                        fVar279 * fStack_308 + fVar231 * fStack_408 + fVar252 * fStack_388);
    auVar32._24_4_ = fVar214;
    auVar32._28_4_ = fVar273;
    auVar78._4_4_ = fVar154;
    auVar78._0_4_ = fVar130;
    auVar78._8_4_ = fVar157;
    auVar78._12_4_ = fVar161;
    auVar78._16_4_ = fVar162;
    auVar78._20_4_ = fVar163;
    auVar78._24_4_ = fVar164;
    auVar78._28_4_ = fVar165;
    auVar112 = vperm2f128_avx(auVar78,auVar78,1);
    auVar112 = vshufps_avx(auVar112,auVar78,0x30);
    local_880 = vshufps_avx(auVar78,auVar112,0x29);
    auVar83._4_4_ = fStack_89c;
    auVar83._0_4_ = local_8a0;
    auVar83._8_4_ = fStack_898;
    auVar83._12_4_ = aStack_894;
    auVar83._16_4_ = fStack_890;
    auVar83._20_4_ = fStack_88c;
    auVar83._24_4_ = fStack_888;
    auVar83._28_4_ = fStack_884;
    auVar112 = vperm2f128_avx(auVar83,auVar83,1);
    auVar112 = vshufps_avx(auVar112,auVar83,0x30);
    local_9c0 = vshufps_avx(auVar83,auVar112,0x29);
    auVar113 = vsubps_avx(_local_aa0,auVar32);
    auVar112 = vperm2f128_avx(auVar113,auVar113,1);
    auVar112 = vshufps_avx(auVar112,auVar113,0x30);
    _local_820 = vshufps_avx(auVar113,auVar112,0x29);
    _local_5c0 = vsubps_avx(local_880,auVar78);
    local_6e0 = vsubps_avx(local_9c0,auVar83);
    fVar131 = local_5c0._0_4_;
    fVar230 = local_5c0._4_4_;
    auVar312._4_4_ = fVar326 * fVar230;
    auVar312._0_4_ = fVar320 * fVar131;
    fVar270 = local_5c0._8_4_;
    auVar312._8_4_ = fVar328 * fVar270;
    fVar278 = local_5c0._12_4_;
    auVar312._12_4_ = fVar330 * fVar278;
    fVar298 = local_5c0._16_4_;
    auVar312._16_4_ = fVar332 * fVar298;
    fVar317 = local_5c0._20_4_;
    auVar312._20_4_ = fVar334 * fVar317;
    fVar20 = local_5c0._24_4_;
    auVar312._24_4_ = fVar336 * fVar20;
    auVar312._28_4_ = auVar113._28_4_;
    fVar155 = local_6e0._0_4_;
    fVar231 = local_6e0._4_4_;
    auVar180._4_4_ = fVar352 * fVar231;
    auVar180._0_4_ = fVar347 * fVar155;
    fVar249 = local_6e0._8_4_;
    auVar180._8_4_ = fVar353 * fVar249;
    fVar279 = local_6e0._12_4_;
    auVar180._12_4_ = fVar354 * fVar279;
    fVar300 = local_6e0._16_4_;
    auVar180._16_4_ = fVar355 * fVar300;
    fVar318 = local_6e0._20_4_;
    auVar180._20_4_ = fVar356 * fVar318;
    fVar21 = local_6e0._24_4_;
    auVar180._24_4_ = fVar357 * fVar21;
    auVar180._28_4_ = auVar112._28_4_;
    auVar30 = vsubps_avx(auVar180,auVar312);
    auVar80._4_4_ = fStack_8bc;
    auVar80._0_4_ = local_8c0;
    auVar80._8_4_ = fStack_8b8;
    auVar80._12_4_ = fStack_8b4;
    auVar80._16_4_ = fStack_8b0;
    auVar80._20_4_ = fStack_8ac;
    auVar80._24_4_ = fStack_8a8;
    auVar80._28_4_ = fStack_8a4;
    auVar112 = vperm2f128_avx(auVar80,auVar80,1);
    auVar112 = vshufps_avx(auVar112,auVar80,0x30);
    local_740 = vshufps_avx(auVar80,auVar112,0x29);
    local_5e0 = vsubps_avx(local_740,auVar80);
    auVar33._4_4_ = fVar364 * fVar231;
    auVar33._0_4_ = fVar359 * fVar155;
    auVar33._8_4_ = fVar365 * fVar249;
    auVar33._12_4_ = fVar366 * fVar279;
    auVar33._16_4_ = fVar367 * fVar300;
    auVar33._20_4_ = fVar368 * fVar318;
    auVar33._24_4_ = fVar369 * fVar21;
    auVar33._28_4_ = local_740._28_4_;
    fVar158 = local_5e0._0_4_;
    fVar232 = local_5e0._4_4_;
    auVar34._4_4_ = fVar326 * fVar232;
    auVar34._0_4_ = fVar320 * fVar158;
    fVar250 = local_5e0._8_4_;
    auVar34._8_4_ = fVar328 * fVar250;
    fVar281 = local_5e0._12_4_;
    auVar34._12_4_ = fVar330 * fVar281;
    fVar302 = local_5e0._16_4_;
    auVar34._16_4_ = fVar332 * fVar302;
    fVar319 = local_5e0._20_4_;
    auVar34._20_4_ = fVar334 * fVar319;
    fVar22 = local_5e0._24_4_;
    auVar34._24_4_ = fVar336 * fVar22;
    auVar34._28_4_ = local_880._28_4_;
    auVar31 = vsubps_avx(auVar34,auVar33);
    auVar291._4_4_ = fVar352 * fVar232;
    auVar291._0_4_ = fVar347 * fVar158;
    auVar291._8_4_ = fVar353 * fVar250;
    auVar291._12_4_ = fVar354 * fVar281;
    auVar291._16_4_ = fVar355 * fVar302;
    auVar291._20_4_ = fVar356 * fVar319;
    auVar291._24_4_ = fVar357 * fVar22;
    auVar291._28_4_ = local_880._28_4_;
    auVar35._4_4_ = fVar364 * fVar230;
    auVar35._0_4_ = fVar359 * fVar131;
    auVar35._8_4_ = fVar365 * fVar270;
    auVar35._12_4_ = fVar366 * fVar278;
    auVar35._16_4_ = fVar367 * fVar298;
    auVar35._20_4_ = fVar368 * fVar317;
    auVar35._24_4_ = fVar369 * fVar20;
    auVar35._28_4_ = uStack_204;
    auVar32 = vsubps_avx(auVar35,auVar291);
    fVar97 = auVar32._28_4_;
    auVar145._0_4_ = fVar158 * fVar158 + fVar131 * fVar131 + fVar155 * fVar155;
    auVar145._4_4_ = fVar232 * fVar232 + fVar230 * fVar230 + fVar231 * fVar231;
    auVar145._8_4_ = fVar250 * fVar250 + fVar270 * fVar270 + fVar249 * fVar249;
    auVar145._12_4_ = fVar281 * fVar281 + fVar278 * fVar278 + fVar279 * fVar279;
    auVar145._16_4_ = fVar302 * fVar302 + fVar298 * fVar298 + fVar300 * fVar300;
    auVar145._20_4_ = fVar319 * fVar319 + fVar317 * fVar317 + fVar318 * fVar318;
    auVar145._24_4_ = fVar22 * fVar22 + fVar20 * fVar20 + fVar21 * fVar21;
    auVar145._28_4_ = fVar97 + fVar97 + auVar30._28_4_;
    auVar112 = vrcpps_avx(auVar145);
    fVar275 = auVar112._0_4_;
    fVar276 = auVar112._4_4_;
    auVar36._4_4_ = fVar276 * auVar145._4_4_;
    auVar36._0_4_ = fVar275 * auVar145._0_4_;
    fVar284 = auVar112._8_4_;
    auVar36._8_4_ = fVar284 * auVar145._8_4_;
    fVar293 = auVar112._12_4_;
    auVar36._12_4_ = fVar293 * auVar145._12_4_;
    fVar294 = auVar112._16_4_;
    auVar36._16_4_ = fVar294 * auVar145._16_4_;
    fVar296 = auVar112._20_4_;
    auVar36._20_4_ = fVar296 * auVar145._20_4_;
    fVar313 = auVar112._24_4_;
    auVar36._24_4_ = fVar313 * auVar145._24_4_;
    auVar36._28_4_ = uStack_204;
    auVar114._8_4_ = 0x3f800000;
    auVar114._0_8_ = 0x3f8000003f800000;
    auVar114._12_4_ = 0x3f800000;
    auVar114._16_4_ = 0x3f800000;
    auVar114._20_4_ = 0x3f800000;
    auVar114._24_4_ = 0x3f800000;
    auVar114._28_4_ = 0x3f800000;
    auVar312 = vsubps_avx(auVar114,auVar36);
    fVar275 = auVar312._0_4_ * fVar275 + fVar275;
    fVar276 = auVar312._4_4_ * fVar276 + fVar276;
    fVar284 = auVar312._8_4_ * fVar284 + fVar284;
    fVar293 = auVar312._12_4_ * fVar293 + fVar293;
    fVar294 = auVar312._16_4_ * fVar294 + fVar294;
    fVar296 = auVar312._20_4_ * fVar296 + fVar296;
    fVar313 = auVar312._24_4_ * fVar313 + fVar313;
    auVar113 = vperm2f128_avx(local_a00,local_a00,1);
    auVar113 = vshufps_avx(auVar113,local_a00,0x30);
    local_900 = vshufps_avx(local_a00,auVar113,0x29);
    auVar113 = vperm2f128_avx(local_a20,local_a20,1);
    auVar113 = vshufps_avx(auVar113,local_a20,0x30);
    local_780 = vshufps_avx(local_a20,auVar113,0x29);
    fVar193 = local_780._0_4_;
    fVar233 = local_780._4_4_;
    auVar37._4_4_ = fVar230 * fVar233;
    auVar37._0_4_ = fVar131 * fVar193;
    fVar252 = local_780._8_4_;
    auVar37._8_4_ = fVar270 * fVar252;
    fVar282 = local_780._12_4_;
    auVar37._12_4_ = fVar278 * fVar282;
    fVar304 = local_780._16_4_;
    auVar37._16_4_ = fVar298 * fVar304;
    fVar338 = local_780._20_4_;
    auVar37._20_4_ = fVar317 * fVar338;
    fVar23 = local_780._24_4_;
    auVar37._24_4_ = fVar20 * fVar23;
    auVar37._28_4_ = auVar113._28_4_;
    fVar370 = local_900._0_4_;
    fVar377 = local_900._4_4_;
    auVar38._4_4_ = fVar377 * fVar231;
    auVar38._0_4_ = fVar370 * fVar155;
    fVar378 = local_900._8_4_;
    auVar38._8_4_ = fVar378 * fVar249;
    fVar379 = local_900._12_4_;
    auVar38._12_4_ = fVar379 * fVar279;
    fVar380 = local_900._16_4_;
    auVar38._16_4_ = fVar380 * fVar300;
    fVar381 = local_900._20_4_;
    auVar38._20_4_ = fVar381 * fVar318;
    fVar382 = local_900._24_4_;
    auVar38._24_4_ = fVar382 * fVar21;
    auVar38._28_4_ = uStack_224;
    auVar180 = vsubps_avx(auVar38,auVar37);
    auVar113 = vperm2f128_avx(local_9e0,local_9e0,1);
    auVar113 = vshufps_avx(auVar113,local_9e0,0x30);
    local_760 = vshufps_avx(local_9e0,auVar113,0x29);
    fVar321 = local_760._0_4_;
    fVar327 = local_760._4_4_;
    auVar39._4_4_ = fVar327 * fVar231;
    auVar39._0_4_ = fVar321 * fVar155;
    fVar329 = local_760._8_4_;
    auVar39._8_4_ = fVar329 * fVar249;
    fVar331 = local_760._12_4_;
    auVar39._12_4_ = fVar331 * fVar279;
    fVar333 = local_760._16_4_;
    auVar39._16_4_ = fVar333 * fVar300;
    fVar335 = local_760._20_4_;
    auVar39._20_4_ = fVar335 * fVar318;
    fVar337 = local_760._24_4_;
    auVar39._24_4_ = fVar337 * fVar21;
    auVar39._28_4_ = auVar113._28_4_;
    auVar34 = local_780;
    auVar40._4_4_ = fVar233 * fVar232;
    auVar40._0_4_ = fVar193 * fVar158;
    auVar40._8_4_ = fVar252 * fVar250;
    auVar40._12_4_ = fVar282 * fVar281;
    auVar40._16_4_ = fVar304 * fVar302;
    auVar40._20_4_ = fVar338 * fVar319;
    auVar40._24_4_ = fVar23 * fVar22;
    auVar40._28_4_ = uStack_1c4;
    auVar33 = vsubps_avx(auVar40,auVar39);
    auVar41._4_4_ = fVar377 * fVar232;
    auVar41._0_4_ = fVar370 * fVar158;
    auVar41._8_4_ = fVar378 * fVar250;
    auVar41._12_4_ = fVar379 * fVar281;
    auVar41._16_4_ = fVar380 * fVar302;
    auVar41._20_4_ = fVar381 * fVar319;
    auVar41._24_4_ = fVar382 * fVar22;
    auVar41._28_4_ = uStack_1c4;
    auVar42._4_4_ = fVar327 * fVar230;
    auVar42._0_4_ = fVar321 * fVar131;
    auVar42._8_4_ = fVar329 * fVar270;
    auVar42._12_4_ = fVar331 * fVar278;
    auVar42._16_4_ = fVar333 * fVar298;
    auVar42._20_4_ = fVar335 * fVar317;
    fVar215 = local_900._28_4_;
    auVar42._24_4_ = fVar337 * fVar20;
    auVar42._28_4_ = fVar215;
    auVar113 = vsubps_avx(auVar42,auVar41);
    fVar269 = auVar113._28_4_;
    auVar43._4_4_ =
         (auVar30._4_4_ * auVar30._4_4_ +
         auVar31._4_4_ * auVar31._4_4_ + auVar32._4_4_ * auVar32._4_4_) * fVar276;
    auVar43._0_4_ =
         (auVar30._0_4_ * auVar30._0_4_ +
         auVar31._0_4_ * auVar31._0_4_ + auVar32._0_4_ * auVar32._0_4_) * fVar275;
    auVar43._8_4_ =
         (auVar30._8_4_ * auVar30._8_4_ +
         auVar31._8_4_ * auVar31._8_4_ + auVar32._8_4_ * auVar32._8_4_) * fVar284;
    auVar43._12_4_ =
         (auVar30._12_4_ * auVar30._12_4_ +
         auVar31._12_4_ * auVar31._12_4_ + auVar32._12_4_ * auVar32._12_4_) * fVar293;
    auVar43._16_4_ =
         (auVar30._16_4_ * auVar30._16_4_ +
         auVar31._16_4_ * auVar31._16_4_ + auVar32._16_4_ * auVar32._16_4_) * fVar294;
    auVar43._20_4_ =
         (auVar30._20_4_ * auVar30._20_4_ +
         auVar31._20_4_ * auVar31._20_4_ + auVar32._20_4_ * auVar32._20_4_) * fVar296;
    auVar43._24_4_ =
         (auVar30._24_4_ * auVar30._24_4_ +
         auVar31._24_4_ * auVar31._24_4_ + auVar32._24_4_ * auVar32._24_4_) * fVar313;
    auVar43._28_4_ = auVar30._28_4_ + auVar31._28_4_ + fVar97;
    auVar44._4_4_ =
         (auVar180._4_4_ * auVar180._4_4_ +
         auVar33._4_4_ * auVar33._4_4_ + auVar113._4_4_ * auVar113._4_4_) * fVar276;
    auVar44._0_4_ =
         (auVar180._0_4_ * auVar180._0_4_ +
         auVar33._0_4_ * auVar33._0_4_ + auVar113._0_4_ * auVar113._0_4_) * fVar275;
    auVar44._8_4_ =
         (auVar180._8_4_ * auVar180._8_4_ +
         auVar33._8_4_ * auVar33._8_4_ + auVar113._8_4_ * auVar113._8_4_) * fVar284;
    auVar44._12_4_ =
         (auVar180._12_4_ * auVar180._12_4_ +
         auVar33._12_4_ * auVar33._12_4_ + auVar113._12_4_ * auVar113._12_4_) * fVar293;
    auVar44._16_4_ =
         (auVar180._16_4_ * auVar180._16_4_ +
         auVar33._16_4_ * auVar33._16_4_ + auVar113._16_4_ * auVar113._16_4_) * fVar294;
    auVar44._20_4_ =
         (auVar180._20_4_ * auVar180._20_4_ +
         auVar33._20_4_ * auVar33._20_4_ + auVar113._20_4_ * auVar113._20_4_) * fVar296;
    auVar44._24_4_ =
         (auVar180._24_4_ * auVar180._24_4_ +
         auVar33._24_4_ * auVar33._24_4_ + auVar113._24_4_ * auVar113._24_4_) * fVar313;
    auVar44._28_4_ = auVar312._28_4_ + auVar112._28_4_;
    auVar112 = vmaxps_avx(auVar43,auVar44);
    auVar113 = vperm2f128_avx(_local_aa0,_local_aa0,1);
    auVar113 = vshufps_avx(auVar113,_local_aa0,0x30);
    _local_840 = vshufps_avx(_local_aa0,auVar113,0x29);
    local_680._0_4_ = (float)local_aa0._0_4_ + fVar247;
    local_680._4_4_ = (float)local_aa0._4_4_ + fVar248;
    fStack_678 = fStack_a98 + fVar272;
    fStack_674 = fStack_a94 + fVar246;
    fStack_670 = fStack_a90 + fVar212;
    fStack_66c = fStack_a8c + fVar213;
    fStack_668 = fStack_a88 + fVar214;
    register0x0000121c = fStack_a84 + fVar273;
    auVar113 = vmaxps_avx(_local_aa0,_local_680);
    auVar30 = vmaxps_avx(_local_820,_local_840);
    auVar113 = vmaxps_avx(auVar113,auVar30);
    auVar30 = vrsqrtps_avx(auVar145);
    fVar97 = auVar30._0_4_;
    fVar212 = auVar30._4_4_;
    fVar213 = auVar30._8_4_;
    fVar214 = auVar30._12_4_;
    fVar246 = auVar30._16_4_;
    fVar247 = auVar30._20_4_;
    fVar248 = auVar30._24_4_;
    auVar45._4_4_ = fVar212 * fVar212 * fVar212 * auVar145._4_4_ * 0.5;
    auVar45._0_4_ = fVar97 * fVar97 * fVar97 * auVar145._0_4_ * 0.5;
    auVar45._8_4_ = fVar213 * fVar213 * fVar213 * auVar145._8_4_ * 0.5;
    auVar45._12_4_ = fVar214 * fVar214 * fVar214 * auVar145._12_4_ * 0.5;
    auVar45._16_4_ = fVar246 * fVar246 * fVar246 * auVar145._16_4_ * 0.5;
    auVar45._20_4_ = fVar247 * fVar247 * fVar247 * auVar145._20_4_ * 0.5;
    auVar45._24_4_ = fVar248 * fVar248 * fVar248 * auVar145._24_4_ * 0.5;
    auVar45._28_4_ = auVar145._28_4_;
    auVar46._4_4_ = fVar212 * 1.5;
    auVar46._0_4_ = fVar97 * 1.5;
    auVar46._8_4_ = fVar213 * 1.5;
    auVar46._12_4_ = fVar214 * 1.5;
    auVar46._16_4_ = fVar246 * 1.5;
    auVar46._20_4_ = fVar247 * 1.5;
    auVar46._24_4_ = fVar248 * 1.5;
    auVar46._28_4_ = auVar30._28_4_;
    local_460 = vsubps_avx(auVar46,auVar45);
    auVar79._4_4_ = fVar154;
    auVar79._0_4_ = fVar130;
    auVar79._8_4_ = fVar157;
    auVar79._12_4_ = fVar161;
    auVar79._16_4_ = fVar162;
    auVar79._20_4_ = fVar163;
    auVar79._24_4_ = fVar164;
    auVar79._28_4_ = fVar165;
    local_7a0 = vsubps_avx(ZEXT832(0) << 0x20,auVar79);
    local_7c0 = vsubps_avx(ZEXT832(0) << 0x20,auVar83);
    fVar212 = local_7c0._0_4_;
    fVar246 = local_7c0._4_4_;
    fVar272 = local_7c0._8_4_;
    fVar284 = local_7c0._12_4_;
    fVar313 = local_7c0._16_4_;
    fVar339 = local_7c0._20_4_;
    fVar24 = local_7c0._24_4_;
    fVar213 = local_7a0._0_4_;
    fVar247 = local_7a0._4_4_;
    fVar273 = local_7a0._8_4_;
    fVar293 = local_7a0._12_4_;
    fVar314 = local_7a0._16_4_;
    fVar358 = local_7a0._20_4_;
    fVar25 = local_7a0._24_4_;
    auVar31 = vsubps_avx(ZEXT832(0) << 0x20,auVar80);
    fVar214 = auVar31._0_4_;
    fVar248 = auVar31._4_4_;
    fVar275 = auVar31._8_4_;
    fVar294 = auVar31._12_4_;
    fVar315 = auVar31._16_4_;
    fVar19 = auVar31._20_4_;
    fVar26 = auVar31._24_4_;
    auVar341._0_4_ = local_580 * fVar214 + local_560 * fVar213 + local_7e0 * fVar212;
    auVar341._4_4_ = fStack_57c * fVar248 + fStack_55c * fVar247 + fStack_7dc * fVar246;
    auVar341._8_4_ = fStack_578 * fVar275 + fStack_558 * fVar273 + fStack_7d8 * fVar272;
    auVar341._12_4_ = fStack_574 * fVar294 + fStack_554 * fVar293 + fStack_7d4 * fVar284;
    auVar341._16_4_ = fStack_570 * fVar315 + fStack_550 * fVar314 + fStack_7d0 * fVar313;
    auVar341._20_4_ = fStack_56c * fVar19 + fStack_54c * fVar358 + fStack_7cc * fVar339;
    auVar341._24_4_ = fStack_568 * fVar26 + fStack_548 * fVar25 + fStack_7c8 * fVar24;
    auVar341._28_4_ = fVar269 + auVar180._28_4_ + auVar33._28_4_ + fVar269 + auVar30._28_4_;
    auVar361._0_4_ = fVar214 * fVar214 + fVar213 * fVar213 + fVar212 * fVar212;
    auVar361._4_4_ = fVar248 * fVar248 + fVar247 * fVar247 + fVar246 * fVar246;
    auVar361._8_4_ = fVar275 * fVar275 + fVar273 * fVar273 + fVar272 * fVar272;
    auVar361._12_4_ = fVar294 * fVar294 + fVar293 * fVar293 + fVar284 * fVar284;
    auVar361._16_4_ = fVar315 * fVar315 + fVar314 * fVar314 + fVar313 * fVar313;
    auVar361._20_4_ = fVar19 * fVar19 + fVar358 * fVar358 + fVar339 * fVar339;
    auVar361._24_4_ = fVar26 * fVar26 + fVar25 * fVar25 + fVar24 * fVar24;
    auVar361._28_4_ = fVar215 + fVar215 + fVar269;
    fVar215 = local_460._0_4_;
    fVar269 = local_460._4_4_;
    fVar276 = local_460._8_4_;
    fVar296 = local_460._12_4_;
    fVar316 = local_460._16_4_;
    fVar251 = local_460._20_4_;
    fVar253 = local_460._24_4_;
    auVar310._8_4_ = 0x3f800000;
    auVar310._0_8_ = 0x3f8000003f800000;
    auVar310._12_4_ = 0x3f800000;
    auVar310._16_4_ = 0x3f800000;
    auVar310._20_4_ = 0x3f800000;
    auVar310._24_4_ = 0x3f800000;
    auVar310._28_4_ = 0x3f800000;
    fVar97 = local_6e0._28_4_;
    auVar325 = ZEXT3264(local_460);
    fVar255 = local_460._28_4_;
    local_6a0._0_4_ =
         local_580 * fVar158 * fVar215 +
         local_560 * fVar131 * fVar215 + fVar155 * fVar215 * local_7e0;
    local_6a0._4_4_ =
         fStack_57c * fVar232 * fVar269 +
         fStack_55c * fVar230 * fVar269 + fVar231 * fVar269 * fStack_7dc;
    fStack_698 = fStack_578 * fVar250 * fVar276 +
                 fStack_558 * fVar270 * fVar276 + fVar249 * fVar276 * fStack_7d8;
    fStack_694 = fStack_574 * fVar281 * fVar296 +
                 fStack_554 * fVar278 * fVar296 + fVar279 * fVar296 * fStack_7d4;
    fStack_690 = fStack_570 * fVar302 * fVar316 +
                 fStack_550 * fVar298 * fVar316 + fVar300 * fVar316 * fStack_7d0;
    fStack_68c = fStack_56c * fVar319 * fVar251 +
                 fStack_54c * fVar317 * fVar251 + fVar318 * fVar251 * fStack_7cc;
    fStack_688 = fStack_568 * fVar22 * fVar253 +
                 fStack_548 * fVar20 * fVar253 + fVar21 * fVar253 * fStack_7c8;
    fVar254 = fVar255 + fVar97 + 0.0;
    local_6c0 = fVar214 * fVar158 * fVar215 +
                fVar131 * fVar215 * fVar213 + fVar155 * fVar215 * fVar212;
    fStack_6bc = fVar248 * fVar232 * fVar269 +
                 fVar230 * fVar269 * fVar247 + fVar231 * fVar269 * fVar246;
    fStack_6b8 = fVar275 * fVar250 * fVar276 +
                 fVar270 * fVar276 * fVar273 + fVar249 * fVar276 * fVar272;
    fStack_6b4 = fVar294 * fVar281 * fVar296 +
                 fVar278 * fVar296 * fVar293 + fVar279 * fVar296 * fVar284;
    fStack_6b0 = fVar315 * fVar302 * fVar316 +
                 fVar298 * fVar316 * fVar314 + fVar300 * fVar316 * fVar313;
    fStack_6ac = fVar19 * fVar319 * fVar251 +
                 fVar317 * fVar251 * fVar358 + fVar318 * fVar251 * fVar339;
    fStack_6a8 = fVar26 * fVar22 * fVar253 + fVar20 * fVar253 * fVar25 + fVar21 * fVar253 * fVar24;
    fStack_6a4 = fVar97 + fVar254;
    auVar47._4_4_ = (float)local_6a0._4_4_ * fStack_6bc;
    auVar47._0_4_ = (float)local_6a0._0_4_ * local_6c0;
    auVar47._8_4_ = fStack_698 * fStack_6b8;
    auVar47._12_4_ = fStack_694 * fStack_6b4;
    auVar47._16_4_ = fStack_690 * fStack_6b0;
    auVar47._20_4_ = fStack_68c * fStack_6ac;
    auVar47._24_4_ = fStack_688 * fStack_6a8;
    auVar47._28_4_ = fVar254;
    auVar30 = vsubps_avx(auVar341,auVar47);
    auVar48._4_4_ = fStack_6bc * fStack_6bc;
    auVar48._0_4_ = local_6c0 * local_6c0;
    auVar48._8_4_ = fStack_6b8 * fStack_6b8;
    auVar48._12_4_ = fStack_6b4 * fStack_6b4;
    auVar48._16_4_ = fStack_6b0 * fStack_6b0;
    auVar48._20_4_ = fStack_6ac * fStack_6ac;
    auVar48._24_4_ = fStack_6a8 * fStack_6a8;
    auVar48._28_4_ = fVar97;
    local_620 = vsubps_avx(auVar361,auVar48);
    local_5a0 = vsqrtps_avx(auVar112);
    fVar254 = (auVar113._0_4_ + local_5a0._0_4_) * 1.0000002;
    fVar123 = (auVar113._4_4_ + local_5a0._4_4_) * 1.0000002;
    fVar124 = (auVar113._8_4_ + local_5a0._8_4_) * 1.0000002;
    fVar125 = (auVar113._12_4_ + local_5a0._12_4_) * 1.0000002;
    fVar126 = (auVar113._16_4_ + local_5a0._16_4_) * 1.0000002;
    fVar127 = (auVar113._20_4_ + local_5a0._20_4_) * 1.0000002;
    fVar128 = (auVar113._24_4_ + local_5a0._24_4_) * 1.0000002;
    auVar49._4_4_ = fVar123 * fVar123;
    auVar49._0_4_ = fVar254 * fVar254;
    auVar49._8_4_ = fVar124 * fVar124;
    auVar49._12_4_ = fVar125 * fVar125;
    auVar49._16_4_ = fVar126 * fVar126;
    auVar49._20_4_ = fVar127 * fVar127;
    auVar49._24_4_ = fVar128 * fVar128;
    auVar49._28_4_ = auVar113._28_4_ + local_5a0._28_4_;
    fVar124 = auVar30._0_4_ + auVar30._0_4_;
    fVar125 = auVar30._4_4_ + auVar30._4_4_;
    local_300._0_8_ = CONCAT44(fVar125,fVar124);
    local_300._8_4_ = auVar30._8_4_ + auVar30._8_4_;
    local_300._12_4_ = auVar30._12_4_ + auVar30._12_4_;
    local_300._16_4_ = auVar30._16_4_ + auVar30._16_4_;
    local_300._20_4_ = auVar30._20_4_ + auVar30._20_4_;
    local_300._24_4_ = auVar30._24_4_ + auVar30._24_4_;
    local_300._28_4_ = auVar30._28_4_ + auVar30._28_4_;
    auVar30 = vsubps_avx(local_620,auVar49);
    auVar363 = ZEXT3264(auVar30);
    local_600._4_4_ = (float)local_6a0._4_4_ * (float)local_6a0._4_4_;
    local_600._0_4_ = (float)local_6a0._0_4_ * (float)local_6a0._0_4_;
    fStack_5f8 = fStack_698 * fStack_698;
    fStack_5f4 = fStack_694 * fStack_694;
    fStack_5f0 = fStack_690 * fStack_690;
    fStack_5ec = fStack_68c * fStack_68c;
    fStack_5e8 = fStack_688 * fStack_688;
    fStack_5e4 = auVar113._28_4_;
    local_480 = vsubps_avx(local_2c0,_local_600);
    auVar50._4_4_ = fVar125 * fVar125;
    auVar50._0_4_ = fVar124 * fVar124;
    auVar50._8_4_ = local_300._8_4_ * local_300._8_4_;
    auVar50._12_4_ = local_300._12_4_ * local_300._12_4_;
    auVar50._16_4_ = local_300._16_4_ * local_300._16_4_;
    auVar50._20_4_ = local_300._20_4_ * local_300._20_4_;
    auVar50._24_4_ = local_300._24_4_ * local_300._24_4_;
    auVar50._28_4_ = fVar255;
    fVar126 = local_480._0_4_;
    fVar254 = fVar126 * 4.0;
    fVar127 = local_480._4_4_;
    fVar123 = fVar127 * 4.0;
    fVar128 = local_480._8_4_;
    fStack_918 = fVar128 * 4.0;
    fVar386 = local_480._12_4_;
    fStack_914 = fVar386 * 4.0;
    fVar387 = local_480._16_4_;
    fStack_910 = fVar387 * 4.0;
    fVar388 = local_480._20_4_;
    fStack_90c = fVar388 * 4.0;
    fVar389 = local_480._24_4_;
    fStack_908 = fVar389 * 4.0;
    local_920 = CONCAT44(fVar123,fVar254);
    uStack_904 = 0x40800000;
    auVar51._4_4_ = auVar30._4_4_ * fVar123;
    auVar51._0_4_ = auVar30._0_4_ * fVar254;
    auVar51._8_4_ = auVar30._8_4_ * fStack_918;
    auVar51._12_4_ = auVar30._12_4_ * fStack_914;
    auVar51._16_4_ = auVar30._16_4_ * fStack_910;
    auVar51._20_4_ = auVar30._20_4_ * fStack_90c;
    auVar51._24_4_ = auVar30._24_4_ * fStack_908;
    auVar51._28_4_ = 0x40800000;
    auVar113 = vsubps_avx(auVar50,auVar51);
    auVar112 = vcmpps_avx(auVar113,ZEXT832(0) << 0x20,5);
    fStack_684 = fVar255 + fVar97 + 0.0;
    fVar97 = local_480._28_4_;
    if ((((((((auVar112 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar112 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar112 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar112 >> 0x7f,0) == '\0') &&
          (auVar112 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar112 >> 0xbf,0) == '\0') &&
        (auVar112 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar112[0x1f])
    {
      auVar373._8_4_ = 0x7f800000;
      auVar373._0_8_ = 0x7f8000007f800000;
      auVar373._12_4_ = 0x7f800000;
      auVar373._16_4_ = 0x7f800000;
      auVar373._20_4_ = 0x7f800000;
      auVar373._24_4_ = 0x7f800000;
      auVar373._28_4_ = 0x7f800000;
      auVar349._8_4_ = 0xff800000;
      auVar349._0_8_ = 0xff800000ff800000;
      auVar349._12_4_ = 0xff800000;
      auVar349._16_4_ = 0xff800000;
      auVar349._20_4_ = 0xff800000;
      auVar349._24_4_ = 0xff800000;
      auVar349._28_4_ = 0xff800000;
      auVar262 = local_2c0;
    }
    else {
      auVar32 = vcmpps_avx(auVar113,ZEXT832(0) << 0x20,5);
      auVar312 = vsqrtps_avx(auVar113);
      auVar261._0_4_ = fVar126 + fVar126;
      auVar261._4_4_ = fVar127 + fVar127;
      auVar261._8_4_ = fVar128 + fVar128;
      auVar261._12_4_ = fVar386 + fVar386;
      auVar261._16_4_ = fVar387 + fVar387;
      auVar261._20_4_ = fVar388 + fVar388;
      auVar261._24_4_ = fVar389 + fVar389;
      auVar261._28_4_ = fVar97 + fVar97;
      auVar113 = vrcpps_avx(auVar261);
      fVar255 = auVar113._0_4_;
      fVar268 = auVar113._4_4_;
      auVar52._4_4_ = auVar261._4_4_ * fVar268;
      auVar52._0_4_ = auVar261._0_4_ * fVar255;
      fVar271 = auVar113._8_4_;
      auVar52._8_4_ = auVar261._8_4_ * fVar271;
      fVar274 = auVar113._12_4_;
      auVar52._12_4_ = auVar261._12_4_ * fVar274;
      fVar277 = auVar113._16_4_;
      auVar52._16_4_ = auVar261._16_4_ * fVar277;
      fVar280 = auVar113._20_4_;
      auVar52._20_4_ = auVar261._20_4_ * fVar280;
      fVar283 = auVar113._24_4_;
      auVar52._24_4_ = auVar261._24_4_ * fVar283;
      auVar52._28_4_ = auVar261._28_4_;
      auVar113 = vsubps_avx(auVar310,auVar52);
      fVar255 = fVar255 + fVar255 * auVar113._0_4_;
      fVar268 = fVar268 + fVar268 * auVar113._4_4_;
      fVar271 = fVar271 + fVar271 * auVar113._8_4_;
      fVar274 = fVar274 + fVar274 * auVar113._12_4_;
      fVar277 = fVar277 + fVar277 * auVar113._16_4_;
      fVar280 = fVar280 + fVar280 * auVar113._20_4_;
      fVar283 = fVar283 + fVar283 * auVar113._24_4_;
      auVar290._0_8_ = CONCAT44(fVar125,fVar124) ^ 0x8000000080000000;
      auVar290._8_4_ = -local_300._8_4_;
      auVar290._12_4_ = -local_300._12_4_;
      auVar290._16_4_ = -local_300._16_4_;
      auVar290._20_4_ = -local_300._20_4_;
      auVar290._24_4_ = -local_300._24_4_;
      auVar290._28_4_ = -local_300._28_4_;
      auVar113 = vsubps_avx(auVar290,auVar312);
      fVar124 = auVar113._0_4_ * fVar255;
      fVar125 = auVar113._4_4_ * fVar268;
      auVar53._4_4_ = fVar125;
      auVar53._0_4_ = fVar124;
      fVar295 = auVar113._8_4_ * fVar271;
      auVar53._8_4_ = fVar295;
      fVar297 = auVar113._12_4_ * fVar274;
      auVar53._12_4_ = fVar297;
      fVar299 = auVar113._16_4_ * fVar277;
      auVar53._16_4_ = fVar299;
      fVar301 = auVar113._20_4_ * fVar280;
      auVar53._20_4_ = fVar301;
      fVar303 = auVar113._24_4_ * fVar283;
      auVar53._24_4_ = fVar303;
      auVar53._28_4_ = auVar113._28_4_;
      auVar113 = vsubps_avx(auVar312,local_300);
      fVar255 = auVar113._0_4_ * fVar255;
      fVar268 = auVar113._4_4_ * fVar268;
      auVar54._4_4_ = fVar268;
      auVar54._0_4_ = fVar255;
      fVar271 = auVar113._8_4_ * fVar271;
      auVar54._8_4_ = fVar271;
      fVar274 = auVar113._12_4_ * fVar274;
      auVar54._12_4_ = fVar274;
      fVar277 = auVar113._16_4_ * fVar277;
      auVar54._16_4_ = fVar277;
      fVar280 = auVar113._20_4_ * fVar280;
      auVar54._20_4_ = fVar280;
      fVar283 = auVar113._24_4_ * fVar283;
      auVar54._24_4_ = fVar283;
      auVar54._28_4_ = auVar113._28_4_;
      local_640._4_4_ = fVar269 * (fStack_6bc + (float)local_6a0._4_4_ * fVar125);
      local_640._0_4_ = fVar215 * (local_6c0 + (float)local_6a0._0_4_ * fVar124);
      fStack_638 = fVar276 * (fStack_6b8 + fStack_698 * fVar295);
      fStack_634 = fVar296 * (fStack_6b4 + fStack_694 * fVar297);
      fStack_630 = fVar316 * (fStack_6b0 + fStack_690 * fVar299);
      fStack_62c = fVar251 * (fStack_6ac + fStack_68c * fVar301);
      fStack_628 = fVar253 * (fStack_6a8 + fStack_688 * fVar303);
      uStack_624 = 0x40800000;
      auVar342._8_4_ = 0x7fffffff;
      auVar342._0_8_ = 0x7fffffff7fffffff;
      auVar342._12_4_ = 0x7fffffff;
      auVar342._16_4_ = 0x7fffffff;
      auVar342._20_4_ = 0x7fffffff;
      auVar342._24_4_ = 0x7fffffff;
      auVar342._28_4_ = 0x7fffffff;
      auVar113 = vandps_avx(_local_600,auVar342);
      auVar113 = vmaxps_avx(local_440,auVar113);
      auVar55._4_4_ = auVar113._4_4_ * 1.9073486e-06;
      auVar55._0_4_ = auVar113._0_4_ * 1.9073486e-06;
      auVar55._8_4_ = auVar113._8_4_ * 1.9073486e-06;
      auVar55._12_4_ = auVar113._12_4_ * 1.9073486e-06;
      auVar55._16_4_ = auVar113._16_4_ * 1.9073486e-06;
      auVar55._20_4_ = auVar113._20_4_ * 1.9073486e-06;
      auVar55._24_4_ = auVar113._24_4_ * 1.9073486e-06;
      auVar55._28_4_ = auVar113._28_4_;
      auVar113 = vandps_avx(local_480,auVar342);
      auVar113 = vcmpps_avx(auVar113,auVar55,1);
      auVar311._8_4_ = 0x7f800000;
      auVar311._0_8_ = 0x7f8000007f800000;
      auVar311._12_4_ = 0x7f800000;
      auVar311._16_4_ = 0x7f800000;
      auVar311._20_4_ = 0x7f800000;
      auVar311._24_4_ = 0x7f800000;
      auVar311._28_4_ = 0x7f800000;
      auVar373 = vblendvps_avx(auVar311,auVar53,auVar32);
      local_660 = fVar215 * (local_6c0 + (float)local_6a0._0_4_ * fVar255);
      fStack_65c = fVar269 * (fStack_6bc + (float)local_6a0._4_4_ * fVar268);
      fStack_658 = fVar276 * (fStack_6b8 + fStack_698 * fVar271);
      fStack_654 = fVar296 * (fStack_6b4 + fStack_694 * fVar274);
      fStack_650 = fVar316 * (fStack_6b0 + fStack_690 * fVar277);
      fStack_64c = fVar251 * (fStack_6ac + fStack_68c * fVar280);
      fStack_648 = fVar253 * (fStack_6a8 + fStack_688 * fVar283);
      uStack_644 = 0x40800000;
      auVar262._8_4_ = 0xff800000;
      auVar262._0_8_ = 0xff800000ff800000;
      auVar262._12_4_ = 0xff800000;
      auVar262._16_4_ = 0xff800000;
      auVar262._20_4_ = 0xff800000;
      auVar262._24_4_ = 0xff800000;
      auVar262._28_4_ = 0xff800000;
      auVar349 = vblendvps_avx(auVar262,auVar54,auVar32);
      auVar312 = auVar32 & auVar113;
      if ((((((((auVar312 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar312 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar312 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar312 >> 0x7f,0) != '\0') ||
            (auVar312 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar312 >> 0xbf,0) != '\0') ||
          (auVar312 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar312[0x1f] < '\0') {
        auVar112 = vandps_avx(auVar113,auVar32);
        auVar111 = vpackssdw_avx(auVar112._0_16_,auVar112._16_16_);
        auVar312 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar262 = vcmpps_avx(auVar30,auVar312,2);
        auVar229._8_4_ = 0xff800000;
        auVar229._0_8_ = 0xff800000ff800000;
        auVar229._12_4_ = 0xff800000;
        auVar229._16_4_ = 0xff800000;
        auVar229._20_4_ = 0xff800000;
        auVar229._24_4_ = 0xff800000;
        auVar229._28_4_ = 0xff800000;
        auVar362._8_4_ = 0x7f800000;
        auVar362._0_8_ = 0x7f8000007f800000;
        auVar362._12_4_ = 0x7f800000;
        auVar362._16_4_ = 0x7f800000;
        auVar362._20_4_ = 0x7f800000;
        auVar362._24_4_ = 0x7f800000;
        auVar362._28_4_ = 0x7f800000;
        auVar363 = ZEXT3264(auVar362);
        auVar113 = vblendvps_avx(auVar362,auVar229,auVar262);
        auVar105 = vpmovsxwd_avx(auVar111);
        auVar111 = vpunpckhwd_avx(auVar111,auVar111);
        auVar244._16_16_ = auVar111;
        auVar244._0_16_ = auVar105;
        auVar373 = vblendvps_avx(auVar373,auVar113,auVar244);
        auVar113 = vblendvps_avx(auVar229,auVar362,auVar262);
        auVar349 = vblendvps_avx(auVar349,auVar113,auVar244);
        auVar113 = vcmpps_avx(auVar312,ZEXT1232(ZEXT812(0)) << 0x20,0xf);
        auVar121._0_4_ = auVar112._0_4_ ^ auVar113._0_4_;
        auVar121._4_4_ = auVar112._4_4_ ^ auVar113._4_4_;
        auVar121._8_4_ = auVar112._8_4_ ^ auVar113._8_4_;
        auVar121._12_4_ = auVar112._12_4_ ^ auVar113._12_4_;
        auVar121._16_4_ = auVar112._16_4_ ^ auVar113._16_4_;
        auVar121._20_4_ = auVar112._20_4_ ^ auVar113._20_4_;
        auVar121._24_4_ = auVar112._24_4_ ^ auVar113._24_4_;
        auVar121._28_4_ = auVar112._28_4_ ^ auVar113._28_4_;
        auVar112 = vorps_avx(auVar262,auVar121);
        auVar112 = vandps_avx(auVar32,auVar112);
      }
    }
    auVar351 = ZEXT3264(auVar349);
    auVar267 = ZEXT3264(auVar262);
    auVar346 = ZEXT3264(CONCAT428(fStack_7c4,
                                  CONCAT424(fStack_7c8,
                                            CONCAT420(fStack_7cc,
                                                      CONCAT416(fStack_7d0,
                                                                CONCAT412(fStack_7d4,
                                                                          CONCAT48(fStack_7d8,
                                                                                   CONCAT44(
                                                  fStack_7dc,local_7e0))))))));
    auVar113 = local_2e0 & auVar112;
    auVar292 = ZEXT3264(CONCAT428(fStack_544,
                                  CONCAT424(fStack_548,
                                            CONCAT420(fStack_54c,
                                                      CONCAT416(fStack_550,
                                                                CONCAT412(fStack_554,
                                                                          CONCAT48(fStack_558,
                                                                                   CONCAT44(
                                                  fStack_55c,local_560))))))));
    local_920 = uVar88;
    if ((((((((auVar113 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar113 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar113 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar113 >> 0x7f,0) != '\0') ||
          (auVar113 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar113 >> 0xbf,0) != '\0') ||
        (auVar113 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar113[0x1f] < '\0') {
      auVar111 = ZEXT416((uint)((ray->super_RayK<1>).org.field_0.m128[3] - (float)local_850._0_4_));
      auVar111 = vshufps_avx(auVar111,auVar111,0);
      auVar238._16_16_ = auVar111;
      auVar238._0_16_ = auVar111;
      auVar32 = vmaxps_avx(auVar238,auVar373);
      auVar111 = ZEXT416((uint)((ray->super_RayK<1>).tfar - (float)local_850._0_4_));
      auVar111 = vshufps_avx(auVar111,auVar111,0);
      auVar239._16_16_ = auVar111;
      auVar239._0_16_ = auVar111;
      auVar312 = vminps_avx(auVar239,auVar349);
      fVar280 = local_620._28_4_;
      auVar179._0_4_ = local_580 * fVar359 + local_560 * fVar347 + local_7e0 * fVar320;
      auVar179._4_4_ = fStack_57c * fVar364 + fStack_55c * fVar352 + fStack_7dc * fVar326;
      auVar179._8_4_ = fStack_578 * fVar365 + fStack_558 * fVar353 + fStack_7d8 * fVar328;
      auVar179._12_4_ = fStack_574 * fVar366 + fStack_554 * fVar354 + fStack_7d4 * fVar330;
      auVar179._16_4_ = fStack_570 * fVar367 + fStack_550 * fVar355 + fStack_7d0 * fVar332;
      auVar179._20_4_ = fStack_56c * fVar368 + fStack_54c * fVar356 + fStack_7cc * fVar334;
      auVar179._24_4_ = fStack_568 * fVar369 + fStack_548 * fVar357 + fStack_7c8 * fVar336;
      auVar179._28_4_ = fVar280 + fVar280 + auVar31._28_4_;
      auVar113 = vrcpps_avx(auVar179);
      fVar255 = auVar113._0_4_;
      fVar124 = auVar113._4_4_;
      auVar56._4_4_ = auVar179._4_4_ * fVar124;
      auVar56._0_4_ = auVar179._0_4_ * fVar255;
      fVar125 = auVar113._8_4_;
      auVar56._8_4_ = auVar179._8_4_ * fVar125;
      fVar268 = auVar113._12_4_;
      auVar56._12_4_ = auVar179._12_4_ * fVar268;
      fVar271 = auVar113._16_4_;
      auVar56._16_4_ = auVar179._16_4_ * fVar271;
      fVar274 = auVar113._20_4_;
      auVar56._20_4_ = auVar179._20_4_ * fVar274;
      fVar277 = auVar113._24_4_;
      auVar56._24_4_ = auVar179._24_4_ * fVar277;
      auVar56._28_4_ = uStack_1c4;
      auVar374._8_4_ = 0x3f800000;
      auVar374._0_8_ = 0x3f8000003f800000;
      auVar374._12_4_ = 0x3f800000;
      auVar374._16_4_ = 0x3f800000;
      auVar374._20_4_ = 0x3f800000;
      auVar374._24_4_ = 0x3f800000;
      auVar374._28_4_ = 0x3f800000;
      auVar30 = vsubps_avx(auVar374,auVar56);
      auVar324._8_4_ = 0x7fffffff;
      auVar324._0_8_ = 0x7fffffff7fffffff;
      auVar324._12_4_ = 0x7fffffff;
      auVar324._16_4_ = 0x7fffffff;
      auVar324._20_4_ = 0x7fffffff;
      auVar324._24_4_ = 0x7fffffff;
      auVar324._28_4_ = 0x7fffffff;
      auVar113 = vandps_avx(auVar324,auVar179);
      auVar384._8_4_ = 0x219392ef;
      auVar384._0_8_ = 0x219392ef219392ef;
      auVar384._12_4_ = 0x219392ef;
      auVar384._16_4_ = 0x219392ef;
      auVar384._20_4_ = 0x219392ef;
      auVar384._24_4_ = 0x219392ef;
      auVar384._28_4_ = 0x219392ef;
      auVar113 = vcmpps_avx(auVar113,auVar384,1);
      auVar57._4_4_ =
           (fVar124 + fVar124 * auVar30._4_4_) *
           -(fVar364 * fVar248 + fVar352 * fVar247 + fVar326 * fVar246);
      auVar57._0_4_ =
           (fVar255 + fVar255 * auVar30._0_4_) *
           -(fVar359 * fVar214 + fVar347 * fVar213 + fVar320 * fVar212);
      auVar57._8_4_ =
           (fVar125 + fVar125 * auVar30._8_4_) *
           -(fVar365 * fVar275 + fVar353 * fVar273 + fVar328 * fVar272);
      auVar57._12_4_ =
           (fVar268 + fVar268 * auVar30._12_4_) *
           -(fVar366 * fVar294 + fVar354 * fVar293 + fVar330 * fVar284);
      auVar57._16_4_ =
           (fVar271 + fVar271 * auVar30._16_4_) *
           -(fVar367 * fVar315 + fVar355 * fVar314 + fVar332 * fVar313);
      auVar57._20_4_ =
           (fVar274 + fVar274 * auVar30._20_4_) *
           -(fVar368 * fVar19 + fVar356 * fVar358 + fVar334 * fVar339);
      auVar57._24_4_ =
           (fVar277 + fVar277 * auVar30._24_4_) *
           -(fVar369 * fVar26 + fVar357 * fVar25 + fVar336 * fVar24);
      auVar57._28_4_ = -(auVar31._28_4_ + local_300._28_4_ + fVar280);
      auVar292 = ZEXT864(0) << 0x20;
      auVar30 = vcmpps_avx(auVar179,ZEXT832(0) << 0x20,1);
      auVar31 = vorps_avx(auVar113,auVar30);
      auVar30 = vcmpps_avx(auVar179,ZEXT832(0) << 0x20,6);
      auVar30 = vorps_avx(auVar113,auVar30);
      auVar343._8_4_ = 0xff800000;
      auVar343._0_8_ = 0xff800000ff800000;
      auVar343._12_4_ = 0xff800000;
      auVar343._16_4_ = 0xff800000;
      auVar343._20_4_ = 0xff800000;
      auVar343._24_4_ = 0xff800000;
      auVar343._28_4_ = 0xff800000;
      auVar346 = ZEXT3264(auVar343);
      auVar113 = vblendvps_avx(auVar57,auVar343,auVar31);
      auVar350._8_4_ = 0x7f800000;
      auVar350._0_8_ = 0x7f8000007f800000;
      auVar350._12_4_ = 0x7f800000;
      auVar350._16_4_ = 0x7f800000;
      auVar350._20_4_ = 0x7f800000;
      auVar350._24_4_ = 0x7f800000;
      auVar350._28_4_ = 0x7f800000;
      auVar351 = ZEXT3264(auVar350);
      auVar30 = vblendvps_avx(auVar57,auVar350,auVar30);
      auVar31 = vmaxps_avx(auVar32,auVar113);
      auVar32 = vminps_avx(auVar312,auVar30);
      auVar291 = ZEXT832(0) << 0x20;
      auVar113 = vsubps_avx(auVar291,local_880);
      auVar30 = vsubps_avx(auVar291,local_9c0);
      auVar58._4_4_ = auVar30._4_4_ * -fVar233;
      auVar58._0_4_ = auVar30._0_4_ * -fVar193;
      auVar58._8_4_ = auVar30._8_4_ * -fVar252;
      auVar58._12_4_ = auVar30._12_4_ * -fVar282;
      auVar58._16_4_ = auVar30._16_4_ * -fVar304;
      auVar58._20_4_ = auVar30._20_4_ * -fVar338;
      auVar58._24_4_ = auVar30._24_4_ * -fVar23;
      auVar58._28_4_ = auVar30._28_4_;
      auVar363 = ZEXT3264(local_900);
      auVar59._4_4_ = fVar377 * auVar113._4_4_;
      auVar59._0_4_ = fVar370 * auVar113._0_4_;
      auVar59._8_4_ = fVar378 * auVar113._8_4_;
      auVar59._12_4_ = fVar379 * auVar113._12_4_;
      auVar59._16_4_ = fVar380 * auVar113._16_4_;
      auVar59._20_4_ = fVar381 * auVar113._20_4_;
      auVar59._24_4_ = fVar382 * auVar113._24_4_;
      auVar59._28_4_ = auVar113._28_4_;
      auVar113 = vsubps_avx(auVar58,auVar59);
      auVar30 = vsubps_avx(auVar291,local_740);
      auVar325 = ZEXT3264(CONCAT428(0x80000000,
                                    CONCAT424(0x80000000,
                                              CONCAT420(0x80000000,
                                                        CONCAT416(0x80000000,
                                                                  CONCAT412(0x80000000,
                                                                            CONCAT48(0x80000000,
                                                                                                                                                                          
                                                  0x8000000080000000)))))));
      auVar60._4_4_ = fVar327 * auVar30._4_4_;
      auVar60._0_4_ = fVar321 * auVar30._0_4_;
      auVar60._8_4_ = fVar329 * auVar30._8_4_;
      auVar60._12_4_ = fVar331 * auVar30._12_4_;
      auVar60._16_4_ = fVar333 * auVar30._16_4_;
      auVar60._20_4_ = fVar335 * auVar30._20_4_;
      uVar8 = auVar30._28_4_;
      auVar60._24_4_ = fVar337 * auVar30._24_4_;
      auVar60._28_4_ = uVar8;
      auVar312 = vsubps_avx(auVar113,auVar60);
      auVar61._4_4_ = fStack_7dc * -fVar233;
      auVar61._0_4_ = local_7e0 * -fVar193;
      auVar61._8_4_ = fStack_7d8 * -fVar252;
      auVar61._12_4_ = fStack_7d4 * -fVar282;
      auVar61._16_4_ = fStack_7d0 * -fVar304;
      auVar61._20_4_ = fStack_7cc * -fVar338;
      auVar61._24_4_ = fStack_7c8 * -fVar23;
      auVar61._28_4_ = local_780._28_4_ ^ 0x80000000;
      auVar62._4_4_ = fStack_55c * fVar377;
      auVar62._0_4_ = local_560 * fVar370;
      auVar62._8_4_ = fStack_558 * fVar378;
      auVar62._12_4_ = fStack_554 * fVar379;
      auVar62._16_4_ = fStack_550 * fVar380;
      auVar62._20_4_ = fStack_54c * fVar381;
      auVar62._24_4_ = fStack_548 * fVar382;
      auVar62._28_4_ = uVar8;
      auVar375._8_4_ = 0x3f800000;
      auVar375._0_8_ = 0x3f8000003f800000;
      auVar375._12_4_ = 0x3f800000;
      auVar375._16_4_ = 0x3f800000;
      auVar375._20_4_ = 0x3f800000;
      auVar375._24_4_ = 0x3f800000;
      auVar375._28_4_ = 0x3f800000;
      auVar113 = vsubps_avx(auVar61,auVar62);
      auVar63._4_4_ = fStack_57c * fVar327;
      auVar63._0_4_ = local_580 * fVar321;
      auVar63._8_4_ = fStack_578 * fVar329;
      auVar63._12_4_ = fStack_574 * fVar331;
      auVar63._16_4_ = fStack_570 * fVar333;
      auVar63._20_4_ = fStack_56c * fVar335;
      auVar63._24_4_ = fStack_568 * fVar337;
      auVar63._28_4_ = uVar8;
      auVar180 = vsubps_avx(auVar113,auVar63);
      auVar113 = vrcpps_avx(auVar180);
      fVar193 = auVar113._0_4_;
      fVar212 = auVar113._4_4_;
      auVar64._4_4_ = auVar180._4_4_ * fVar212;
      auVar64._0_4_ = auVar180._0_4_ * fVar193;
      fVar213 = auVar113._8_4_;
      auVar64._8_4_ = auVar180._8_4_ * fVar213;
      fVar214 = auVar113._12_4_;
      auVar64._12_4_ = auVar180._12_4_ * fVar214;
      fVar233 = auVar113._16_4_;
      auVar64._16_4_ = auVar180._16_4_ * fVar233;
      fVar246 = auVar113._20_4_;
      auVar64._20_4_ = auVar180._20_4_ * fVar246;
      fVar247 = auVar113._24_4_;
      auVar64._24_4_ = auVar180._24_4_ * fVar247;
      auVar64._28_4_ = fStack_564;
      auVar33 = vsubps_avx(auVar375,auVar64);
      auVar115._8_4_ = 0x7fffffff;
      auVar115._0_8_ = 0x7fffffff7fffffff;
      auVar115._12_4_ = 0x7fffffff;
      auVar115._16_4_ = 0x7fffffff;
      auVar115._20_4_ = 0x7fffffff;
      auVar115._24_4_ = 0x7fffffff;
      auVar115._28_4_ = 0x7fffffff;
      auVar113 = vandps_avx(auVar180,auVar115);
      auVar30 = vcmpps_avx(auVar113,auVar384,1);
      auVar267 = ZEXT3264(auVar30);
      auVar65._4_4_ = (fVar212 + fVar212 * auVar33._4_4_) * -auVar312._4_4_;
      auVar65._0_4_ = (fVar193 + fVar193 * auVar33._0_4_) * -auVar312._0_4_;
      auVar65._8_4_ = (fVar213 + fVar213 * auVar33._8_4_) * -auVar312._8_4_;
      auVar65._12_4_ = (fVar214 + fVar214 * auVar33._12_4_) * -auVar312._12_4_;
      auVar65._16_4_ = (fVar233 + fVar233 * auVar33._16_4_) * -auVar312._16_4_;
      auVar65._20_4_ = (fVar246 + fVar246 * auVar33._20_4_) * -auVar312._20_4_;
      auVar65._24_4_ = (fVar247 + fVar247 * auVar33._24_4_) * -auVar312._24_4_;
      auVar65._28_4_ = auVar312._28_4_ ^ 0x80000000;
      auVar113 = vcmpps_avx(auVar180,auVar291,1);
      auVar113 = vorps_avx(auVar30,auVar113);
      auVar113 = vblendvps_avx(auVar65,auVar343,auVar113);
      _local_8e0 = vmaxps_avx(auVar31,auVar113);
      auVar113 = vcmpps_avx(auVar180,ZEXT832(0) << 0x20,6);
      auVar113 = vorps_avx(auVar30,auVar113);
      auVar113 = vblendvps_avx(auVar65,auVar350,auVar113);
      auVar112 = vandps_avx(local_2e0,auVar112);
      local_4e0 = vminps_avx(auVar32,auVar113);
      auVar113 = vcmpps_avx(_local_8e0,local_4e0,2);
      auVar30 = auVar112 & auVar113;
      if ((((((((auVar30 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar30 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar30 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar30 >> 0x7f,0) != '\0') ||
            (auVar30 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar30 >> 0xbf,0) != '\0') ||
          (auVar30 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar30[0x1f] < '\0') {
        auVar30 = vminps_avx(_local_aa0,_local_680);
        auVar31 = vminps_avx(_local_820,_local_840);
        auVar30 = vminps_avx(auVar30,auVar31);
        auVar30 = vsubps_avx(auVar30,local_5a0);
        auVar112 = vandps_avx(auVar113,auVar112);
        auVar113 = vminps_avx(_local_640,auVar375);
        auVar113 = vmaxps_avx(auVar113,ZEXT832(0) << 0x20);
        local_1a0[0] = fVar166 + fVar129 * (auVar113._0_4_ + 0.0) * 0.125;
        local_1a0[1] = fVar190 + fVar153 * (auVar113._4_4_ + 1.0) * 0.125;
        local_1a0[2] = fVar191 + fVar156 * (auVar113._8_4_ + 2.0) * 0.125;
        local_1a0[3] = fVar192 + fVar160 * (auVar113._12_4_ + 3.0) * 0.125;
        fStack_190 = fVar166 + fVar129 * (auVar113._16_4_ + 4.0) * 0.125;
        fStack_18c = fVar190 + fVar153 * (auVar113._20_4_ + 5.0) * 0.125;
        fStack_188 = fVar191 + fVar156 * (auVar113._24_4_ + 6.0) * 0.125;
        fStack_184 = fVar192 + auVar113._28_4_ + 7.0;
        auVar85._4_4_ = fStack_65c;
        auVar85._0_4_ = local_660;
        auVar85._8_4_ = fStack_658;
        auVar85._12_4_ = fStack_654;
        auVar85._16_4_ = fStack_650;
        auVar85._20_4_ = fStack_64c;
        auVar85._24_4_ = fStack_648;
        auVar85._28_4_ = uStack_644;
        auVar113 = vminps_avx(auVar85,auVar375);
        auVar113 = vmaxps_avx(auVar113,ZEXT832(0) << 0x20);
        local_1c0[0] = fVar166 + fVar129 * (auVar113._0_4_ + 0.0) * 0.125;
        local_1c0[1] = fVar190 + fVar153 * (auVar113._4_4_ + 1.0) * 0.125;
        local_1c0[2] = fVar191 + fVar156 * (auVar113._8_4_ + 2.0) * 0.125;
        local_1c0[3] = fVar192 + fVar160 * (auVar113._12_4_ + 3.0) * 0.125;
        fStack_1b0 = fVar166 + fVar129 * (auVar113._16_4_ + 4.0) * 0.125;
        fStack_1ac = fVar190 + fVar153 * (auVar113._20_4_ + 5.0) * 0.125;
        fStack_1a8 = fVar191 + fVar156 * (auVar113._24_4_ + 6.0) * 0.125;
        fStack_1a4 = fVar192 + auVar113._28_4_ + 7.0;
        auVar66._4_4_ = auVar30._4_4_ * 0.99999976;
        auVar66._0_4_ = auVar30._0_4_ * 0.99999976;
        auVar66._8_4_ = auVar30._8_4_ * 0.99999976;
        auVar66._12_4_ = auVar30._12_4_ * 0.99999976;
        auVar66._16_4_ = auVar30._16_4_ * 0.99999976;
        auVar66._20_4_ = auVar30._20_4_ * 0.99999976;
        auVar66._24_4_ = auVar30._24_4_ * 0.99999976;
        auVar66._28_4_ = 0x3f7ffffc;
        auVar113 = vmaxps_avx(ZEXT832(0) << 0x20,auVar66);
        auVar67._4_4_ = auVar113._4_4_ * auVar113._4_4_;
        auVar67._0_4_ = auVar113._0_4_ * auVar113._0_4_;
        auVar67._8_4_ = auVar113._8_4_ * auVar113._8_4_;
        auVar67._12_4_ = auVar113._12_4_ * auVar113._12_4_;
        auVar67._16_4_ = auVar113._16_4_ * auVar113._16_4_;
        auVar67._20_4_ = auVar113._20_4_ * auVar113._20_4_;
        auVar67._24_4_ = auVar113._24_4_ * auVar113._24_4_;
        auVar67._28_4_ = auVar113._28_4_;
        auVar30 = vsubps_avx(local_620,auVar67);
        auVar68._4_4_ = auVar30._4_4_ * fVar123;
        auVar68._0_4_ = auVar30._0_4_ * fVar254;
        auVar68._8_4_ = auVar30._8_4_ * fStack_918;
        auVar68._12_4_ = auVar30._12_4_ * fStack_914;
        auVar68._16_4_ = auVar30._16_4_ * fStack_910;
        auVar68._20_4_ = auVar30._20_4_ * fStack_90c;
        auVar68._24_4_ = auVar30._24_4_ * fStack_908;
        auVar68._28_4_ = auVar113._28_4_;
        auVar31 = vsubps_avx(auVar50,auVar68);
        auVar113 = vcmpps_avx(auVar31,ZEXT832(0) << 0x20,5);
        auVar32 = _local_8e0;
        if ((((((((auVar113 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar113 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar113 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar113 >> 0x7f,0) == '\0') &&
              (auVar113 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar113 >> 0xbf,0) == '\0') &&
            (auVar113 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar113[0x1f]) {
          _local_820 = ZEXT832(0) << 0x20;
          _local_840 = ZEXT832(0) << 0x20;
          _local_680 = ZEXT832(0) << 0x20;
          auVar180 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar372 = ZEXT828(0) << 0x20;
          auVar207 = SUB3228(ZEXT832(0),0) << 0x40;
          auVar240._8_4_ = 0x7f800000;
          auVar240._0_8_ = 0x7f8000007f800000;
          auVar240._12_4_ = 0x7f800000;
          auVar240._16_4_ = 0x7f800000;
          auVar240._20_4_ = 0x7f800000;
          auVar240._24_4_ = 0x7f800000;
          auVar240._28_4_ = 0x7f800000;
          auVar263._8_4_ = 0xff800000;
          auVar263._0_8_ = 0xff800000ff800000;
          auVar263._12_4_ = 0xff800000;
          auVar263._16_4_ = 0xff800000;
          auVar263._20_4_ = 0xff800000;
          auVar263._24_4_ = 0xff800000;
          auVar263._28_4_ = 0xff800000;
        }
        else {
          local_9c0 = auVar30;
          local_880 = auVar113;
          auVar180 = vsqrtps_avx(auVar31);
          auVar181._0_4_ = fVar126 + fVar126;
          auVar181._4_4_ = fVar127 + fVar127;
          auVar181._8_4_ = fVar128 + fVar128;
          auVar181._12_4_ = fVar386 + fVar386;
          auVar181._16_4_ = fVar387 + fVar387;
          auVar181._20_4_ = fVar388 + fVar388;
          auVar181._24_4_ = fVar389 + fVar389;
          auVar181._28_4_ = fVar97 + fVar97;
          auVar312 = vrcpps_avx(auVar181);
          fVar97 = auVar312._0_4_;
          fVar193 = auVar312._4_4_;
          auVar69._4_4_ = auVar181._4_4_ * fVar193;
          auVar69._0_4_ = auVar181._0_4_ * fVar97;
          fVar212 = auVar312._8_4_;
          auVar69._8_4_ = auVar181._8_4_ * fVar212;
          fVar213 = auVar312._12_4_;
          auVar69._12_4_ = auVar181._12_4_ * fVar213;
          fVar214 = auVar312._16_4_;
          auVar69._16_4_ = auVar181._16_4_ * fVar214;
          fVar233 = auVar312._20_4_;
          auVar69._20_4_ = auVar181._20_4_ * fVar233;
          fVar246 = auVar312._24_4_;
          auVar69._24_4_ = auVar181._24_4_ * fVar246;
          auVar69._28_4_ = auVar181._28_4_;
          auVar33 = vsubps_avx(auVar375,auVar69);
          fVar97 = fVar97 + fVar97 * auVar33._0_4_;
          fVar193 = fVar193 + fVar193 * auVar33._4_4_;
          fVar212 = fVar212 + fVar212 * auVar33._8_4_;
          fVar213 = fVar213 + fVar213 * auVar33._12_4_;
          fVar214 = fVar214 + fVar214 * auVar33._16_4_;
          fVar233 = fVar233 + fVar233 * auVar33._20_4_;
          fVar246 = fVar246 + fVar246 * auVar33._24_4_;
          fVar247 = auVar312._28_4_ + auVar33._28_4_;
          auVar209._0_8_ = local_300._0_8_ ^ 0x8000000080000000;
          auVar209._8_4_ = -local_300._8_4_;
          auVar209._12_4_ = -local_300._12_4_;
          auVar209._16_4_ = -local_300._16_4_;
          auVar209._20_4_ = -local_300._20_4_;
          auVar209._24_4_ = -local_300._24_4_;
          auVar209._28_4_ = -local_300._28_4_;
          auVar312 = vsubps_avx(auVar209,auVar180);
          fVar293 = auVar312._0_4_ * fVar97;
          fVar294 = auVar312._4_4_ * fVar193;
          auVar70._4_4_ = fVar294;
          auVar70._0_4_ = fVar293;
          fVar304 = auVar312._8_4_ * fVar212;
          auVar70._8_4_ = fVar304;
          fVar313 = auVar312._12_4_ * fVar213;
          auVar70._12_4_ = fVar313;
          fVar314 = auVar312._16_4_ * fVar214;
          auVar70._16_4_ = fVar314;
          fVar315 = auVar312._20_4_ * fVar233;
          auVar70._20_4_ = fVar315;
          fVar338 = auVar312._24_4_ * fVar246;
          auVar70._24_4_ = fVar338;
          auVar70._28_4_ = 0x3f800000;
          auVar180 = vsubps_avx(auVar180,local_300);
          fVar97 = auVar180._0_4_ * fVar97;
          fVar193 = auVar180._4_4_ * fVar193;
          auVar71._4_4_ = fVar193;
          auVar71._0_4_ = fVar97;
          fVar212 = auVar180._8_4_ * fVar212;
          auVar71._8_4_ = fVar212;
          fVar213 = auVar180._12_4_ * fVar213;
          auVar71._12_4_ = fVar213;
          fVar214 = auVar180._16_4_ * fVar214;
          auVar71._16_4_ = fVar214;
          fVar233 = auVar180._20_4_ * fVar233;
          auVar71._20_4_ = fVar233;
          fVar246 = auVar180._24_4_ * fVar246;
          auVar71._24_4_ = fVar246;
          auVar71._28_4_ = auVar112._28_4_;
          fVar248 = (fVar293 * (float)local_6a0._0_4_ + local_6c0) * fVar215;
          fVar252 = (fVar294 * (float)local_6a0._4_4_ + fStack_6bc) * fVar269;
          fVar272 = (fVar304 * fStack_698 + fStack_6b8) * fVar276;
          fVar273 = (fVar313 * fStack_694 + fStack_6b4) * fVar296;
          fVar275 = (fVar314 * fStack_690 + fStack_6b0) * fVar316;
          fVar282 = (fVar315 * fStack_68c + fStack_6ac) * fVar251;
          fVar284 = (fVar338 * fStack_688 + fStack_6a8) * fVar253;
          auVar146._0_4_ = local_8c0 + fVar158 * fVar248;
          auVar146._4_4_ = fStack_8bc + fVar232 * fVar252;
          auVar146._8_4_ = fStack_8b8 + fVar250 * fVar272;
          auVar146._12_4_ = fStack_8b4 + fVar281 * fVar273;
          auVar146._16_4_ = fStack_8b0 + fVar302 * fVar275;
          auVar146._20_4_ = fStack_8ac + fVar319 * fVar282;
          auVar146._24_4_ = fStack_8a8 + fVar22 * fVar284;
          auVar146._28_4_ = fStack_8a4 + auVar180._28_4_ + fStack_6a4;
          auVar72._4_4_ = fStack_57c * fVar294;
          auVar72._0_4_ = local_580 * fVar293;
          auVar72._8_4_ = fStack_578 * fVar304;
          auVar72._12_4_ = fStack_574 * fVar313;
          auVar72._16_4_ = fStack_570 * fVar314;
          auVar72._20_4_ = fStack_56c * fVar315;
          auVar72._24_4_ = fStack_568 * fVar338;
          auVar72._28_4_ = fVar247;
          auVar180 = vsubps_avx(auVar72,auVar146);
          auVar182._0_4_ = fVar130 + fVar131 * fVar248;
          auVar182._4_4_ = fVar154 + fVar230 * fVar252;
          auVar182._8_4_ = fVar157 + fVar270 * fVar272;
          auVar182._12_4_ = fVar161 + fVar278 * fVar273;
          auVar182._16_4_ = fVar162 + fVar298 * fVar275;
          auVar182._20_4_ = fVar163 + fVar317 * fVar282;
          auVar182._24_4_ = fVar164 + fVar20 * fVar284;
          auVar182._28_4_ = fVar165 + fVar247;
          auVar241._0_4_ = local_560 * fVar293;
          auVar241._4_4_ = fStack_55c * fVar294;
          auVar241._8_4_ = fStack_558 * fVar304;
          auVar241._12_4_ = fStack_554 * fVar313;
          auVar241._16_4_ = fStack_550 * fVar314;
          auVar241._20_4_ = fStack_54c * fVar315;
          auVar241._24_4_ = fStack_548 * fVar338;
          auVar241._28_4_ = 0;
          auVar33 = vsubps_avx(auVar241,auVar182);
          auVar210._0_4_ = local_8a0 + fVar155 * fVar248;
          auVar210._4_4_ = fStack_89c + fVar231 * fVar252;
          auVar210._8_4_ = fStack_898 + fVar249 * fVar272;
          auVar210._12_4_ = aStack_894.w + fVar279 * fVar273;
          auVar210._16_4_ = fStack_890 + fVar300 * fVar275;
          auVar210._20_4_ = fStack_88c + fVar318 * fVar282;
          auVar210._24_4_ = fStack_888 + fVar21 * fVar284;
          auVar210._28_4_ = fStack_884 + auVar312._28_4_;
          auVar73._4_4_ = fVar294 * fStack_7dc;
          auVar73._0_4_ = fVar293 * local_7e0;
          auVar73._8_4_ = fVar304 * fStack_7d8;
          auVar73._12_4_ = fVar313 * fStack_7d4;
          auVar73._16_4_ = fVar314 * fStack_7d0;
          auVar73._20_4_ = fVar315 * fStack_7cc;
          auVar73._24_4_ = fVar338 * fStack_7c8;
          auVar73._28_4_ = 0;
          auVar312 = vsubps_avx(auVar73,auVar210);
          auVar207 = auVar312._0_28_;
          fVar215 = (fVar97 * (float)local_6a0._0_4_ + local_6c0) * fVar215;
          fVar269 = (fVar193 * (float)local_6a0._4_4_ + fStack_6bc) * fVar269;
          fVar276 = (fVar212 * fStack_698 + fStack_6b8) * fVar276;
          fVar296 = (fVar213 * fStack_694 + fStack_6b4) * fVar296;
          fVar316 = (fVar214 * fStack_690 + fStack_6b0) * fVar316;
          fVar251 = (fVar233 * fStack_68c + fStack_6ac) * fVar251;
          fVar253 = (fVar246 * fStack_688 + fStack_6a8) * fVar253;
          auVar264._0_4_ = local_8c0 + fVar158 * fVar215;
          auVar264._4_4_ = fStack_8bc + fVar232 * fVar269;
          auVar264._8_4_ = fStack_8b8 + fVar250 * fVar276;
          auVar264._12_4_ = fStack_8b4 + fVar281 * fVar296;
          auVar264._16_4_ = fStack_8b0 + fVar302 * fVar316;
          auVar264._20_4_ = fStack_8ac + fVar319 * fVar251;
          auVar264._24_4_ = fStack_8a8 + fVar22 * fVar253;
          auVar264._28_4_ = fStack_8a4 + (float)local_5e0._28_4_;
          auVar74._4_4_ = fStack_57c * fVar193;
          auVar74._0_4_ = local_580 * fVar97;
          auVar74._8_4_ = fStack_578 * fVar212;
          auVar74._12_4_ = fStack_574 * fVar213;
          auVar74._16_4_ = fStack_570 * fVar214;
          auVar74._20_4_ = fStack_56c * fVar233;
          auVar74._24_4_ = fStack_568 * fVar246;
          auVar74._28_4_ = fStack_8a4;
          _local_820 = vsubps_avx(auVar74,auVar264);
          auVar265._0_4_ = fVar130 + fVar131 * fVar215;
          auVar265._4_4_ = fVar154 + fVar230 * fVar269;
          auVar265._8_4_ = fVar157 + fVar270 * fVar276;
          auVar265._12_4_ = fVar161 + fVar278 * fVar296;
          auVar265._16_4_ = fVar162 + fVar298 * fVar316;
          auVar265._20_4_ = fVar163 + fVar317 * fVar251;
          auVar265._24_4_ = fVar164 + fVar20 * fVar253;
          auVar265._28_4_ = fVar165 + local_820._28_4_;
          auVar75._4_4_ = fStack_55c * fVar193;
          auVar75._0_4_ = local_560 * fVar97;
          auVar75._8_4_ = fStack_558 * fVar212;
          auVar75._12_4_ = fStack_554 * fVar213;
          auVar75._16_4_ = fStack_550 * fVar214;
          auVar75._20_4_ = fStack_54c * fVar233;
          auVar75._24_4_ = fStack_548 * fVar246;
          auVar75._28_4_ = fStack_8a4;
          _local_840 = vsubps_avx(auVar75,auVar265);
          auVar242._0_4_ = local_8a0 + fVar155 * fVar215;
          auVar242._4_4_ = fStack_89c + fVar231 * fVar269;
          auVar242._8_4_ = fStack_898 + fVar249 * fVar276;
          auVar242._12_4_ = aStack_894.w + fVar279 * fVar296;
          auVar242._16_4_ = fStack_890 + fVar300 * fVar316;
          auVar242._20_4_ = fStack_88c + fVar318 * fVar251;
          auVar242._24_4_ = fStack_888 + fVar21 * fVar253;
          auVar242._28_4_ = fStack_884 + fStack_6a4 + 0.0;
          auVar76._4_4_ = fVar193 * fStack_7dc;
          auVar76._0_4_ = fVar97 * local_7e0;
          auVar76._8_4_ = fVar212 * fStack_7d8;
          auVar76._12_4_ = fVar213 * fStack_7d4;
          auVar76._16_4_ = fVar214 * fStack_7d0;
          auVar76._20_4_ = fVar233 * fStack_7cc;
          auVar76._24_4_ = fVar246 * fStack_7c8;
          auVar76._28_4_ = local_840._28_4_;
          _local_680 = vsubps_avx(auVar76,auVar242);
          auVar312 = vcmpps_avx(auVar31,_DAT_01faff00,5);
          auVar243._8_4_ = 0x7f800000;
          auVar243._0_8_ = 0x7f8000007f800000;
          auVar243._12_4_ = 0x7f800000;
          auVar243._16_4_ = 0x7f800000;
          auVar243._20_4_ = 0x7f800000;
          auVar243._24_4_ = 0x7f800000;
          auVar243._28_4_ = 0x7f800000;
          auVar240 = vblendvps_avx(auVar243,auVar70,auVar312);
          auVar344._8_4_ = 0x7fffffff;
          auVar344._0_8_ = 0x7fffffff7fffffff;
          auVar344._12_4_ = 0x7fffffff;
          auVar344._16_4_ = 0x7fffffff;
          auVar344._20_4_ = 0x7fffffff;
          auVar344._24_4_ = 0x7fffffff;
          auVar344._28_4_ = 0x7fffffff;
          auVar31 = vandps_avx(auVar344,_local_600);
          auVar31 = vmaxps_avx(local_440,auVar31);
          auVar77._4_4_ = auVar31._4_4_ * 1.9073486e-06;
          auVar77._0_4_ = auVar31._0_4_ * 1.9073486e-06;
          auVar77._8_4_ = auVar31._8_4_ * 1.9073486e-06;
          auVar77._12_4_ = auVar31._12_4_ * 1.9073486e-06;
          auVar77._16_4_ = auVar31._16_4_ * 1.9073486e-06;
          auVar77._20_4_ = auVar31._20_4_ * 1.9073486e-06;
          auVar77._24_4_ = auVar31._24_4_ * 1.9073486e-06;
          auVar77._28_4_ = auVar31._28_4_;
          auVar31 = vandps_avx(auVar344,local_480);
          _local_800 = vcmpps_avx(auVar31,auVar77,1);
          auVar266._8_4_ = 0xff800000;
          auVar266._0_8_ = 0xff800000ff800000;
          auVar266._12_4_ = 0xff800000;
          auVar266._16_4_ = 0xff800000;
          auVar266._20_4_ = 0xff800000;
          auVar266._24_4_ = 0xff800000;
          auVar266._28_4_ = 0xff800000;
          auVar263 = vblendvps_avx(auVar266,auVar71,auVar312);
          auVar31 = auVar312 & _local_800;
          if ((((((((auVar31 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar31 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar31 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar31 >> 0x7f,0) != '\0') ||
                (auVar31 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar31 >> 0xbf,0) != '\0') ||
              (auVar31 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar31[0x1f] < '\0') {
            auVar113 = vandps_avx(_local_800,auVar312);
            auVar111 = vpackssdw_avx(auVar113._0_16_,auVar113._16_16_);
            auVar31 = vcmpps_avx(auVar30,ZEXT832(0) << 0x20,2);
            auVar385._8_4_ = 0xff800000;
            auVar385._0_8_ = 0xff800000ff800000;
            auVar385._12_4_ = 0xff800000;
            auVar385._16_4_ = 0xff800000;
            auVar385._20_4_ = 0xff800000;
            auVar385._24_4_ = 0xff800000;
            auVar385._28_4_ = 0xff800000;
            auVar376._8_4_ = 0x7f800000;
            auVar376._0_8_ = 0x7f8000007f800000;
            auVar376._12_4_ = 0x7f800000;
            auVar376._16_4_ = 0x7f800000;
            auVar376._20_4_ = 0x7f800000;
            auVar376._24_4_ = 0x7f800000;
            auVar376._28_4_ = 0x7f800000;
            auVar30 = vblendvps_avx(auVar376,auVar385,auVar31);
            auVar105 = vpmovsxwd_avx(auVar111);
            auVar111 = vpunpckhwd_avx(auVar111,auVar111);
            auVar345._16_16_ = auVar111;
            auVar345._0_16_ = auVar105;
            auVar240 = vblendvps_avx(auVar240,auVar30,auVar345);
            auVar30 = vblendvps_avx(auVar385,auVar376,auVar31);
            auVar263 = vblendvps_avx(auVar263,auVar30,auVar345);
            _local_800 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
            auVar122._0_4_ = local_800._0_4_ ^ auVar113._0_4_;
            auVar122._4_4_ = local_800._4_4_ ^ auVar113._4_4_;
            auVar122._8_4_ = local_800._8_4_ ^ auVar113._8_4_;
            auVar122._12_4_ = local_800._12_4_ ^ auVar113._12_4_;
            auVar122._16_4_ = local_800._16_4_ ^ auVar113._16_4_;
            auVar122._20_4_ = local_800._20_4_ ^ auVar113._20_4_;
            auVar122._24_4_ = local_800._24_4_ ^ auVar113._24_4_;
            auVar122._28_4_ = local_800._28_4_ ^ auVar113._28_4_;
            auVar113 = vorps_avx(auVar31,auVar122);
            auVar113 = vandps_avx(auVar312,auVar113);
          }
          auVar372 = auVar33._0_28_;
        }
        auVar346 = ZEXT3264(_local_800);
        auVar363 = ZEXT3264(auVar112);
        local_6c0 = (ray->super_RayK<1>).dir.field_0.m128[0];
        fVar97 = (ray->super_RayK<1>).dir.field_0.m128[1];
        local_5c0._4_4_ = fVar97;
        local_5c0._0_4_ = fVar97;
        fStack_5b8 = fVar97;
        fStack_5b4 = fVar97;
        fStack_5b0 = fVar97;
        fStack_5ac = fVar97;
        fStack_5a8 = fVar97;
        fStack_5a4 = fVar97;
        auVar325 = ZEXT3264(_local_5c0);
        fVar131 = (ray->super_RayK<1>).dir.field_0.m128[2];
        local_600._4_4_ = fVar131;
        local_600._0_4_ = fVar131;
        fStack_5f8 = fVar131;
        fStack_5f4 = fVar131;
        fStack_5f0 = fVar131;
        fStack_5ec = fVar131;
        fStack_5e8 = fVar131;
        fStack_5e4 = fVar131;
        auVar351 = ZEXT3264(_local_600);
        local_4c0 = _local_8e0;
        local_4a0 = vminps_avx(local_4e0,auVar240);
        _local_500 = vmaxps_avx(_local_8e0,auVar263);
        auVar267 = ZEXT3264(_local_500);
        auVar30 = vcmpps_avx(_local_8e0,local_4a0,2);
        local_5a0 = vandps_avx(auVar112,auVar30);
        auVar30 = vcmpps_avx(_local_500,local_4e0,2);
        local_5e0 = vandps_avx(auVar112,auVar30);
        auVar292 = ZEXT3264(local_5e0);
        auVar112 = vorps_avx(local_5e0,local_5a0);
        if ((((((((auVar112 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar112 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar112 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar112 >> 0x7f,0) != '\0') ||
              (auVar112 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar112 >> 0xbf,0) != '\0') ||
            (auVar112 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar112[0x1f] < '\0') {
          local_6e0 = _local_500;
          auVar112 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
          local_620._0_4_ = auVar113._0_4_ ^ auVar112._0_4_;
          local_620._4_4_ = auVar113._4_4_ ^ auVar112._4_4_;
          local_620._8_4_ = auVar113._8_4_ ^ auVar112._8_4_;
          local_620._12_4_ = auVar113._12_4_ ^ auVar112._12_4_;
          local_620._16_4_ = auVar113._16_4_ ^ auVar112._16_4_;
          local_620._20_4_ = auVar113._20_4_ ^ auVar112._20_4_;
          local_620._24_4_ = auVar113._24_4_ ^ auVar112._24_4_;
          local_620._28_4_ = (uint)auVar113._28_4_ ^ auVar112._28_4_;
          fStack_6bc = local_6c0;
          fStack_6b8 = local_6c0;
          fStack_6b4 = local_6c0;
          fStack_6b0 = local_6c0;
          fStack_6ac = local_6c0;
          fStack_6a8 = local_6c0;
          fStack_6a4 = local_6c0;
          auVar116._0_4_ =
               auVar180._0_4_ * local_6c0 + auVar372._0_4_ * fVar97 + fVar131 * auVar207._0_4_;
          auVar116._4_4_ =
               auVar180._4_4_ * local_6c0 + auVar372._4_4_ * fVar97 + fVar131 * auVar207._4_4_;
          auVar116._8_4_ =
               auVar180._8_4_ * local_6c0 + auVar372._8_4_ * fVar97 + fVar131 * auVar207._8_4_;
          auVar116._12_4_ =
               auVar180._12_4_ * local_6c0 + auVar372._12_4_ * fVar97 + fVar131 * auVar207._12_4_;
          auVar116._16_4_ =
               auVar180._16_4_ * local_6c0 + auVar372._16_4_ * fVar97 + fVar131 * auVar207._16_4_;
          auVar116._20_4_ =
               auVar180._20_4_ * local_6c0 + auVar372._20_4_ * fVar97 + fVar131 * auVar207._20_4_;
          auVar116._24_4_ =
               auVar180._24_4_ * local_6c0 + auVar372._24_4_ * fVar97 + fVar131 * auVar207._24_4_;
          auVar116._28_4_ = auVar113._28_4_ + local_6c0 + auVar180._28_4_;
          auVar147._8_4_ = 0x7fffffff;
          auVar147._0_8_ = 0x7fffffff7fffffff;
          auVar147._12_4_ = 0x7fffffff;
          auVar147._16_4_ = 0x7fffffff;
          auVar147._20_4_ = 0x7fffffff;
          auVar147._24_4_ = 0x7fffffff;
          auVar147._28_4_ = 0x7fffffff;
          auVar112 = vandps_avx(auVar116,auVar147);
          auVar148._8_4_ = 0x3e99999a;
          auVar148._0_8_ = 0x3e99999a3e99999a;
          auVar148._12_4_ = 0x3e99999a;
          auVar148._16_4_ = 0x3e99999a;
          auVar148._20_4_ = 0x3e99999a;
          auVar148._24_4_ = 0x3e99999a;
          auVar148._28_4_ = 0x3e99999a;
          auVar112 = vcmpps_avx(auVar112,auVar148,1);
          auVar112 = vorps_avx(auVar112,local_620);
          auVar149._8_4_ = 3;
          auVar149._0_8_ = 0x300000003;
          auVar149._12_4_ = 3;
          auVar149._16_4_ = 3;
          auVar149._20_4_ = 3;
          auVar149._24_4_ = 3;
          auVar149._28_4_ = 3;
          auVar183._8_4_ = 2;
          auVar183._0_8_ = 0x200000002;
          auVar183._12_4_ = 2;
          auVar183._16_4_ = 2;
          auVar183._20_4_ = 2;
          auVar183._24_4_ = 2;
          auVar183._28_4_ = 2;
          auVar112 = vblendvps_avx(auVar183,auVar149,auVar112);
          _local_640 = ZEXT432(local_aec);
          auVar105 = vpshufd_avx(ZEXT416(local_aec),0);
          auVar111 = vpcmpgtd_avx(auVar112._16_16_,auVar105);
          local_660 = auVar105._0_4_;
          fStack_65c = auVar105._4_4_;
          fStack_658 = auVar105._8_4_;
          fStack_654 = auVar105._12_4_;
          auVar105 = vpcmpgtd_avx(auVar112._0_16_,auVar105);
          auVar150._16_16_ = auVar111;
          auVar150._0_16_ = auVar105;
          _local_6a0 = vblendps_avx(ZEXT1632(auVar105),auVar150,0xf0);
          local_540 = vandnps_avx(_local_6a0,local_5a0);
          auVar112 = local_5a0 & ~_local_6a0;
          local_780 = auVar34;
          if ((((((((auVar112 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar112 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar112 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar112 >> 0x7f,0) == '\0') &&
                (auVar112 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar112 >> 0xbf,0) == '\0') &&
              (auVar112 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar112[0x1f]) {
            fVar97 = (ray->super_RayK<1>).tfar;
            auVar117._4_4_ = fVar97;
            auVar117._0_4_ = fVar97;
            auVar117._8_4_ = fVar97;
            auVar117._12_4_ = fVar97;
            auVar117._16_4_ = fVar97;
            auVar117._20_4_ = fVar97;
            auVar117._24_4_ = fVar97;
            auVar117._28_4_ = fVar97;
          }
          else {
            local_800._4_4_ = (float)local_8e0._4_4_ + (float)local_720._4_4_;
            local_800._0_4_ = (float)local_8e0._0_4_ + (float)local_720._0_4_;
            fStack_7f8 = fStack_8d8 + fStack_718;
            fStack_7f4 = fStack_8d4 + fStack_714;
            fStack_7f0 = fStack_8d0 + fStack_710;
            fStack_7ec = fStack_8cc + fStack_70c;
            fStack_7e8 = fStack_8c8 + fStack_708;
            fStack_7e4 = fStack_8c4 + fStack_704;
            _local_8e0 = auVar32;
            do {
              auVar118._8_4_ = 0x7f800000;
              auVar118._0_8_ = 0x7f8000007f800000;
              auVar118._12_4_ = 0x7f800000;
              auVar118._16_4_ = 0x7f800000;
              auVar118._20_4_ = 0x7f800000;
              auVar118._24_4_ = 0x7f800000;
              auVar118._28_4_ = 0x7f800000;
              auVar112 = vblendvps_avx(auVar118,_local_8e0,local_540);
              auVar113 = vshufps_avx(auVar112,auVar112,0xb1);
              auVar113 = vminps_avx(auVar112,auVar113);
              auVar30 = vshufpd_avx(auVar113,auVar113,5);
              auVar113 = vminps_avx(auVar113,auVar30);
              auVar30 = vperm2f128_avx(auVar113,auVar113,1);
              auVar113 = vminps_avx(auVar113,auVar30);
              auVar113 = vcmpps_avx(auVar112,auVar113,0);
              auVar30 = local_540 & auVar113;
              auVar112 = local_540;
              if ((((((((auVar30 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar30 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar30 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar30 >> 0x7f,0) != '\0') ||
                    (auVar30 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar30 >> 0xbf,0) != '\0') ||
                  (auVar30 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar30[0x1f] < '\0') {
                auVar112 = vandps_avx(auVar113,local_540);
              }
              uVar87 = vmovmskps_avx(auVar112);
              uVar90 = 0;
              if (uVar87 != 0) {
                for (; (uVar87 >> uVar90 & 1) == 0; uVar90 = uVar90 + 1) {
                }
              }
              uVar88 = (ulong)uVar90;
              *(undefined4 *)(local_540 + uVar88 * 4) = 0;
              aVar10 = (ray->super_RayK<1>).dir.field_0.field_1;
              local_8a0 = aVar10.x;
              fStack_89c = aVar10.y;
              fStack_898 = aVar10.z;
              aStack_894 = aVar10.field_3;
              auVar111 = vdpps_avx((undefined1  [16])aVar10,(undefined1  [16])aVar10,0x7f);
              fVar97 = local_1a0[uVar88];
              uVar90 = *(uint *)(local_4c0 + uVar88 * 4);
              if (auVar111._0_4_ < 0.0) {
                fVar131 = sqrtf(auVar111._0_4_);
              }
              else {
                auVar111 = vsqrtss_avx(auVar111,auVar111);
                fVar131 = auVar111._0_4_;
              }
              auVar105 = vminps_avx(_local_960,_local_980);
              auVar111 = vmaxps_avx(_local_960,_local_980);
              auVar174 = vminps_avx(_local_970,_local_990);
              auVar175 = vminps_avx(auVar105,auVar174);
              auVar105 = vmaxps_avx(_local_970,_local_990);
              auVar174 = vmaxps_avx(auVar111,auVar105);
              auVar197._8_4_ = 0x7fffffff;
              auVar197._0_8_ = 0x7fffffff7fffffff;
              auVar197._12_4_ = 0x7fffffff;
              auVar111 = vandps_avx(auVar175,auVar197);
              auVar105 = vandps_avx(auVar174,auVar197);
              auVar111 = vmaxps_avx(auVar111,auVar105);
              auVar105 = vmovshdup_avx(auVar111);
              auVar105 = vmaxss_avx(auVar105,auVar111);
              auVar111 = vshufpd_avx(auVar111,auVar111,1);
              auVar111 = vmaxss_avx(auVar111,auVar105);
              local_8c0 = auVar111._0_4_ * 1.9073486e-06;
              local_740._0_4_ = fVar131 * 1.9073486e-06;
              local_7c0._0_16_ = vshufps_avx(auVar174,auVar174,0xff);
              auVar111 = vinsertps_avx(ZEXT416(uVar90),ZEXT416((uint)fVar97),0x10);
              auVar325 = ZEXT1664(auVar111);
              lVar94 = 5;
              do {
                auVar323 = auVar325._0_16_;
                auVar105 = vmovshdup_avx(auVar323);
                fVar97 = auVar105._0_4_;
                fVar213 = 1.0 - fVar97;
                fVar131 = fVar213 * fVar213;
                fVar155 = fVar213 * fVar131;
                fVar158 = fVar97 * fVar97;
                fVar193 = fVar97 * fVar158;
                fVar212 = fVar97 * fVar213;
                auVar111 = vshufps_avx(ZEXT416((uint)(fVar193 * 0.16666667)),
                                       ZEXT416((uint)(fVar193 * 0.16666667)),0);
                auVar174 = ZEXT416((uint)((fVar193 * 4.0 + fVar155 +
                                          fVar97 * fVar212 * 12.0 + fVar213 * fVar212 * 6.0) *
                                         0.16666667));
                auVar174 = vshufps_avx(auVar174,auVar174,0);
                auVar175 = ZEXT416((uint)((fVar155 * 4.0 + fVar193 +
                                          fVar213 * fVar212 * 12.0 + fVar97 * fVar212 * 6.0) *
                                         0.16666667));
                auVar175 = vshufps_avx(auVar175,auVar175,0);
                auVar107 = vshufps_avx(auVar323,auVar323,0);
                auVar171._0_4_ = auVar107._0_4_ * local_8a0 + 0.0;
                auVar171._4_4_ = auVar107._4_4_ * fStack_89c + 0.0;
                auVar171._8_4_ = auVar107._8_4_ * fStack_898 + 0.0;
                auVar171._12_4_ = auVar107._12_4_ * aStack_894.w + 0.0;
                auVar107 = vshufps_avx(ZEXT416((uint)(fVar155 * 0.16666667)),
                                       ZEXT416((uint)(fVar155 * 0.16666667)),0);
                auVar102._0_4_ =
                     auVar107._0_4_ * (float)local_960._0_4_ +
                     auVar175._0_4_ * (float)local_980._0_4_ +
                     auVar111._0_4_ * (float)local_990._0_4_ +
                     auVar174._0_4_ * (float)local_970._0_4_;
                auVar102._4_4_ =
                     auVar107._4_4_ * (float)local_960._4_4_ +
                     auVar175._4_4_ * (float)local_980._4_4_ +
                     auVar111._4_4_ * (float)local_990._4_4_ +
                     auVar174._4_4_ * (float)local_970._4_4_;
                auVar102._8_4_ =
                     auVar107._8_4_ * fStack_958 +
                     auVar175._8_4_ * fStack_978 +
                     auVar111._8_4_ * fStack_988 + auVar174._8_4_ * fStack_968;
                auVar102._12_4_ =
                     auVar107._12_4_ * fStack_954 +
                     auVar175._12_4_ * fStack_974 +
                     auVar111._12_4_ * fStack_984 + auVar174._12_4_ * fStack_964;
                local_880._0_16_ = auVar102;
                auVar174 = vsubps_avx(auVar171,auVar102);
                auVar111 = vdpps_avx(auVar174,auVar174,0x7f);
                fVar155 = auVar111._0_4_;
                local_ae0 = auVar325._0_4_;
                if (fVar155 < 0.0) {
                  local_9c0._0_16_ = auVar105;
                  local_9e0._0_4_ = fVar158;
                  local_a00._0_4_ = fVar131;
                  local_a20._0_4_ = fVar212;
                  auVar346._0_4_ = sqrtf(fVar155);
                  auVar346._4_60_ = extraout_var;
                  auVar105 = auVar346._0_16_;
                  fVar158 = (float)local_9e0._0_4_;
                  fVar212 = (float)local_a20._0_4_;
                  fVar97 = (float)local_9c0._0_4_;
                }
                else {
                  auVar105 = vsqrtss_avx(auVar111,auVar111);
                  local_a00._0_4_ = fVar131;
                }
                auVar346 = ZEXT1664(auVar105);
                auVar175 = vshufps_avx(ZEXT416((uint)(fVar158 * 0.5)),ZEXT416((uint)(fVar158 * 0.5))
                                       ,0);
                auVar292 = ZEXT1664(_local_990);
                auVar107 = ZEXT416((uint)(((float)local_a00._0_4_ + fVar212 * 4.0) * 0.5));
                auVar107 = vshufps_avx(auVar107,auVar107,0);
                auVar140 = ZEXT416((uint)((fVar97 * -fVar97 - fVar212 * 4.0) * 0.5));
                auVar140 = vshufps_avx(auVar140,auVar140,0);
                auVar106 = ZEXT416((uint)(fVar213 * -fVar213 * 0.5));
                auVar106 = vshufps_avx(auVar106,auVar106,0);
                auVar308._0_4_ =
                     (float)local_960._0_4_ * auVar106._0_4_ +
                     (float)local_980._0_4_ * auVar140._0_4_ +
                     local_990._0_4_ * auVar175._0_4_ + (float)local_970._0_4_ * auVar107._0_4_;
                auVar308._4_4_ =
                     (float)local_960._4_4_ * auVar106._4_4_ +
                     (float)local_980._4_4_ * auVar140._4_4_ +
                     local_990._4_4_ * auVar175._4_4_ + (float)local_970._4_4_ * auVar107._4_4_;
                auVar308._8_4_ =
                     fStack_958 * auVar106._8_4_ +
                     fStack_978 * auVar140._8_4_ +
                     local_990._8_4_ * auVar175._8_4_ + fStack_968 * auVar107._8_4_;
                auVar308._12_4_ =
                     fStack_954 * auVar106._12_4_ +
                     fStack_974 * auVar140._12_4_ +
                     local_990._12_4_ * auVar175._12_4_ + fStack_964 * auVar107._12_4_;
                auVar175 = vshufps_avx(auVar323,auVar323,0x55);
                auVar107 = ZEXT416((uint)(fVar213 - (fVar97 + fVar97)));
                auVar140 = vshufps_avx(auVar107,auVar107,0);
                auVar107 = ZEXT416((uint)(fVar97 - (fVar213 + fVar213)));
                auVar106 = vshufps_avx(auVar107,auVar107,0);
                auVar27 = vshufps_avx(ZEXT416((uint)fVar213),ZEXT416((uint)fVar213),0);
                auVar107 = vdpps_avx(auVar308,auVar308,0x7f);
                auVar136._0_4_ =
                     (float)local_960._0_4_ * auVar27._0_4_ +
                     (float)local_980._0_4_ * auVar106._0_4_ +
                     local_990._0_4_ * auVar175._0_4_ + (float)local_970._0_4_ * auVar140._0_4_;
                auVar136._4_4_ =
                     (float)local_960._4_4_ * auVar27._4_4_ +
                     (float)local_980._4_4_ * auVar106._4_4_ +
                     local_990._4_4_ * auVar175._4_4_ + (float)local_970._4_4_ * auVar140._4_4_;
                auVar136._8_4_ =
                     fStack_958 * auVar27._8_4_ +
                     fStack_978 * auVar106._8_4_ +
                     local_990._8_4_ * auVar175._8_4_ + fStack_968 * auVar140._8_4_;
                auVar136._12_4_ =
                     fStack_954 * auVar27._12_4_ +
                     fStack_974 * auVar106._12_4_ +
                     local_990._12_4_ * auVar175._12_4_ + fStack_964 * auVar140._12_4_;
                auVar175 = vblendps_avx(auVar107,_DAT_01f7aa10,0xe);
                auVar140 = vrsqrtss_avx(auVar175,auVar175);
                fVar131 = auVar140._0_4_;
                fVar97 = auVar107._0_4_;
                auVar140 = vdpps_avx(auVar308,auVar136,0x7f);
                auVar106 = vshufps_avx(auVar107,auVar107,0);
                auVar137._0_4_ = auVar136._0_4_ * auVar106._0_4_;
                auVar137._4_4_ = auVar136._4_4_ * auVar106._4_4_;
                auVar137._8_4_ = auVar136._8_4_ * auVar106._8_4_;
                auVar137._12_4_ = auVar136._12_4_ * auVar106._12_4_;
                auVar140 = vshufps_avx(auVar140,auVar140,0);
                auVar219._0_4_ = auVar308._0_4_ * auVar140._0_4_;
                auVar219._4_4_ = auVar308._4_4_ * auVar140._4_4_;
                auVar219._8_4_ = auVar308._8_4_ * auVar140._8_4_;
                auVar219._12_4_ = auVar308._12_4_ * auVar140._12_4_;
                auVar27 = vsubps_avx(auVar137,auVar219);
                auVar140 = vrcpss_avx(auVar175,auVar175);
                auVar175 = vmaxss_avx(ZEXT416((uint)local_8c0),
                                      ZEXT416((uint)(local_ae0 * (float)local_740._0_4_)));
                auVar363 = ZEXT1664(auVar175);
                auVar140 = ZEXT416((uint)(auVar140._0_4_ * (2.0 - fVar97 * auVar140._0_4_)));
                auVar140 = vshufps_avx(auVar140,auVar140,0);
                uVar88 = CONCAT44(auVar308._4_4_,auVar308._0_4_);
                local_a00._0_8_ = uVar88 ^ 0x8000000080000000;
                local_a00._8_4_ = -auVar308._8_4_;
                local_a00._12_4_ = -auVar308._12_4_;
                auVar106 = ZEXT416((uint)(fVar131 * 1.5 +
                                         fVar97 * -0.5 * fVar131 * fVar131 * fVar131));
                auVar106 = vshufps_avx(auVar106,auVar106,0);
                auVar198._0_4_ = auVar106._0_4_ * auVar27._0_4_ * auVar140._0_4_;
                auVar198._4_4_ = auVar106._4_4_ * auVar27._4_4_ * auVar140._4_4_;
                auVar198._8_4_ = auVar106._8_4_ * auVar27._8_4_ * auVar140._8_4_;
                auVar198._12_4_ = auVar106._12_4_ * auVar27._12_4_ * auVar140._12_4_;
                auVar259._0_4_ = auVar308._0_4_ * auVar106._0_4_;
                auVar259._4_4_ = auVar308._4_4_ * auVar106._4_4_;
                auVar259._8_4_ = auVar308._8_4_ * auVar106._8_4_;
                auVar259._12_4_ = auVar308._12_4_ * auVar106._12_4_;
                local_9c0._0_4_ = auVar175._0_4_;
                if (fVar97 < 0.0) {
                  local_9e0._0_4_ = auVar105._0_4_;
                  local_a20._0_16_ = auVar259;
                  local_900._0_16_ = auVar198;
                  auVar292 = ZEXT1664(_local_990);
                  fVar97 = sqrtf(fVar97);
                  auVar346 = ZEXT464((uint)local_9e0._0_4_);
                  auVar363 = ZEXT464((uint)local_9c0._0_4_);
                  auVar198 = local_900._0_16_;
                  auVar259 = local_a20._0_16_;
                }
                else {
                  auVar105 = vsqrtss_avx(auVar107,auVar107);
                  fVar97 = auVar105._0_4_;
                }
                auVar105 = vdpps_avx(auVar174,auVar259,0x7f);
                local_9e0._0_4_ =
                     (local_8c0 / fVar97) * (auVar346._0_4_ + 1.0) +
                     auVar363._0_4_ + auVar346._0_4_ * local_8c0;
                auVar175 = vdpps_avx(local_a00._0_16_,auVar259,0x7f);
                auVar107 = vdpps_avx(auVar174,auVar198,0x7f);
                auVar81._4_4_ = fStack_89c;
                auVar81._0_4_ = local_8a0;
                auVar81._8_4_ = fStack_898;
                auVar81._12_4_ = aStack_894.a;
                auVar140 = vdpps_avx(auVar81,auVar259,0x7f);
                auVar106 = vdpps_avx(auVar174,local_a00._0_16_,0x7f);
                fVar97 = auVar175._0_4_ + auVar107._0_4_;
                fVar131 = auVar105._0_4_;
                auVar103._0_4_ = fVar131 * fVar131;
                auVar103._4_4_ = auVar105._4_4_ * auVar105._4_4_;
                auVar103._8_4_ = auVar105._8_4_ * auVar105._8_4_;
                auVar103._12_4_ = auVar105._12_4_ * auVar105._12_4_;
                auVar107 = vsubps_avx(auVar111,auVar103);
                local_a00._0_16_ = ZEXT416((uint)fVar97);
                auVar175 = vdpps_avx(auVar174,auVar81,0x7f);
                fVar158 = auVar106._0_4_ - fVar131 * fVar97;
                fVar131 = auVar175._0_4_ - fVar131 * auVar140._0_4_;
                auVar175 = vrsqrtss_avx(auVar107,auVar107);
                fVar193 = auVar107._0_4_;
                fVar97 = auVar175._0_4_;
                fVar97 = fVar97 * 1.5 + fVar193 * -0.5 * fVar97 * fVar97 * fVar97;
                if (fVar193 < 0.0) {
                  local_a20._0_16_ = auVar105;
                  local_900._0_16_ = auVar140;
                  local_760._0_4_ = fVar158;
                  local_780._0_4_ = fVar131;
                  local_7a0._0_4_ = fVar97;
                  auVar292 = ZEXT1664(auVar292._0_16_);
                  auVar346 = ZEXT1664(auVar346._0_16_);
                  fVar193 = sqrtf(fVar193);
                  auVar363 = ZEXT464((uint)local_9c0._0_4_);
                  fVar97 = (float)local_7a0._0_4_;
                  fVar158 = (float)local_760._0_4_;
                  fVar131 = (float)local_780._0_4_;
                  auVar140 = local_900._0_16_;
                  auVar105 = local_a20._0_16_;
                }
                else {
                  auVar175 = vsqrtss_avx(auVar107,auVar107);
                  fVar193 = auVar175._0_4_;
                }
                auVar351 = ZEXT1664(auVar308);
                auVar106 = vpermilps_avx(local_880._0_16_,0xff);
                auVar27 = vshufps_avx(auVar308,auVar308,0xff);
                fVar212 = fVar158 * fVar97 - auVar27._0_4_;
                auVar220._0_8_ = auVar140._0_8_ ^ 0x8000000080000000;
                auVar220._8_4_ = auVar140._8_4_ ^ 0x80000000;
                auVar220._12_4_ = auVar140._12_4_ ^ 0x80000000;
                auVar236._0_4_ = -fVar212;
                auVar236._4_4_ = 0x80000000;
                auVar236._8_4_ = 0x80000000;
                auVar236._12_4_ = 0x80000000;
                fVar158 = local_a00._0_4_ * fVar131 * fVar97;
                auVar267 = ZEXT464((uint)fVar158);
                auVar175 = vinsertps_avx(auVar236,ZEXT416((uint)(fVar131 * fVar97)),0x1c);
                auVar140 = vmovsldup_avx(ZEXT416((uint)(fVar158 - auVar140._0_4_ * fVar212)));
                auVar175 = vdivps_avx(auVar175,auVar140);
                auVar107 = vinsertps_avx(local_a00._0_16_,auVar220,0x10);
                auVar107 = vdivps_avx(auVar107,auVar140);
                auVar140 = vmovsldup_avx(auVar105);
                auVar109 = ZEXT416((uint)(fVar193 - auVar106._0_4_));
                auVar106 = vmovsldup_avx(auVar109);
                auVar172._0_4_ = auVar140._0_4_ * auVar175._0_4_ + auVar106._0_4_ * auVar107._0_4_;
                auVar172._4_4_ = auVar140._4_4_ * auVar175._4_4_ + auVar106._4_4_ * auVar107._4_4_;
                auVar172._8_4_ = auVar140._8_4_ * auVar175._8_4_ + auVar106._8_4_ * auVar107._8_4_;
                auVar172._12_4_ =
                     auVar140._12_4_ * auVar175._12_4_ + auVar106._12_4_ * auVar107._12_4_;
                auVar175 = vsubps_avx(auVar323,auVar172);
                auVar325 = ZEXT1664(auVar175);
                auVar173._8_4_ = 0x7fffffff;
                auVar173._0_8_ = 0x7fffffff7fffffff;
                auVar173._12_4_ = 0x7fffffff;
                auVar105 = vandps_avx(auVar105,auVar173);
                if (auVar105._0_4_ < (float)local_9e0._0_4_) {
                  auVar199._8_4_ = 0x7fffffff;
                  auVar199._0_8_ = 0x7fffffff7fffffff;
                  auVar199._12_4_ = 0x7fffffff;
                  auVar105 = vandps_avx(auVar109,auVar199);
                  if (auVar105._0_4_ <
                      (float)local_7c0._0_4_ * 1.9073486e-06 +
                      auVar363._0_4_ + (float)local_9e0._0_4_) {
                    fVar97 = auVar175._0_4_ + (float)local_850._0_4_;
                    if ((ray->super_RayK<1>).org.field_0.m128[3] <= fVar97) {
                      fVar131 = (ray->super_RayK<1>).tfar;
                      auVar267 = ZEXT464((uint)fVar131);
                      if (fVar97 <= fVar131) {
                        auVar105 = vmovshdup_avx(auVar175);
                        fVar158 = auVar105._0_4_;
                        if ((0.0 <= fVar158) && (fVar158 <= 1.0)) {
                          auVar111 = vrsqrtss_avx(auVar111,auVar111);
                          fVar193 = auVar111._0_4_;
                          pGVar13 = (context->scene->geometries).items[uVar92].ptr;
                          if ((pGVar13->mask & (ray->super_RayK<1>).mask) != 0) {
                            auVar111 = ZEXT416((uint)(fVar193 * 1.5 +
                                                     fVar155 * -0.5 * fVar193 * fVar193 * fVar193));
                            auVar111 = vshufps_avx(auVar111,auVar111,0);
                            local_a80 = auVar174._0_4_;
                            fStack_a7c = auVar174._4_4_;
                            fStack_a78 = auVar174._8_4_;
                            fStack_a74 = auVar174._12_4_;
                            auVar200._0_4_ = auVar111._0_4_ * local_a80;
                            auVar200._4_4_ = auVar111._4_4_ * fStack_a7c;
                            auVar200._8_4_ = auVar111._8_4_ * fStack_a78;
                            auVar200._12_4_ = auVar111._12_4_ * fStack_a74;
                            auVar138._0_4_ = auVar308._0_4_ + auVar27._0_4_ * auVar200._0_4_;
                            auVar138._4_4_ = auVar308._4_4_ + auVar27._4_4_ * auVar200._4_4_;
                            auVar138._8_4_ = auVar308._8_4_ + auVar27._8_4_ * auVar200._8_4_;
                            auVar138._12_4_ = auVar308._12_4_ + auVar27._12_4_ * auVar200._12_4_;
                            auVar111 = vshufps_avx(auVar200,auVar200,0xc9);
                            auVar105 = vshufps_avx(auVar308,auVar308,0xc9);
                            auVar201._0_4_ = auVar105._0_4_ * auVar200._0_4_;
                            auVar201._4_4_ = auVar105._4_4_ * auVar200._4_4_;
                            auVar201._8_4_ = auVar105._8_4_ * auVar200._8_4_;
                            auVar201._12_4_ = auVar105._12_4_ * auVar200._12_4_;
                            auVar221._0_4_ = auVar308._0_4_ * auVar111._0_4_;
                            auVar221._4_4_ = auVar308._4_4_ * auVar111._4_4_;
                            auVar221._8_4_ = auVar308._8_4_ * auVar111._8_4_;
                            auVar221._12_4_ = auVar308._12_4_ * auVar111._12_4_;
                            auVar174 = vsubps_avx(auVar221,auVar201);
                            auVar111 = vshufps_avx(auVar174,auVar174,0xc9);
                            auVar105 = vshufps_avx(auVar138,auVar138,0xc9);
                            auVar222._0_4_ = auVar105._0_4_ * auVar111._0_4_;
                            auVar222._4_4_ = auVar105._4_4_ * auVar111._4_4_;
                            auVar222._8_4_ = auVar105._8_4_ * auVar111._8_4_;
                            auVar222._12_4_ = auVar105._12_4_ * auVar111._12_4_;
                            auVar111 = vshufps_avx(auVar174,auVar174,0xd2);
                            auVar139._0_4_ = auVar138._0_4_ * auVar111._0_4_;
                            auVar139._4_4_ = auVar138._4_4_ * auVar111._4_4_;
                            auVar139._8_4_ = auVar138._8_4_ * auVar111._8_4_;
                            auVar139._12_4_ = auVar138._12_4_ * auVar111._12_4_;
                            auVar111 = vsubps_avx(auVar222,auVar139);
                            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                               (pGVar13->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                              (ray->super_RayK<1>).tfar = fVar97;
                              auVar105 = vshufps_avx(auVar111,auVar111,0xe9);
                              uVar9 = vmovlps_avx(auVar105);
                              *(undefined8 *)&(ray->Ng).field_0 = uVar9;
                              (ray->Ng).field_0.field_0.z = auVar111._0_4_;
                              ray->u = fVar158;
                              ray->v = 0.0;
                              ray->primID = (uint)local_920;
                              ray->geomID = uVar92;
                              ray->instID[0] = context->user->instID[0];
                              ray->instPrimID[0] = context->user->instPrimID[0];
                            }
                            else {
                              auVar105 = vshufps_avx(auVar111,auVar111,0xe9);
                              local_950 = vmovlps_avx(auVar105);
                              local_948 = auVar111._0_4_;
                              local_944 = fVar158;
                              local_940 = 0;
                              local_93c = (uint)local_920;
                              local_938 = uVar92;
                              local_934 = context->user->instID[0];
                              local_930 = context->user->instPrimID[0];
                              (ray->super_RayK<1>).tfar = fVar97;
                              local_700._0_4_ = 0xffffffff;
                              local_a58.valid = (int *)local_700;
                              local_a58.geometryUserPtr = pGVar13->userPtr;
                              local_a58.context = context->user;
                              local_a58.hit = (RTCHitN *)&local_950;
                              local_a58.N = 1;
                              local_a58.ray = (RTCRayN *)ray;
                              if (pGVar13->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00f31004:
                                p_Var18 = context->args->filter;
                                if ((p_Var18 != (RTCFilterFunctionN)0x0) &&
                                   (((context->args->flags &
                                     RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                     RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                    (((pGVar13->field_8).field_0x2 & 0x40) != 0)))) {
                                  auVar267 = ZEXT1664(auVar267._0_16_);
                                  auVar292 = ZEXT1664(auVar292._0_16_);
                                  auVar325 = ZEXT1664(auVar325._0_16_);
                                  auVar346 = ZEXT1664(auVar346._0_16_);
                                  auVar351 = ZEXT1664(auVar351._0_16_);
                                  auVar363 = ZEXT1664(auVar363._0_16_);
                                  (*p_Var18)(&local_a58);
                                  if (*local_a58.valid == 0) goto LAB_00f3109b;
                                }
                                (((Vec3f *)((long)local_a58.ray + 0x30))->field_0).components[0] =
                                     *(float *)local_a58.hit;
                                (((Vec3f *)((long)local_a58.ray + 0x30))->field_0).field_0.y =
                                     *(float *)(local_a58.hit + 4);
                                (((Vec3f *)((long)local_a58.ray + 0x30))->field_0).field_0.z =
                                     *(float *)(local_a58.hit + 8);
                                *(float *)((long)local_a58.ray + 0x3c) =
                                     *(float *)(local_a58.hit + 0xc);
                                *(float *)((long)local_a58.ray + 0x40) =
                                     *(float *)(local_a58.hit + 0x10);
                                *(float *)((long)local_a58.ray + 0x44) =
                                     *(float *)(local_a58.hit + 0x14);
                                *(float *)((long)local_a58.ray + 0x48) =
                                     *(float *)(local_a58.hit + 0x18);
                                *(float *)((long)local_a58.ray + 0x4c) =
                                     *(float *)(local_a58.hit + 0x1c);
                                *(float *)((long)local_a58.ray + 0x50) =
                                     *(float *)(local_a58.hit + 0x20);
                              }
                              else {
                                auVar267 = ZEXT464((uint)fVar131);
                                auVar292 = ZEXT1664(auVar292._0_16_);
                                auVar325 = ZEXT1664(auVar175);
                                auVar346 = ZEXT1664(auVar346._0_16_);
                                auVar351 = ZEXT1664(auVar308);
                                auVar363 = ZEXT1664(auVar363._0_16_);
                                (*pGVar13->intersectionFilterN)(&local_a58);
                                if (*local_a58.valid != 0) goto LAB_00f31004;
LAB_00f3109b:
                                (ray->super_RayK<1>).tfar = fVar131;
                              }
                            }
                          }
                        }
                      }
                    }
                    break;
                  }
                }
                lVar94 = lVar94 + -1;
              } while (lVar94 != 0);
              auVar113 = local_540;
              fVar97 = (ray->super_RayK<1>).tfar;
              auVar117._4_4_ = fVar97;
              auVar117._0_4_ = fVar97;
              auVar117._8_4_ = fVar97;
              auVar117._12_4_ = fVar97;
              auVar117._16_4_ = fVar97;
              auVar117._20_4_ = fVar97;
              auVar117._24_4_ = fVar97;
              auVar117._28_4_ = fVar97;
              auVar112 = vcmpps_avx(_local_800,auVar117,2);
              local_540 = vandps_avx(auVar112,local_540);
              auVar113 = auVar113 & auVar112;
            } while ((((((((auVar113 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar113 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar113 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar113 >> 0x7f,0) != '\0') ||
                       (auVar113 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar113 >> 0xbf,0) != '\0') ||
                     (auVar113 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar113[0x1f] < '\0');
          }
          auVar151._0_4_ =
               local_6c0 * (float)local_820._0_4_ +
               (float)local_5c0._0_4_ * (float)local_840._0_4_ +
               (float)local_600._0_4_ * (float)local_680._0_4_;
          auVar151._4_4_ =
               fStack_6bc * (float)local_820._4_4_ +
               (float)local_5c0._4_4_ * (float)local_840._4_4_ +
               (float)local_600._4_4_ * (float)local_680._4_4_;
          auVar151._8_4_ =
               fStack_6b8 * fStack_818 + fStack_5b8 * fStack_838 + fStack_5f8 * fStack_678;
          auVar151._12_4_ =
               fStack_6b4 * fStack_814 + fStack_5b4 * fStack_834 + fStack_5f4 * fStack_674;
          auVar151._16_4_ =
               fStack_6b0 * fStack_810 + fStack_5b0 * fStack_830 + fStack_5f0 * fStack_670;
          auVar151._20_4_ =
               fStack_6ac * fStack_80c + fStack_5ac * fStack_82c + fStack_5ec * fStack_66c;
          auVar151._24_4_ =
               fStack_6a8 * fStack_808 + fStack_5a8 * fStack_828 + fStack_5e8 * fStack_668;
          auVar151._28_4_ = fStack_6a4 + fStack_5a4 + fStack_5e4;
          auVar184._8_4_ = 0x7fffffff;
          auVar184._0_8_ = 0x7fffffff7fffffff;
          auVar184._12_4_ = 0x7fffffff;
          auVar184._16_4_ = 0x7fffffff;
          auVar184._20_4_ = 0x7fffffff;
          auVar184._24_4_ = 0x7fffffff;
          auVar184._28_4_ = 0x7fffffff;
          auVar112 = vandps_avx(auVar151,auVar184);
          auVar185._8_4_ = 0x3e99999a;
          auVar185._0_8_ = 0x3e99999a3e99999a;
          auVar185._12_4_ = 0x3e99999a;
          auVar185._16_4_ = 0x3e99999a;
          auVar185._20_4_ = 0x3e99999a;
          auVar185._24_4_ = 0x3e99999a;
          auVar185._28_4_ = 0x3e99999a;
          auVar112 = vcmpps_avx(auVar112,auVar185,1);
          auVar113 = vorps_avx(auVar112,local_620);
          auVar186._0_4_ = (float)local_720._0_4_ + local_6e0._0_4_;
          auVar186._4_4_ = (float)local_720._4_4_ + local_6e0._4_4_;
          auVar186._8_4_ = fStack_718 + local_6e0._8_4_;
          auVar186._12_4_ = fStack_714 + local_6e0._12_4_;
          auVar186._16_4_ = fStack_710 + local_6e0._16_4_;
          auVar186._20_4_ = fStack_70c + local_6e0._20_4_;
          auVar186._24_4_ = fStack_708 + local_6e0._24_4_;
          auVar186._28_4_ = fStack_704 + local_6e0._28_4_;
          auVar112 = vcmpps_avx(auVar186,auVar117,2);
          _local_840 = vandps_avx(auVar112,local_5e0);
          auVar187._8_4_ = 3;
          auVar187._0_8_ = 0x300000003;
          auVar187._12_4_ = 3;
          auVar187._16_4_ = 3;
          auVar187._20_4_ = 3;
          auVar187._24_4_ = 3;
          auVar187._28_4_ = 3;
          auVar211._8_4_ = 2;
          auVar211._0_8_ = 0x200000002;
          auVar211._12_4_ = 2;
          auVar211._16_4_ = 2;
          auVar211._20_4_ = 2;
          auVar211._24_4_ = 2;
          auVar211._28_4_ = 2;
          auVar112 = vblendvps_avx(auVar211,auVar187,auVar113);
          auVar84._4_4_ = fStack_65c;
          auVar84._0_4_ = local_660;
          auVar84._8_4_ = fStack_658;
          auVar84._12_4_ = fStack_654;
          auVar111 = vpcmpgtd_avx(auVar112._16_16_,auVar84);
          auVar105 = vpshufd_avx(_local_640,0);
          auVar105 = vpcmpgtd_avx(auVar112._0_16_,auVar105);
          auVar188._16_16_ = auVar111;
          auVar188._0_16_ = auVar117._0_16_;
          _local_820 = vblendps_avx(ZEXT1632(auVar105),auVar188,0xf0);
          local_700 = vandnps_avx(_local_820,_local_840);
          auVar112 = _local_840 & ~_local_820;
          if ((((((((auVar112 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar112 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar112 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar112 >> 0x7f,0) != '\0') ||
                (auVar112 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar112 >> 0xbf,0) != '\0') ||
              (auVar112 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar112[0x1f] < '\0') {
            local_800._4_4_ = (float)local_720._4_4_ + local_500._4_4_;
            local_800._0_4_ = (float)local_720._0_4_ + local_500._0_4_;
            fStack_7f8 = fStack_718 + local_500._8_4_;
            fStack_7f4 = fStack_714 + local_500._12_4_;
            fStack_7f0 = fStack_710 + local_500._16_4_;
            fStack_7ec = fStack_70c + local_500._20_4_;
            fStack_7e8 = fStack_708 + local_500._24_4_;
            fStack_7e4 = fStack_704 + local_500._28_4_;
            _local_8e0 = _local_500;
            do {
              auVar119._8_4_ = 0x7f800000;
              auVar119._0_8_ = 0x7f8000007f800000;
              auVar119._12_4_ = 0x7f800000;
              auVar119._16_4_ = 0x7f800000;
              auVar119._20_4_ = 0x7f800000;
              auVar119._24_4_ = 0x7f800000;
              auVar119._28_4_ = 0x7f800000;
              auVar112 = vblendvps_avx(auVar119,_local_8e0,local_700);
              auVar113 = vshufps_avx(auVar112,auVar112,0xb1);
              auVar113 = vminps_avx(auVar112,auVar113);
              auVar30 = vshufpd_avx(auVar113,auVar113,5);
              auVar113 = vminps_avx(auVar113,auVar30);
              auVar30 = vperm2f128_avx(auVar113,auVar113,1);
              auVar113 = vminps_avx(auVar113,auVar30);
              auVar113 = vcmpps_avx(auVar112,auVar113,0);
              auVar30 = local_700 & auVar113;
              auVar112 = local_700;
              if ((((((((auVar30 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar30 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar30 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar30 >> 0x7f,0) != '\0') ||
                    (auVar30 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar30 >> 0xbf,0) != '\0') ||
                  (auVar30 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar30[0x1f] < '\0') {
                auVar112 = vandps_avx(auVar113,local_700);
              }
              uVar87 = vmovmskps_avx(auVar112);
              uVar90 = 0;
              if (uVar87 != 0) {
                for (; (uVar87 >> uVar90 & 1) == 0; uVar90 = uVar90 + 1) {
                }
              }
              uVar88 = (ulong)uVar90;
              *(undefined4 *)(local_700 + uVar88 * 4) = 0;
              aVar10 = (ray->super_RayK<1>).dir.field_0.field_1;
              local_8a0 = aVar10.x;
              fStack_89c = aVar10.y;
              fStack_898 = aVar10.z;
              aStack_894 = aVar10.field_3;
              auVar111 = vdpps_avx((undefined1  [16])aVar10,(undefined1  [16])aVar10,0x7f);
              fVar97 = local_1c0[uVar88];
              uVar90 = *(uint *)(local_4e0 + uVar88 * 4);
              if (auVar111._0_4_ < 0.0) {
                fVar131 = sqrtf(auVar111._0_4_);
              }
              else {
                auVar111 = vsqrtss_avx(auVar111,auVar111);
                fVar131 = auVar111._0_4_;
              }
              auVar105 = vminps_avx(_local_960,_local_980);
              auVar111 = vmaxps_avx(_local_960,_local_980);
              auVar174 = vminps_avx(_local_970,_local_990);
              auVar175 = vminps_avx(auVar105,auVar174);
              auVar105 = vmaxps_avx(_local_970,_local_990);
              auVar174 = vmaxps_avx(auVar111,auVar105);
              auVar202._8_4_ = 0x7fffffff;
              auVar202._0_8_ = 0x7fffffff7fffffff;
              auVar202._12_4_ = 0x7fffffff;
              auVar111 = vandps_avx(auVar175,auVar202);
              auVar105 = vandps_avx(auVar174,auVar202);
              auVar111 = vmaxps_avx(auVar111,auVar105);
              auVar105 = vmovshdup_avx(auVar111);
              auVar105 = vmaxss_avx(auVar105,auVar111);
              auVar111 = vshufpd_avx(auVar111,auVar111,1);
              auVar111 = vmaxss_avx(auVar111,auVar105);
              local_8c0 = auVar111._0_4_ * 1.9073486e-06;
              local_740._0_4_ = fVar131 * 1.9073486e-06;
              local_7c0._0_16_ = vshufps_avx(auVar174,auVar174,0xff);
              auVar111 = vinsertps_avx(ZEXT416(uVar90),ZEXT416((uint)fVar97),0x10);
              auVar325 = ZEXT1664(auVar111);
              lVar94 = 5;
              do {
                auVar323 = auVar325._0_16_;
                auVar105 = vmovshdup_avx(auVar323);
                fVar97 = auVar105._0_4_;
                fVar213 = 1.0 - fVar97;
                fVar131 = fVar213 * fVar213;
                fVar155 = fVar213 * fVar131;
                fVar158 = fVar97 * fVar97;
                fVar193 = fVar97 * fVar158;
                fVar212 = fVar97 * fVar213;
                auVar111 = vshufps_avx(ZEXT416((uint)(fVar193 * 0.16666667)),
                                       ZEXT416((uint)(fVar193 * 0.16666667)),0);
                auVar174 = ZEXT416((uint)((fVar193 * 4.0 + fVar155 +
                                          fVar97 * fVar212 * 12.0 + fVar213 * fVar212 * 6.0) *
                                         0.16666667));
                auVar174 = vshufps_avx(auVar174,auVar174,0);
                auVar175 = ZEXT416((uint)((fVar155 * 4.0 + fVar193 +
                                          fVar213 * fVar212 * 12.0 + fVar97 * fVar212 * 6.0) *
                                         0.16666667));
                auVar175 = vshufps_avx(auVar175,auVar175,0);
                auVar107 = vshufps_avx(auVar323,auVar323,0);
                auVar176._0_4_ = auVar107._0_4_ * local_8a0 + 0.0;
                auVar176._4_4_ = auVar107._4_4_ * fStack_89c + 0.0;
                auVar176._8_4_ = auVar107._8_4_ * fStack_898 + 0.0;
                auVar176._12_4_ = auVar107._12_4_ * aStack_894.w + 0.0;
                auVar107 = vshufps_avx(ZEXT416((uint)(fVar155 * 0.16666667)),
                                       ZEXT416((uint)(fVar155 * 0.16666667)),0);
                auVar104._0_4_ =
                     auVar107._0_4_ * (float)local_960._0_4_ +
                     auVar175._0_4_ * (float)local_980._0_4_ +
                     auVar111._0_4_ * (float)local_990._0_4_ +
                     auVar174._0_4_ * (float)local_970._0_4_;
                auVar104._4_4_ =
                     auVar107._4_4_ * (float)local_960._4_4_ +
                     auVar175._4_4_ * (float)local_980._4_4_ +
                     auVar111._4_4_ * (float)local_990._4_4_ +
                     auVar174._4_4_ * (float)local_970._4_4_;
                auVar104._8_4_ =
                     auVar107._8_4_ * fStack_958 +
                     auVar175._8_4_ * fStack_978 +
                     auVar111._8_4_ * fStack_988 + auVar174._8_4_ * fStack_968;
                auVar104._12_4_ =
                     auVar107._12_4_ * fStack_954 +
                     auVar175._12_4_ * fStack_974 +
                     auVar111._12_4_ * fStack_984 + auVar174._12_4_ * fStack_964;
                local_880._0_16_ = auVar104;
                auVar174 = vsubps_avx(auVar176,auVar104);
                auVar111 = vdpps_avx(auVar174,auVar174,0x7f);
                fVar155 = auVar111._0_4_;
                local_ae0 = auVar325._0_4_;
                if (fVar155 < 0.0) {
                  local_9c0._0_16_ = auVar105;
                  local_9e0._0_4_ = fVar158;
                  local_a00._0_4_ = fVar131;
                  local_a20._0_4_ = fVar212;
                  auVar351._0_4_ = sqrtf(fVar155);
                  auVar351._4_60_ = extraout_var_00;
                  auVar105 = auVar351._0_16_;
                  fVar158 = (float)local_9e0._0_4_;
                  fVar212 = (float)local_a20._0_4_;
                  fVar97 = (float)local_9c0._0_4_;
                }
                else {
                  auVar105 = vsqrtss_avx(auVar111,auVar111);
                  local_a00._0_4_ = fVar131;
                }
                auVar346 = ZEXT1664(auVar105);
                auVar175 = vshufps_avx(ZEXT416((uint)(fVar158 * 0.5)),ZEXT416((uint)(fVar158 * 0.5))
                                       ,0);
                auVar292 = ZEXT1664(_local_990);
                auVar107 = ZEXT416((uint)(((float)local_a00._0_4_ + fVar212 * 4.0) * 0.5));
                auVar107 = vshufps_avx(auVar107,auVar107,0);
                auVar140 = ZEXT416((uint)((fVar97 * -fVar97 - fVar212 * 4.0) * 0.5));
                auVar140 = vshufps_avx(auVar140,auVar140,0);
                auVar106 = ZEXT416((uint)(fVar213 * -fVar213 * 0.5));
                auVar106 = vshufps_avx(auVar106,auVar106,0);
                auVar309._0_4_ =
                     (float)local_960._0_4_ * auVar106._0_4_ +
                     (float)local_980._0_4_ * auVar140._0_4_ +
                     local_990._0_4_ * auVar175._0_4_ + (float)local_970._0_4_ * auVar107._0_4_;
                auVar309._4_4_ =
                     (float)local_960._4_4_ * auVar106._4_4_ +
                     (float)local_980._4_4_ * auVar140._4_4_ +
                     local_990._4_4_ * auVar175._4_4_ + (float)local_970._4_4_ * auVar107._4_4_;
                auVar309._8_4_ =
                     fStack_958 * auVar106._8_4_ +
                     fStack_978 * auVar140._8_4_ +
                     local_990._8_4_ * auVar175._8_4_ + fStack_968 * auVar107._8_4_;
                auVar309._12_4_ =
                     fStack_954 * auVar106._12_4_ +
                     fStack_974 * auVar140._12_4_ +
                     local_990._12_4_ * auVar175._12_4_ + fStack_964 * auVar107._12_4_;
                auVar175 = vshufps_avx(auVar323,auVar323,0x55);
                auVar107 = ZEXT416((uint)(fVar213 - (fVar97 + fVar97)));
                auVar140 = vshufps_avx(auVar107,auVar107,0);
                auVar107 = ZEXT416((uint)(fVar97 - (fVar213 + fVar213)));
                auVar106 = vshufps_avx(auVar107,auVar107,0);
                auVar27 = vshufps_avx(ZEXT416((uint)fVar213),ZEXT416((uint)fVar213),0);
                auVar107 = vdpps_avx(auVar309,auVar309,0x7f);
                auVar141._0_4_ =
                     (float)local_960._0_4_ * auVar27._0_4_ +
                     (float)local_980._0_4_ * auVar106._0_4_ +
                     local_990._0_4_ * auVar175._0_4_ + (float)local_970._0_4_ * auVar140._0_4_;
                auVar141._4_4_ =
                     (float)local_960._4_4_ * auVar27._4_4_ +
                     (float)local_980._4_4_ * auVar106._4_4_ +
                     local_990._4_4_ * auVar175._4_4_ + (float)local_970._4_4_ * auVar140._4_4_;
                auVar141._8_4_ =
                     fStack_958 * auVar27._8_4_ +
                     fStack_978 * auVar106._8_4_ +
                     local_990._8_4_ * auVar175._8_4_ + fStack_968 * auVar140._8_4_;
                auVar141._12_4_ =
                     fStack_954 * auVar27._12_4_ +
                     fStack_974 * auVar106._12_4_ +
                     local_990._12_4_ * auVar175._12_4_ + fStack_964 * auVar140._12_4_;
                auVar175 = vblendps_avx(auVar107,_DAT_01f7aa10,0xe);
                auVar140 = vrsqrtss_avx(auVar175,auVar175);
                fVar131 = auVar140._0_4_;
                fVar97 = auVar107._0_4_;
                auVar140 = vdpps_avx(auVar309,auVar141,0x7f);
                auVar106 = vshufps_avx(auVar107,auVar107,0);
                auVar142._0_4_ = auVar141._0_4_ * auVar106._0_4_;
                auVar142._4_4_ = auVar141._4_4_ * auVar106._4_4_;
                auVar142._8_4_ = auVar141._8_4_ * auVar106._8_4_;
                auVar142._12_4_ = auVar141._12_4_ * auVar106._12_4_;
                auVar140 = vshufps_avx(auVar140,auVar140,0);
                auVar223._0_4_ = auVar309._0_4_ * auVar140._0_4_;
                auVar223._4_4_ = auVar309._4_4_ * auVar140._4_4_;
                auVar223._8_4_ = auVar309._8_4_ * auVar140._8_4_;
                auVar223._12_4_ = auVar309._12_4_ * auVar140._12_4_;
                auVar27 = vsubps_avx(auVar142,auVar223);
                auVar140 = vrcpss_avx(auVar175,auVar175);
                auVar175 = vmaxss_avx(ZEXT416((uint)local_8c0),
                                      ZEXT416((uint)(local_ae0 * (float)local_740._0_4_)));
                auVar363 = ZEXT1664(auVar175);
                auVar140 = ZEXT416((uint)(auVar140._0_4_ * (2.0 - fVar97 * auVar140._0_4_)));
                auVar140 = vshufps_avx(auVar140,auVar140,0);
                uVar88 = CONCAT44(auVar309._4_4_,auVar309._0_4_);
                local_a00._0_8_ = uVar88 ^ 0x8000000080000000;
                local_a00._8_4_ = -auVar309._8_4_;
                local_a00._12_4_ = -auVar309._12_4_;
                auVar106 = ZEXT416((uint)(fVar131 * 1.5 +
                                         fVar97 * -0.5 * fVar131 * fVar131 * fVar131));
                auVar106 = vshufps_avx(auVar106,auVar106,0);
                auVar203._0_4_ = auVar106._0_4_ * auVar27._0_4_ * auVar140._0_4_;
                auVar203._4_4_ = auVar106._4_4_ * auVar27._4_4_ * auVar140._4_4_;
                auVar203._8_4_ = auVar106._8_4_ * auVar27._8_4_ * auVar140._8_4_;
                auVar203._12_4_ = auVar106._12_4_ * auVar27._12_4_ * auVar140._12_4_;
                auVar260._0_4_ = auVar309._0_4_ * auVar106._0_4_;
                auVar260._4_4_ = auVar309._4_4_ * auVar106._4_4_;
                auVar260._8_4_ = auVar309._8_4_ * auVar106._8_4_;
                auVar260._12_4_ = auVar309._12_4_ * auVar106._12_4_;
                local_9c0._0_4_ = auVar175._0_4_;
                if (fVar97 < 0.0) {
                  local_9e0._0_4_ = auVar105._0_4_;
                  local_a20._0_16_ = auVar260;
                  local_900._0_16_ = auVar203;
                  auVar292 = ZEXT1664(_local_990);
                  fVar97 = sqrtf(fVar97);
                  auVar346 = ZEXT464((uint)local_9e0._0_4_);
                  auVar363 = ZEXT464((uint)local_9c0._0_4_);
                  auVar203 = local_900._0_16_;
                  auVar260 = local_a20._0_16_;
                }
                else {
                  auVar105 = vsqrtss_avx(auVar107,auVar107);
                  fVar97 = auVar105._0_4_;
                }
                auVar105 = vdpps_avx(auVar174,auVar260,0x7f);
                local_9e0._0_4_ =
                     (local_8c0 / fVar97) * (auVar346._0_4_ + 1.0) +
                     auVar363._0_4_ + auVar346._0_4_ * local_8c0;
                auVar175 = vdpps_avx(local_a00._0_16_,auVar260,0x7f);
                auVar107 = vdpps_avx(auVar174,auVar203,0x7f);
                auVar82._4_4_ = fStack_89c;
                auVar82._0_4_ = local_8a0;
                auVar82._8_4_ = fStack_898;
                auVar82._12_4_ = aStack_894.a;
                auVar140 = vdpps_avx(auVar82,auVar260,0x7f);
                auVar106 = vdpps_avx(auVar174,local_a00._0_16_,0x7f);
                fVar97 = auVar175._0_4_ + auVar107._0_4_;
                fVar131 = auVar105._0_4_;
                auVar108._0_4_ = fVar131 * fVar131;
                auVar108._4_4_ = auVar105._4_4_ * auVar105._4_4_;
                auVar108._8_4_ = auVar105._8_4_ * auVar105._8_4_;
                auVar108._12_4_ = auVar105._12_4_ * auVar105._12_4_;
                auVar107 = vsubps_avx(auVar111,auVar108);
                local_a00._0_16_ = ZEXT416((uint)fVar97);
                auVar175 = vdpps_avx(auVar174,auVar82,0x7f);
                fVar158 = auVar106._0_4_ - fVar131 * fVar97;
                fVar131 = auVar175._0_4_ - fVar131 * auVar140._0_4_;
                auVar175 = vrsqrtss_avx(auVar107,auVar107);
                fVar193 = auVar107._0_4_;
                fVar97 = auVar175._0_4_;
                fVar97 = fVar97 * 1.5 + fVar193 * -0.5 * fVar97 * fVar97 * fVar97;
                if (fVar193 < 0.0) {
                  local_a20._0_16_ = auVar105;
                  local_900._0_16_ = auVar140;
                  local_760._0_4_ = fVar158;
                  local_780._0_4_ = fVar131;
                  local_7a0._0_4_ = fVar97;
                  auVar292 = ZEXT1664(auVar292._0_16_);
                  auVar346 = ZEXT1664(auVar346._0_16_);
                  fVar193 = sqrtf(fVar193);
                  auVar363 = ZEXT464((uint)local_9c0._0_4_);
                  fVar97 = (float)local_7a0._0_4_;
                  fVar158 = (float)local_760._0_4_;
                  fVar131 = (float)local_780._0_4_;
                  auVar140 = local_900._0_16_;
                  auVar105 = local_a20._0_16_;
                }
                else {
                  auVar175 = vsqrtss_avx(auVar107,auVar107);
                  fVar193 = auVar175._0_4_;
                }
                auVar351 = ZEXT1664(auVar309);
                auVar106 = vpermilps_avx(local_880._0_16_,0xff);
                auVar27 = vshufps_avx(auVar309,auVar309,0xff);
                fVar212 = fVar158 * fVar97 - auVar27._0_4_;
                auVar224._0_8_ = auVar140._0_8_ ^ 0x8000000080000000;
                auVar224._8_4_ = auVar140._8_4_ ^ 0x80000000;
                auVar224._12_4_ = auVar140._12_4_ ^ 0x80000000;
                auVar237._0_4_ = -fVar212;
                auVar237._4_4_ = 0x80000000;
                auVar237._8_4_ = 0x80000000;
                auVar237._12_4_ = 0x80000000;
                fVar158 = local_a00._0_4_ * fVar131 * fVar97;
                auVar267 = ZEXT464((uint)fVar158);
                auVar175 = vinsertps_avx(auVar237,ZEXT416((uint)(fVar131 * fVar97)),0x1c);
                auVar140 = vmovsldup_avx(ZEXT416((uint)(fVar158 - auVar140._0_4_ * fVar212)));
                auVar175 = vdivps_avx(auVar175,auVar140);
                auVar107 = vinsertps_avx(local_a00._0_16_,auVar224,0x10);
                auVar107 = vdivps_avx(auVar107,auVar140);
                auVar140 = vmovsldup_avx(auVar105);
                auVar109 = ZEXT416((uint)(fVar193 - auVar106._0_4_));
                auVar106 = vmovsldup_avx(auVar109);
                auVar177._0_4_ = auVar140._0_4_ * auVar175._0_4_ + auVar106._0_4_ * auVar107._0_4_;
                auVar177._4_4_ = auVar140._4_4_ * auVar175._4_4_ + auVar106._4_4_ * auVar107._4_4_;
                auVar177._8_4_ = auVar140._8_4_ * auVar175._8_4_ + auVar106._8_4_ * auVar107._8_4_;
                auVar177._12_4_ =
                     auVar140._12_4_ * auVar175._12_4_ + auVar106._12_4_ * auVar107._12_4_;
                auVar175 = vsubps_avx(auVar323,auVar177);
                auVar325 = ZEXT1664(auVar175);
                auVar178._8_4_ = 0x7fffffff;
                auVar178._0_8_ = 0x7fffffff7fffffff;
                auVar178._12_4_ = 0x7fffffff;
                auVar105 = vandps_avx(auVar105,auVar178);
                if (auVar105._0_4_ < (float)local_9e0._0_4_) {
                  auVar204._8_4_ = 0x7fffffff;
                  auVar204._0_8_ = 0x7fffffff7fffffff;
                  auVar204._12_4_ = 0x7fffffff;
                  auVar105 = vandps_avx(auVar109,auVar204);
                  if (auVar105._0_4_ <
                      (float)local_7c0._0_4_ * 1.9073486e-06 +
                      auVar363._0_4_ + (float)local_9e0._0_4_) {
                    fVar97 = auVar175._0_4_ + (float)local_850._0_4_;
                    if ((ray->super_RayK<1>).org.field_0.m128[3] <= fVar97) {
                      fVar131 = (ray->super_RayK<1>).tfar;
                      auVar267 = ZEXT464((uint)fVar131);
                      if (fVar97 <= fVar131) {
                        auVar105 = vmovshdup_avx(auVar175);
                        fVar158 = auVar105._0_4_;
                        if ((0.0 <= fVar158) && (fVar158 <= 1.0)) {
                          auVar111 = vrsqrtss_avx(auVar111,auVar111);
                          fVar193 = auVar111._0_4_;
                          pGVar13 = (context->scene->geometries).items[uVar92].ptr;
                          if ((pGVar13->mask & (ray->super_RayK<1>).mask) != 0) {
                            auVar111 = ZEXT416((uint)(fVar193 * 1.5 +
                                                     fVar155 * -0.5 * fVar193 * fVar193 * fVar193));
                            auVar111 = vshufps_avx(auVar111,auVar111,0);
                            local_a80 = auVar174._0_4_;
                            fStack_a7c = auVar174._4_4_;
                            fStack_a78 = auVar174._8_4_;
                            fStack_a74 = auVar174._12_4_;
                            auVar205._0_4_ = auVar111._0_4_ * local_a80;
                            auVar205._4_4_ = auVar111._4_4_ * fStack_a7c;
                            auVar205._8_4_ = auVar111._8_4_ * fStack_a78;
                            auVar205._12_4_ = auVar111._12_4_ * fStack_a74;
                            auVar143._0_4_ = auVar309._0_4_ + auVar27._0_4_ * auVar205._0_4_;
                            auVar143._4_4_ = auVar309._4_4_ + auVar27._4_4_ * auVar205._4_4_;
                            auVar143._8_4_ = auVar309._8_4_ + auVar27._8_4_ * auVar205._8_4_;
                            auVar143._12_4_ = auVar309._12_4_ + auVar27._12_4_ * auVar205._12_4_;
                            auVar111 = vshufps_avx(auVar205,auVar205,0xc9);
                            auVar105 = vshufps_avx(auVar309,auVar309,0xc9);
                            auVar206._0_4_ = auVar105._0_4_ * auVar205._0_4_;
                            auVar206._4_4_ = auVar105._4_4_ * auVar205._4_4_;
                            auVar206._8_4_ = auVar105._8_4_ * auVar205._8_4_;
                            auVar206._12_4_ = auVar105._12_4_ * auVar205._12_4_;
                            auVar225._0_4_ = auVar309._0_4_ * auVar111._0_4_;
                            auVar225._4_4_ = auVar309._4_4_ * auVar111._4_4_;
                            auVar225._8_4_ = auVar309._8_4_ * auVar111._8_4_;
                            auVar225._12_4_ = auVar309._12_4_ * auVar111._12_4_;
                            auVar174 = vsubps_avx(auVar225,auVar206);
                            auVar111 = vshufps_avx(auVar174,auVar174,0xc9);
                            auVar105 = vshufps_avx(auVar143,auVar143,0xc9);
                            auVar226._0_4_ = auVar105._0_4_ * auVar111._0_4_;
                            auVar226._4_4_ = auVar105._4_4_ * auVar111._4_4_;
                            auVar226._8_4_ = auVar105._8_4_ * auVar111._8_4_;
                            auVar226._12_4_ = auVar105._12_4_ * auVar111._12_4_;
                            auVar111 = vshufps_avx(auVar174,auVar174,0xd2);
                            auVar144._0_4_ = auVar143._0_4_ * auVar111._0_4_;
                            auVar144._4_4_ = auVar143._4_4_ * auVar111._4_4_;
                            auVar144._8_4_ = auVar143._8_4_ * auVar111._8_4_;
                            auVar144._12_4_ = auVar143._12_4_ * auVar111._12_4_;
                            auVar111 = vsubps_avx(auVar226,auVar144);
                            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                               (pGVar13->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                              (ray->super_RayK<1>).tfar = fVar97;
                              auVar105 = vshufps_avx(auVar111,auVar111,0xe9);
                              uVar9 = vmovlps_avx(auVar105);
                              *(undefined8 *)&(ray->Ng).field_0 = uVar9;
                              (ray->Ng).field_0.field_0.z = auVar111._0_4_;
                              ray->u = fVar158;
                              ray->v = 0.0;
                              ray->primID = (uint)local_920;
                              ray->geomID = uVar92;
                              ray->instID[0] = context->user->instID[0];
                              ray->instPrimID[0] = context->user->instPrimID[0];
                            }
                            else {
                              auVar105 = vshufps_avx(auVar111,auVar111,0xe9);
                              local_950 = vmovlps_avx(auVar105);
                              local_948 = auVar111._0_4_;
                              local_944 = fVar158;
                              local_940 = 0;
                              local_93c = (uint)local_920;
                              local_938 = uVar92;
                              local_934 = context->user->instID[0];
                              local_930 = context->user->instPrimID[0];
                              (ray->super_RayK<1>).tfar = fVar97;
                              local_a24 = -1;
                              local_a58.valid = &local_a24;
                              local_a58.geometryUserPtr = pGVar13->userPtr;
                              local_a58.context = context->user;
                              local_a58.hit = (RTCHitN *)&local_950;
                              local_a58.N = 1;
                              local_a58.ray = (RTCRayN *)ray;
                              if (pGVar13->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00f31b0e:
                                p_Var18 = context->args->filter;
                                if ((p_Var18 != (RTCFilterFunctionN)0x0) &&
                                   (((context->args->flags &
                                     RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                     RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                    (((pGVar13->field_8).field_0x2 & 0x40) != 0)))) {
                                  auVar267 = ZEXT1664(auVar267._0_16_);
                                  auVar292 = ZEXT1664(auVar292._0_16_);
                                  auVar325 = ZEXT1664(auVar325._0_16_);
                                  auVar346 = ZEXT1664(auVar346._0_16_);
                                  auVar351 = ZEXT1664(auVar351._0_16_);
                                  auVar363 = ZEXT1664(auVar363._0_16_);
                                  (*p_Var18)(&local_a58);
                                  if (*local_a58.valid == 0) goto LAB_00f31ba5;
                                }
                                (((Vec3f *)((long)local_a58.ray + 0x30))->field_0).components[0] =
                                     *(float *)local_a58.hit;
                                (((Vec3f *)((long)local_a58.ray + 0x30))->field_0).field_0.y =
                                     *(float *)(local_a58.hit + 4);
                                (((Vec3f *)((long)local_a58.ray + 0x30))->field_0).field_0.z =
                                     *(float *)(local_a58.hit + 8);
                                *(float *)((long)local_a58.ray + 0x3c) =
                                     *(float *)(local_a58.hit + 0xc);
                                *(float *)((long)local_a58.ray + 0x40) =
                                     *(float *)(local_a58.hit + 0x10);
                                *(float *)((long)local_a58.ray + 0x44) =
                                     *(float *)(local_a58.hit + 0x14);
                                *(float *)((long)local_a58.ray + 0x48) =
                                     *(float *)(local_a58.hit + 0x18);
                                *(float *)((long)local_a58.ray + 0x4c) =
                                     *(float *)(local_a58.hit + 0x1c);
                                *(float *)((long)local_a58.ray + 0x50) =
                                     *(float *)(local_a58.hit + 0x20);
                              }
                              else {
                                auVar267 = ZEXT464((uint)fVar131);
                                auVar292 = ZEXT1664(auVar292._0_16_);
                                auVar325 = ZEXT1664(auVar175);
                                auVar346 = ZEXT1664(auVar346._0_16_);
                                auVar351 = ZEXT1664(auVar309);
                                auVar363 = ZEXT1664(auVar363._0_16_);
                                (*pGVar13->intersectionFilterN)(&local_a58);
                                if (*local_a58.valid != 0) goto LAB_00f31b0e;
LAB_00f31ba5:
                                (ray->super_RayK<1>).tfar = fVar131;
                              }
                            }
                          }
                        }
                      }
                    }
                    break;
                  }
                }
                lVar94 = lVar94 + -1;
              } while (lVar94 != 0);
              auVar113 = local_700;
              fVar97 = (ray->super_RayK<1>).tfar;
              auVar117._4_4_ = fVar97;
              auVar117._0_4_ = fVar97;
              auVar117._8_4_ = fVar97;
              auVar117._12_4_ = fVar97;
              auVar117._16_4_ = fVar97;
              auVar117._20_4_ = fVar97;
              auVar117._24_4_ = fVar97;
              auVar117._28_4_ = fVar97;
              auVar112 = vcmpps_avx(_local_800,auVar117,2);
              local_700 = vandps_avx(auVar112,local_700);
              auVar113 = auVar113 & auVar112;
            } while ((((((((auVar113 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar113 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar113 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar113 >> 0x7f,0) != '\0') ||
                       (auVar113 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar113 >> 0xbf,0) != '\0') ||
                     (auVar113 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar113[0x1f] < '\0');
          }
          auVar112 = vandps_avx(_local_6a0,local_5a0);
          auVar113 = vandps_avx(_local_840,_local_820);
          auVar227._0_4_ = (float)local_720._0_4_ + local_4c0._0_4_;
          auVar227._4_4_ = (float)local_720._4_4_ + local_4c0._4_4_;
          auVar227._8_4_ = fStack_718 + local_4c0._8_4_;
          auVar227._12_4_ = fStack_714 + local_4c0._12_4_;
          auVar227._16_4_ = fStack_710 + local_4c0._16_4_;
          auVar227._20_4_ = fStack_70c + local_4c0._20_4_;
          auVar227._24_4_ = fStack_708 + local_4c0._24_4_;
          auVar227._28_4_ = fStack_704 + local_4c0._28_4_;
          auVar30 = vcmpps_avx(auVar227,auVar117,2);
          auVar112 = vandps_avx(auVar30,auVar112);
          auVar228._0_4_ = local_500._0_4_ + (float)local_720._0_4_;
          auVar228._4_4_ = local_500._4_4_ + (float)local_720._4_4_;
          auVar228._8_4_ = local_500._8_4_ + fStack_718;
          auVar228._12_4_ = local_500._12_4_ + fStack_714;
          auVar228._16_4_ = local_500._16_4_ + fStack_710;
          auVar228._20_4_ = local_500._20_4_ + fStack_70c;
          auVar228._24_4_ = local_500._24_4_ + fStack_708;
          auVar228._28_4_ = local_500._28_4_ + fStack_704;
          auVar30 = vcmpps_avx(auVar228,auVar117,2);
          auVar113 = vandps_avx(auVar30,auVar113);
          auVar113 = vorps_avx(auVar112,auVar113);
          if ((((((((auVar113 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar113 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar113 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar113 >> 0x7f,0) != '\0') ||
                (auVar113 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar113 >> 0xbf,0) != '\0') ||
              (auVar113 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar113[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar96 * 0x60) = auVar113;
            auVar112 = vblendvps_avx(_local_500,local_4c0,auVar112);
            *(undefined1 (*) [32])(auStack_160 + uVar96 * 0x60) = auVar112;
            uVar9 = vmovlps_avx(local_510);
            (&uStack_140)[uVar96 * 0xc] = uVar9;
            aiStack_138[uVar96 * 0x18] = local_aec + 1;
            iVar95 = iVar95 + 1;
          }
        }
      }
    }
    if (iVar95 == 0) break;
    fVar97 = (ray->super_RayK<1>).tfar;
    auVar152._4_4_ = fVar97;
    auVar152._0_4_ = fVar97;
    auVar152._8_4_ = fVar97;
    auVar152._12_4_ = fVar97;
    auVar152._16_4_ = fVar97;
    auVar152._20_4_ = fVar97;
    auVar152._24_4_ = fVar97;
    auVar152._28_4_ = fVar97;
    uVar90 = -iVar95;
    pauVar89 = (undefined1 (*) [32])(auStack_180 + (ulong)(iVar95 - 1) * 0x60);
    while( true ) {
      auVar112 = pauVar89[1];
      auVar189._0_4_ = auVar112._0_4_ + (float)local_720._0_4_;
      auVar189._4_4_ = auVar112._4_4_ + (float)local_720._4_4_;
      auVar189._8_4_ = auVar112._8_4_ + fStack_718;
      auVar189._12_4_ = auVar112._12_4_ + fStack_714;
      auVar189._16_4_ = auVar112._16_4_ + fStack_710;
      auVar189._20_4_ = auVar112._20_4_ + fStack_70c;
      auVar189._24_4_ = auVar112._24_4_ + fStack_708;
      auVar189._28_4_ = auVar112._28_4_ + fStack_704;
      auVar30 = vcmpps_avx(auVar189,auVar152,2);
      auVar245 = ZEXT3264(auVar30);
      auVar113 = vandps_avx(auVar30,*pauVar89);
      local_4c0 = auVar113;
      auVar30 = *pauVar89 & auVar30;
      if ((((((((auVar30 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar30 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar30 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar30 >> 0x7f,0) != '\0') ||
            (auVar30 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar30 >> 0xbf,0) != '\0') ||
          (auVar30 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar30[0x1f] < '\0') break;
      pauVar89 = pauVar89 + -3;
      uVar90 = uVar90 + 1;
      if (uVar90 == 0) goto LAB_00f31e7f;
    }
    auVar120._8_4_ = 0x7f800000;
    auVar120._0_8_ = 0x7f8000007f800000;
    auVar120._12_4_ = 0x7f800000;
    auVar120._16_4_ = 0x7f800000;
    auVar120._20_4_ = 0x7f800000;
    auVar120._24_4_ = 0x7f800000;
    auVar120._28_4_ = 0x7f800000;
    auVar112 = vblendvps_avx(auVar120,auVar112,auVar113);
    auVar30 = vshufps_avx(auVar112,auVar112,0xb1);
    auVar30 = vminps_avx(auVar112,auVar30);
    auVar31 = vshufpd_avx(auVar30,auVar30,5);
    auVar30 = vminps_avx(auVar30,auVar31);
    auVar31 = vperm2f128_avx(auVar30,auVar30,1);
    auVar30 = vminps_avx(auVar30,auVar31);
    auVar112 = vcmpps_avx(auVar112,auVar30,0);
    auVar30 = auVar113 & auVar112;
    if ((((((((auVar30 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar30 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar30 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar30 >> 0x7f,0) != '\0') ||
          (auVar30 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar30 >> 0xbf,0) != '\0') ||
        (auVar30 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar30[0x1f] < '\0')
    {
      auVar113 = vandps_avx(auVar112,auVar113);
    }
    auVar110._8_8_ = 0;
    auVar110._0_8_ = *(ulong *)pauVar89[2];
    local_aec = *(uint *)(pauVar89[2] + 8);
    uVar91 = vmovmskps_avx(auVar113);
    uVar87 = 0;
    if (uVar91 != 0) {
      for (; (uVar91 >> uVar87 & 1) == 0; uVar87 = uVar87 + 1) {
      }
    }
    *(undefined4 *)(local_4c0 + (ulong)uVar87 * 4) = 0;
    *pauVar89 = local_4c0;
    uVar91 = ~uVar90;
    if ((((((((local_4c0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (local_4c0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (local_4c0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(local_4c0 >> 0x7f,0) != '\0') ||
          (local_4c0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(local_4c0 >> 0xbf,0) != '\0') ||
        (local_4c0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_4c0[0x1f] < '\0') {
      uVar91 = -uVar90;
    }
    uVar96 = (ulong)uVar91;
    auVar111 = vshufps_avx(auVar110,auVar110,0);
    auVar105 = vshufps_avx(auVar110,auVar110,0x55);
    auVar105 = vsubps_avx(auVar105,auVar111);
    local_500._4_4_ = auVar111._4_4_ + auVar105._4_4_ * 0.14285715;
    local_500._0_4_ = auVar111._0_4_ + auVar105._0_4_ * 0.0;
    fStack_4f8 = auVar111._8_4_ + auVar105._8_4_ * 0.2857143;
    fStack_4f4 = auVar111._12_4_ + auVar105._12_4_ * 0.42857146;
    fStack_4f0 = auVar111._0_4_ + auVar105._0_4_ * 0.5714286;
    fStack_4ec = auVar111._4_4_ + auVar105._4_4_ * 0.71428573;
    fStack_4e8 = auVar111._8_4_ + auVar105._8_4_ * 0.8571429;
    fStack_4e4 = auVar111._12_4_ + auVar105._12_4_;
    local_510._8_8_ = 0;
    local_510._0_8_ = *(ulong *)(local_500 + (ulong)uVar87 * 4);
    uVar88 = local_920;
  } while( true );
LAB_00f31e7f:
  auVar111 = SUB3216(*(undefined1 (*) [32])&(ray->super_RayK<1>).tfar,0);
  auVar111 = vshufps_avx(auVar111,auVar111,0);
  auVar111 = vcmpps_avx(local_520,auVar111,2);
  uVar92 = vmovmskps_avx(auVar111);
  uVar86 = uVar86 - 1 & uVar86 & uVar92;
  if (uVar86 == 0) {
    return;
  }
  goto LAB_00f2f45e;
}

Assistant:

static __forceinline void intersect_t(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time());

          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }